

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  undefined4 uVar21;
  uint uVar22;
  int *piVar23;
  void *pvVar24;
  size_t sVar25;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  _func_int **pp_Var29;
  _func_int **pp_Var30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  Mat *pMVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  _func_int *p_Var54;
  int iVar55;
  uint uVar56;
  _func_int *p_Var57;
  int iVar58;
  ulong uVar59;
  _func_int ***ppp_Var60;
  int w_2;
  ulong uVar61;
  uint uVar62;
  ulong uVar63;
  _func_int **pp_Var64;
  long lVar65;
  void *pvVar66;
  int y_4;
  ulong uVar67;
  int y_3;
  uint uVar68;
  int w;
  int iVar69;
  int w_1;
  int iVar70;
  ulong uVar71;
  int y_1;
  int iVar72;
  void *pvVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar116;
  float fVar117;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar118;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar149 [28];
  undefined1 auVar150 [28];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar151 [28];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar217;
  float fVar221;
  float fVar222;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar223;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar209 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar214 [32];
  float fVar215;
  float fVar216;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 in_ZMM3 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar240 [16];
  float fVar239;
  float fVar282;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar280;
  float fVar281;
  float fVar283;
  undefined1 in_ZMM7 [64];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  float fVar296;
  undefined1 auVar295 [64];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [64];
  float fVar311;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  int outh_2;
  int outw_1;
  int outw;
  int h;
  int outh_1;
  int h_1;
  int outh;
  int h_2;
  long local_198;
  long local_170;
  _func_int ***local_168;
  long local_150;
  _func_int ***local_148;
  uint local_13c;
  void *local_130;
  _func_int ***local_128;
  ulong local_b0;
  Mat local_a8;
  long local_60;
  Allocator *local_58;
  long local_50;
  Mat *local_48;
  Option *local_40;
  Allocator *local_38;
  undefined1 auVar205 [32];
  undefined1 auVar208 [32];
  undefined1 auVar210 [32];
  undefined1 auVar213 [32];
  undefined1 auVar269 [32];
  undefined1 auVar274 [32];
  undefined1 auVar279 [32];
  undefined1 auVar308 [64];
  undefined1 auVar309 [64];
  undefined1 auVar310 [64];
  
  iVar14 = bottom_blob->w;
  iVar15 = bottom_blob->h;
  uVar59 = bottom_blob->elemsize;
  uVar16 = bottom_blob->elempack;
  p_Var54 = this->_vptr_Deconvolution_x86_avx[-3];
  local_13c = 1;
  if (opt->use_packing_layout == true) {
    local_13c = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var54) & 7) != 0) {
      local_13c = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var54) & 3) == 0) * 3 + 1;
    }
  }
  iVar69 = *(int *)(&this->field_0xd4 + (long)p_Var54);
  iVar17 = *(int *)(&this->field_0xe4 + (long)p_Var54);
  iVar55 = (*(int *)(&this->field_0xd8 + (long)p_Var54) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var54);
  local_60 = CONCAT44(local_60._4_4_,iVar55);
  iVar72 = *(int *)(&this->field_0xdc + (long)p_Var54);
  iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
  iVar58 = *(int *)(&this->field_0xfc + (long)p_Var54);
  iVar70 = *(int *)(&this->field_0x100 + (long)p_Var54);
  local_a8.cstep = 0;
  local_a8.data = (Allocator *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_a8.elempack = 0;
  local_a8.h = 0;
  p_Var57 = this->_vptr_Deconvolution_x86_avx[-3];
  p_Var54 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx + (long)p_Var57);
  lVar65 = 0x10;
  local_a8.allocator = (Allocator *)local_a8.data;
  local_a8.dims = (int)local_a8.refcount;
  local_a8.w = local_a8.refcount._4_4_;
  local_a8.d = (int)local_a8.refcount;
  local_a8.c = local_a8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var57) < 1) && (*(int *)(p_Var54 + 0xf0) < 1)) &&
       (*(int *)(p_Var54 + 0xf4) < 1)) && (*(int *)(p_Var54 + 0xf8) < 1)) &&
     ((*(int *)(p_Var54 + 0x104) < 1 || (*(int *)(p_Var54 + 0x108) < 1)))) {
    if (&local_a8 != top_blob) {
      piVar23 = top_blob->refcount;
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + 1;
        UNLOCK();
      }
      local_a8.data = top_blob->data;
      local_a8.refcount._0_4_ = (int)top_blob->refcount;
      local_a8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_a8.elemsize = top_blob->elemsize;
      local_a8.elempack = top_blob->elempack;
      local_a8.allocator = top_blob->allocator;
      uVar10 = top_blob->dims;
      uVar11 = top_blob->w;
      uVar12 = top_blob->h;
      uVar13 = top_blob->d;
      local_a8.c = top_blob->c;
      local_a8.cstep = top_blob->cstep;
      p_Var57 = this->_vptr_Deconvolution_x86_avx[-3];
      local_a8.dims = uVar10;
      local_a8.w = uVar11;
      local_a8.h = uVar12;
      local_a8.d = uVar13;
    }
    p_Var54 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_avx + (long)p_Var57);
    lVar65 = 8;
  }
  iVar72 = (iVar69 + -1) * iVar72;
  local_58 = (Allocator *)CONCAT44(local_58._4_4_,iVar72);
  local_48 = top_blob;
  local_40 = opt;
  Mat::create(&local_a8,iVar58 + (iVar14 + -1) * iVar17 + iVar72 + 1,
              iVar70 + (iVar15 + -1) * iVar18 + iVar55 + 1,*(int *)(p_Var54 + 0xd0) / (int)local_13c
              ,(uVar59 / (ulong)(long)(int)uVar16) * (ulong)local_13c,local_13c,
              *(Allocator **)(&opt->lightmode + lVar65));
  iVar15 = local_a8.h;
  iVar14 = local_a8.w;
  iVar69 = -100;
  if (((Allocator *)local_a8.data == (Allocator *)0x0) || (local_a8.cstep * (long)local_a8.c == 0))
  goto LAB_002ab1c2;
  pp_Var64 = this->_vptr_Deconvolution_x86_avx;
  p_Var54 = pp_Var64[-3];
  uVar19 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
  uVar20 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
  if ((uVar16 == 8) && (local_13c == 8)) {
    if (0 < local_a8.c) {
      iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
      iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
      iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
      uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
      local_150 = 0;
      auVar294 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar295 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        if (0 < local_a8.h) {
          iVar58 = bottom_blob->w;
          iVar70 = bottom_blob->h;
          ppp_Var60 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_150 * local_a8.elemsize);
          uVar56 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_a8.w) {
              uVar62 = 0;
              iVar50 = (1 - uVar19) * iVar69;
              do {
                if (lVar65 == 0) {
                  auVar307 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar307 = ZEXT3264(*(undefined1 (*) [32])(lVar65 + local_150 * 0x20));
                }
                if (0 < (int)uVar56) {
                  pvVar73 = (void *)((this->weight_data_tm).cstep * local_150 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar20) {
                      uVar61 = 0;
                      uVar63 = 0;
                      do {
                        iVar46 = (((int)uVar63 - uVar20) + 1) * iVar17 + iVar55;
                        if ((((-1 < iVar46) && (iVar47 = iVar46 / iVar18, iVar46 % iVar18 == 0)) &&
                            (0 < (int)uVar19)) && (iVar47 < iVar70)) {
                          lVar53 = (long)iVar47 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar67 = (ulong)uVar19;
                          uVar71 = uVar61;
                          iVar46 = iVar50;
                          do {
                            if (((-1 < iVar46) && (iVar47 = iVar46 / iVar72, iVar46 % iVar72 == 0))
                               && (iVar47 < iVar58)) {
                              lVar51 = (long)(iVar47 << 3);
                              fVar74 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53);
                              fVar87 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 4);
                              fVar116 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 8);
                              fVar117 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0xc);
                              fVar223 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x10);
                              fVar118 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x14);
                              fVar220 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x18);
                              fVar222 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x1c);
                              uVar52 = uVar71 & 0xffffffff;
                              pfVar1 = (float *)((long)pvVar73 + uVar52 * 4);
                              pfVar2 = (float *)((long)pvVar73 + uVar52 * 4 + 0x20);
                              pfVar3 = (float *)((long)pvVar73 + uVar52 * 4 + 0x40);
                              pfVar4 = (float *)((long)pvVar73 + uVar52 * 4 + 0x60);
                              pfVar5 = (float *)((long)pvVar73 + uVar52 * 4 + 0x80);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar117,CONCAT424(fVar223 * pfVar5[6],
                                                                             CONCAT420(fVar223 * 
                                                  pfVar5[5],
                                                  CONCAT416(fVar223 * pfVar5[4],
                                                            CONCAT412(fVar223 * pfVar5[3],
                                                                      CONCAT48(fVar223 * pfVar5[2],
                                                                               CONCAT44(fVar223 * 
                                                  pfVar5[1],fVar223 * *pfVar5))))))));
                              pfVar6 = (float *)((long)pvVar73 + uVar52 * 4 + 0xa0);
                              fVar221 = fVar116 + fVar117 + fVar116;
                              pfVar7 = (float *)((long)pvVar73 + uVar52 * 4 + 0xc0);
                              pfVar8 = (float *)((long)pvVar73 + uVar52 * 4 + 0xe0);
                              fVar167 = fVar220 * *pfVar7 + fVar222 * *pfVar8;
                              fVar215 = fVar220 * pfVar7[1] + fVar222 * pfVar8[1];
                              fVar216 = fVar220 * pfVar7[2] + fVar222 * pfVar8[2];
                              fVar217 = fVar220 * pfVar7[3] + fVar222 * pfVar8[3];
                              fVar218 = fVar220 * pfVar7[4] + fVar222 * pfVar8[4];
                              fVar219 = fVar220 * pfVar7[5] + fVar222 * pfVar8[5];
                              fVar220 = fVar220 * pfVar7[6] + fVar222 * pfVar8[6];
                              fVar222 = fVar221 + fVar116;
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar222,CONCAT424(fVar220,CONCAT420(
                                                  fVar219,CONCAT416(fVar218,CONCAT412(fVar217,
                                                  CONCAT48(fVar216,CONCAT44(fVar215,fVar167))))))));
                              auVar307 = ZEXT3264(CONCAT428(auVar307._28_4_ + fVar74 +
                                                            fVar87 + fVar116 + fVar221 + fVar222,
                                                            CONCAT424(auVar307._24_4_ +
                                                                      fVar74 * pfVar1[6] +
                                                                      fVar87 * pfVar2[6] +
                                                                      fVar116 * pfVar3[6] +
                                                                      fVar117 * pfVar4[6] +
                                                                      fVar223 * pfVar5[6] +
                                                                      fVar118 * pfVar6[6] + fVar220,
                                                                      CONCAT420(auVar307._20_4_ +
                                                                                fVar74 * pfVar1[5] +
                                                                                fVar87 * pfVar2[5] +
                                                                                fVar116 * pfVar3[5]
                                                                                + fVar117 * pfVar4[5
                                                  ] + fVar223 * pfVar5[5] + fVar118 * pfVar6[5] +
                                                  fVar219,CONCAT416(auVar307._16_4_ +
                                                                    fVar74 * pfVar1[4] +
                                                                    fVar87 * pfVar2[4] +
                                                                    fVar116 * pfVar3[4] +
                                                                    fVar117 * pfVar4[4] +
                                                                    fVar223 * pfVar5[4] +
                                                                    fVar118 * pfVar6[4] + fVar218,
                                                                    CONCAT412(auVar307._12_4_ +
                                                                              fVar74 * pfVar1[3] +
                                                                              fVar87 * pfVar2[3] +
                                                                              fVar116 * pfVar3[3] +
                                                                              fVar117 * pfVar4[3] +
                                                                              fVar223 * pfVar5[3] +
                                                                              fVar118 * pfVar6[3] +
                                                                              fVar217,CONCAT48(
                                                  auVar307._8_4_ + fVar74 * pfVar1[2] +
                                                  fVar87 * pfVar2[2] + fVar116 * pfVar3[2] +
                                                  fVar117 * pfVar4[2] + fVar223 * pfVar5[2] +
                                                  fVar118 * pfVar6[2] + fVar216,
                                                  CONCAT44(auVar307._4_4_ + fVar74 * pfVar1[1] +
                                                           fVar87 * pfVar2[1] + fVar116 * pfVar3[1]
                                                           + fVar117 * pfVar4[1] +
                                                             fVar223 * pfVar5[1] +
                                                             fVar118 * pfVar6[1] + fVar215,
                                                           auVar307._0_4_ + fVar74 * *pfVar1 +
                                                           fVar87 * *pfVar2 + fVar116 * *pfVar3 +
                                                           fVar117 * *pfVar4 + fVar223 * *pfVar5 +
                                                           fVar118 * *pfVar6 + fVar167))))))));
                            }
                            uVar71 = uVar71 + 0x40;
                            iVar46 = iVar46 + iVar69;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar63 = uVar63 + 1;
                        uVar61 = uVar61 + (ulong)uVar19 * 0x40;
                      } while (uVar63 != uVar20);
                    }
                    pvVar73 = (void *)((long)pvVar73 + (long)(int)(uVar19 * uVar20 * 0x40) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar56);
                }
                auVar302 = auVar307._0_32_;
                auVar80 = auVar294._0_32_;
                fVar239 = auVar307._8_4_;
                fVar280 = auVar307._12_4_;
                fVar281 = auVar307._16_4_;
                fVar282 = auVar307._20_4_;
                fVar283 = auVar307._24_4_;
                fVar167 = auVar295._0_4_;
                fVar215 = auVar295._4_4_;
                fVar216 = auVar295._8_4_;
                fVar217 = auVar295._12_4_;
                fVar218 = auVar295._16_4_;
                fVar219 = auVar295._20_4_;
                fVar221 = auVar295._24_4_;
                fVar296 = auVar295._28_4_;
                auVar237 = auVar238._0_32_;
                fVar74 = auVar238._0_4_;
                fVar87 = auVar238._4_4_;
                fVar116 = auVar238._8_4_;
                fVar117 = auVar238._12_4_;
                fVar223 = auVar238._16_4_;
                fVar118 = auVar238._20_4_;
                fVar220 = auVar238._24_4_;
                fVar222 = auVar238._28_4_;
                auVar308._28_36_ = auVar307._28_36_;
                switch(uVar21) {
                case 1:
                  auVar302 = vmaxps_avx(auVar302,auVar80);
                  break;
                case 2:
                  auVar237 = vmaxps_avx(auVar302,auVar80);
                  in_ZMM7 = ZEXT3264(auVar237);
                  auVar80 = vminps_avx(auVar302,auVar80);
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  auVar302._0_4_ = fVar74 * auVar80._0_4_ + auVar237._0_4_;
                  auVar302._4_4_ = fVar74 * auVar80._4_4_ + auVar237._4_4_;
                  auVar302._8_4_ = fVar74 * auVar80._8_4_ + auVar237._8_4_;
                  auVar302._12_4_ = fVar74 * auVar80._12_4_ + auVar237._12_4_;
                  auVar302._16_4_ = fVar74 * auVar80._16_4_ + auVar237._16_4_;
                  auVar302._20_4_ = fVar74 * auVar80._20_4_ + auVar237._20_4_;
                  auVar302._24_4_ = fVar74 * auVar80._24_4_ + auVar237._24_4_;
                  auVar302._28_4_ = auVar80._28_4_ + auVar237._28_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                  auVar267._4_4_ = uVar9;
                  auVar267._0_4_ = uVar9;
                  auVar267._8_4_ = uVar9;
                  auVar267._12_4_ = uVar9;
                  auVar267._16_4_ = uVar9;
                  auVar267._20_4_ = uVar9;
                  auVar267._24_4_ = uVar9;
                  auVar267._28_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar324._4_4_ = uVar9;
                  auVar324._0_4_ = uVar9;
                  auVar324._8_4_ = uVar9;
                  auVar324._12_4_ = uVar9;
                  auVar324._16_4_ = uVar9;
                  auVar324._20_4_ = uVar9;
                  auVar324._24_4_ = uVar9;
                  auVar324._28_4_ = uVar9;
                  auVar302 = vmaxps_avx(auVar302,auVar267);
                  in_ZMM7 = ZEXT3264(auVar302);
                  auVar302 = vminps_avx(auVar324,auVar302);
                  break;
                case 4:
                  auVar268._0_8_ = auVar307._0_8_ ^ 0x8000000080000000;
                  auVar268._8_4_ = -fVar239;
                  auVar268._12_4_ = -fVar280;
                  auVar268._16_4_ = -fVar281;
                  auVar268._20_4_ = -fVar282;
                  auVar268._24_4_ = -fVar283;
                  auVar268._28_4_ = -auVar307._28_4_;
                  auVar155._8_4_ = 0x42b0c0a5;
                  auVar155._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar155._12_4_ = 0x42b0c0a5;
                  auVar155._16_4_ = 0x42b0c0a5;
                  auVar155._20_4_ = 0x42b0c0a5;
                  auVar155._24_4_ = 0x42b0c0a5;
                  auVar155._28_4_ = 0x42b0c0a5;
                  auVar302 = vminps_avx(auVar268,auVar155);
                  auVar156._8_4_ = 0xc2b0c0a5;
                  auVar156._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar156._12_4_ = 0xc2b0c0a5;
                  auVar156._16_4_ = 0xc2b0c0a5;
                  auVar156._20_4_ = 0xc2b0c0a5;
                  auVar156._24_4_ = 0xc2b0c0a5;
                  auVar156._28_4_ = 0xc2b0c0a5;
                  auVar80 = vmaxps_avx(auVar302,auVar156);
                  auVar301._0_4_ = auVar80._0_4_ * 1.442695 + fVar167;
                  auVar301._4_4_ = auVar80._4_4_ * 1.442695 + fVar215;
                  auVar301._8_4_ = auVar80._8_4_ * 1.442695 + fVar216;
                  auVar301._12_4_ = auVar80._12_4_ * 1.442695 + fVar217;
                  auVar301._16_4_ = auVar80._16_4_ * 1.442695 + fVar218;
                  auVar301._20_4_ = auVar80._20_4_ * 1.442695 + fVar219;
                  auVar301._24_4_ = auVar80._24_4_ * 1.442695 + fVar221;
                  auVar301._28_4_ = auVar307._28_4_ + fVar296;
                  auVar158 = vroundps_avx(auVar301,1);
                  auVar302 = vcmpps_avx(auVar301,auVar158,1);
                  auVar302 = vandps_avx(auVar302,auVar237);
                  auVar302 = vsubps_avx(auVar158,auVar302);
                  fVar239 = auVar302._0_4_ * -0.6931472 + auVar80._0_4_;
                  fVar280 = auVar302._4_4_ * -0.6931472 + auVar80._4_4_;
                  fVar281 = auVar302._8_4_ * -0.6931472 + auVar80._8_4_;
                  fVar282 = auVar302._12_4_ * -0.6931472 + auVar80._12_4_;
                  fVar283 = auVar302._16_4_ * -0.6931472 + auVar80._16_4_;
                  fVar311 = auVar302._20_4_ * -0.6931472 + auVar80._20_4_;
                  fVar327 = auVar302._24_4_ * -0.6931472 + auVar80._24_4_;
                  in_ZMM3 = ZEXT3264(CONCAT428(0x3ab743ce,
                                               CONCAT424(0x3ab743ce,
                                                         CONCAT420(0x3ab743ce,
                                                                   CONCAT416(0x3ab743ce,
                                                                             CONCAT412(0x3ab743ce,
                                                                                       CONCAT48(
                                                  0x3ab743ce,0x3ab743ce3ab743ce)))))));
                  auVar241._0_4_ = (int)auVar302._0_4_;
                  auVar241._4_4_ = (int)auVar302._4_4_;
                  auVar241._8_4_ = (int)auVar302._8_4_;
                  auVar241._12_4_ = (int)auVar302._12_4_;
                  auVar269._16_4_ = (int)auVar302._16_4_;
                  auVar269._0_16_ = auVar241;
                  auVar269._20_4_ = (int)auVar302._20_4_;
                  auVar269._24_4_ = (int)auVar302._24_4_;
                  auVar269._28_4_ = (int)auVar302._28_4_;
                  auVar240 = vpslld_avx(auVar241,0x17);
                  auVar168 = vpslld_avx(auVar269._16_16_,0x17);
                  auVar75._8_4_ = 0x3f800000;
                  auVar75._0_8_ = 0x3f8000003f800000;
                  auVar75._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar75);
                  auVar240 = vpaddd_avx(auVar240,auVar75);
                  auVar157._0_4_ =
                       (fVar239 + fVar74 +
                       fVar239 * fVar239 *
                       (fVar167 +
                       ((((fVar239 * 0.00019875691 + 0.0013981999) * fVar239 + 0.008333452) *
                         fVar239 + 0.041665796) * fVar239 + 0.16666666) * fVar239)) * auVar240._0_4_
                       + fVar74;
                  auVar157._4_4_ =
                       (fVar280 + fVar87 +
                       fVar280 * fVar280 *
                       (fVar215 +
                       ((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) *
                         fVar280 + 0.041665796) * fVar280 + 0.16666666) * fVar280)) * auVar240._4_4_
                       + fVar87;
                  auVar157._8_4_ =
                       (fVar281 + fVar116 +
                       fVar281 * fVar281 *
                       (fVar216 +
                       ((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                         fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281)) * auVar240._8_4_
                       + fVar116;
                  auVar157._12_4_ =
                       (fVar282 + fVar117 +
                       fVar282 * fVar282 *
                       (fVar217 +
                       ((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) *
                         fVar282 + 0.041665796) * fVar282 + 0.16666666) * fVar282)) *
                       auVar240._12_4_ + fVar117;
                  auVar157._16_4_ =
                       (fVar283 + fVar223 +
                       fVar283 * fVar283 *
                       (fVar218 +
                       ((((fVar283 * 0.00019875691 + 0.0013981999) * fVar283 + 0.008333452) *
                         fVar283 + 0.041665796) * fVar283 + 0.16666666) * fVar283)) * auVar168._0_4_
                       + fVar223;
                  auVar157._20_4_ =
                       (fVar311 + fVar118 +
                       fVar311 * fVar311 *
                       (fVar219 +
                       ((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 + 0.008333452) *
                         fVar311 + 0.041665796) * fVar311 + 0.16666666) * fVar311)) * auVar168._4_4_
                       + fVar118;
                  auVar157._24_4_ =
                       (fVar327 + fVar220 +
                       fVar327 * fVar327 *
                       (fVar221 +
                       ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                         fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327)) * auVar168._8_4_
                       + fVar220;
                  auVar157._28_4_ =
                       auVar158._28_4_ + auVar80._28_4_ + fVar222 + fVar296 + 0.21826287 + fVar222;
                  auVar80 = vrcpps_avx(auVar157);
                  in_ZMM7 = ZEXT3264(auVar80);
                  fVar74 = auVar80._0_4_;
                  fVar87 = auVar80._4_4_;
                  auVar34._4_4_ = auVar157._4_4_ * fVar87;
                  auVar34._0_4_ = auVar157._0_4_ * fVar74;
                  fVar116 = auVar80._8_4_;
                  auVar34._8_4_ = auVar157._8_4_ * fVar116;
                  fVar117 = auVar80._12_4_;
                  auVar34._12_4_ = auVar157._12_4_ * fVar117;
                  fVar223 = auVar80._16_4_;
                  auVar34._16_4_ = auVar157._16_4_ * fVar223;
                  fVar118 = auVar80._20_4_;
                  auVar34._20_4_ = auVar157._20_4_ * fVar118;
                  fVar220 = auVar80._24_4_;
                  auVar34._24_4_ = auVar157._24_4_ * fVar220;
                  auVar34._28_4_ = auVar157._28_4_;
                  auVar237 = vsubps_avx(auVar237,auVar34);
                  auVar302._0_4_ = fVar74 + fVar74 * auVar237._0_4_;
                  auVar302._4_4_ = fVar87 + fVar87 * auVar237._4_4_;
                  auVar302._8_4_ = fVar116 + fVar116 * auVar237._8_4_;
                  auVar302._12_4_ = fVar117 + fVar117 * auVar237._12_4_;
                  auVar302._16_4_ = fVar223 + fVar223 * auVar237._16_4_;
                  auVar302._20_4_ = fVar118 + fVar118 * auVar237._20_4_;
                  auVar302._24_4_ = fVar220 + fVar220 * auVar237._24_4_;
                  auVar302._28_4_ = auVar80._28_4_ + auVar237._28_4_;
                  break;
                case 5:
                  auVar288._8_4_ = 0x42b0c0a5;
                  auVar288._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar288._12_4_ = 0x42b0c0a5;
                  auVar288._16_4_ = 0x42b0c0a5;
                  auVar288._20_4_ = 0x42b0c0a5;
                  auVar288._24_4_ = 0x42b0c0a5;
                  auVar288._28_4_ = 0x42b0c0a5;
                  auVar302 = vminps_avx(auVar302,auVar288);
                  auVar291._8_4_ = 0xc2b0c0a5;
                  auVar291._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar291._12_4_ = 0xc2b0c0a5;
                  auVar291._16_4_ = 0xc2b0c0a5;
                  auVar291._20_4_ = 0xc2b0c0a5;
                  auVar291._24_4_ = 0xc2b0c0a5;
                  auVar291._28_4_ = 0xc2b0c0a5;
                  auVar80 = vmaxps_avx(auVar291,auVar302);
                  auVar265._0_4_ = fVar167 + auVar80._0_4_ * 1.442695;
                  auVar265._4_4_ = fVar215 + auVar80._4_4_ * 1.442695;
                  auVar265._8_4_ = fVar216 + auVar80._8_4_ * 1.442695;
                  auVar265._12_4_ = fVar217 + auVar80._12_4_ * 1.442695;
                  auVar265._16_4_ = fVar218 + auVar80._16_4_ * 1.442695;
                  auVar265._20_4_ = fVar219 + auVar80._20_4_ * 1.442695;
                  auVar265._24_4_ = fVar221 + auVar80._24_4_ * 1.442695;
                  auVar265._28_4_ = fVar296 + in_ZMM7._28_4_;
                  auVar158 = vroundps_avx(auVar265,1);
                  auVar302 = vcmpps_avx(auVar265,auVar158,1);
                  auVar302 = vandps_avx(auVar302,auVar237);
                  auVar302 = vsubps_avx(auVar158,auVar302);
                  auVar31._4_4_ = auVar302._4_4_ * 0.6931472;
                  auVar31._0_4_ = auVar302._0_4_ * 0.6931472;
                  auVar31._8_4_ = auVar302._8_4_ * 0.6931472;
                  auVar31._12_4_ = auVar302._12_4_ * 0.6931472;
                  auVar31._16_4_ = auVar302._16_4_ * 0.6931472;
                  auVar31._20_4_ = auVar302._20_4_ * 0.6931472;
                  auVar31._24_4_ = auVar302._24_4_ * 0.6931472;
                  auVar31._28_4_ = auVar158._28_4_;
                  auVar80 = vsubps_avx(auVar80,auVar31);
                  fVar311 = auVar80._0_4_;
                  fVar327 = auVar80._4_4_;
                  fVar328 = auVar80._8_4_;
                  fVar329 = auVar80._12_4_;
                  fVar330 = auVar80._16_4_;
                  fVar331 = auVar80._20_4_;
                  fVar332 = auVar80._24_4_;
                  auVar168._0_4_ = (int)auVar302._0_4_;
                  auVar168._4_4_ = (int)auVar302._4_4_;
                  auVar168._8_4_ = (int)auVar302._8_4_;
                  auVar168._12_4_ = (int)auVar302._12_4_;
                  auVar198._16_4_ = (int)auVar302._16_4_;
                  auVar198._0_16_ = auVar168;
                  auVar198._20_4_ = (int)auVar302._20_4_;
                  auVar198._24_4_ = (int)auVar302._24_4_;
                  auVar198._28_4_ = (int)auVar302._28_4_;
                  auVar240 = vpslld_avx(auVar168,0x17);
                  auVar168 = vpslld_avx(auVar198._16_16_,0x17);
                  auVar298._8_4_ = 0x3f800000;
                  auVar298._0_8_ = 0x3f8000003f800000;
                  auVar298._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar298);
                  auVar240 = vpaddd_avx(auVar240,auVar298);
                  auVar266._0_4_ =
                       (fVar311 + fVar74 +
                       fVar311 * fVar311 *
                       (((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 + 0.008333452) *
                          fVar311 + 0.041665796) * fVar311 + 0.16666666) * fVar311 + fVar167)) *
                       auVar240._0_4_ + fVar74;
                  auVar266._4_4_ =
                       (fVar327 + fVar87 +
                       fVar327 * fVar327 *
                       (((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                          fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327 + fVar215)) *
                       auVar240._4_4_ + fVar87;
                  auVar266._8_4_ =
                       (fVar328 + fVar116 +
                       fVar328 * fVar328 *
                       (((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 + 0.008333452) *
                          fVar328 + 0.041665796) * fVar328 + 0.16666666) * fVar328 + fVar216)) *
                       auVar240._8_4_ + fVar116;
                  auVar266._12_4_ =
                       (fVar329 + fVar117 +
                       fVar329 * fVar329 *
                       (((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 + 0.008333452) *
                          fVar329 + 0.041665796) * fVar329 + 0.16666666) * fVar329 + fVar217)) *
                       auVar240._12_4_ + fVar117;
                  auVar266._16_4_ =
                       (fVar330 + fVar223 +
                       fVar330 * fVar330 *
                       (((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 + 0.008333452) *
                          fVar330 + 0.041665796) * fVar330 + 0.16666666) * fVar330 + fVar218)) *
                       auVar168._0_4_ + fVar223;
                  auVar266._20_4_ =
                       (fVar331 + fVar118 +
                       fVar331 * fVar331 *
                       (((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 + 0.008333452) *
                          fVar331 + 0.041665796) * fVar331 + 0.16666666) * fVar331 + fVar219)) *
                       auVar168._4_4_ + fVar118;
                  auVar266._24_4_ =
                       (fVar332 + fVar220 +
                       fVar332 * fVar332 *
                       (((((fVar332 * 0.00019875691 + 0.0013981999) * fVar332 + 0.008333452) *
                          fVar332 + 0.041665796) * fVar332 + 0.16666666) * fVar332 + fVar221)) *
                       auVar168._8_4_ + fVar220;
                  auVar266._28_4_ =
                       auVar80._28_4_ + fVar222 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar296 + fVar222;
                  auVar152._8_4_ = 0x800000;
                  auVar152._0_8_ = 0x80000000800000;
                  auVar152._12_4_ = 0x800000;
                  auVar152._16_4_ = 0x800000;
                  auVar152._20_4_ = 0x800000;
                  auVar152._24_4_ = 0x800000;
                  auVar152._28_4_ = 0x800000;
                  auVar158 = vmaxps_avx(auVar266,auVar152);
                  auVar168 = vpsrld_avx(auVar158._16_16_,0x17);
                  auVar230._8_4_ = 0x807fffff;
                  auVar230._0_8_ = 0x807fffff807fffff;
                  auVar230._12_4_ = 0x807fffff;
                  auVar230._16_4_ = 0x807fffff;
                  auVar230._20_4_ = 0x807fffff;
                  auVar230._24_4_ = 0x807fffff;
                  auVar230._28_4_ = 0x807fffff;
                  auVar302 = vandps_avx(auVar158,auVar230);
                  auVar204 = vorps_avx(auVar302,auVar295._0_32_);
                  auVar231._8_4_ = 0x3f3504f3;
                  auVar231._0_8_ = 0x3f3504f33f3504f3;
                  auVar231._12_4_ = 0x3f3504f3;
                  auVar231._16_4_ = 0x3f3504f3;
                  auVar231._20_4_ = 0x3f3504f3;
                  auVar231._24_4_ = 0x3f3504f3;
                  auVar231._28_4_ = 0x3f3504f3;
                  auVar80 = vcmpps_avx(auVar231,auVar204,2);
                  auVar302 = vandnps_avx(auVar80,auVar204);
                  fVar311 = auVar204._0_4_ + -1.0 + auVar302._0_4_;
                  fVar327 = auVar204._4_4_ + -1.0 + auVar302._4_4_;
                  fVar328 = auVar204._8_4_ + -1.0 + auVar302._8_4_;
                  fVar329 = auVar204._12_4_ + -1.0 + auVar302._12_4_;
                  fVar330 = auVar204._16_4_ + -1.0 + auVar302._16_4_;
                  fVar331 = auVar204._20_4_ + -1.0 + auVar302._20_4_;
                  fVar332 = auVar204._24_4_ + -1.0 + auVar302._24_4_;
                  auVar168 = vpsubd_avx(auVar168,auVar80._16_16_);
                  auVar240 = vpsrld_avx(auVar158._0_16_,0x17);
                  auVar284._8_4_ = 0xffffff81;
                  auVar284._0_8_ = 0xffffff81ffffff81;
                  auVar284._12_4_ = 0xffffff81;
                  auVar168 = vpaddd_avx(auVar284,auVar168);
                  auVar240 = vpsubd_avx(auVar240,auVar80._0_16_);
                  auVar240 = vpaddd_avx(auVar284,auVar240);
                  auVar153._16_16_ = auVar168;
                  auVar153._0_16_ = auVar240;
                  auVar80 = vcmpps_avx(auVar266,_DAT_0051a2a0,2);
                  auVar158 = vcvtdq2ps_avx(auVar153);
                  auVar32._4_4_ =
                       (fVar327 + auVar158._4_4_ * 0.6931472 +
                       fVar327 * fVar327 *
                       (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * 
                                                  (fVar327 * (fVar327 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar32._0_4_ =
                       (fVar311 + auVar158._0_4_ * 0.6931472 +
                       fVar311 * fVar311 *
                       (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * 
                                                  (fVar311 * (fVar311 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar32._8_4_ =
                       (fVar328 + auVar158._8_4_ * 0.6931472 +
                       fVar328 * fVar328 *
                       (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * 
                                                  (fVar328 * (fVar328 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar32._12_4_ =
                       (fVar329 + auVar158._12_4_ * 0.6931472 +
                       fVar329 * fVar329 *
                       (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * 
                                                  (fVar329 * (fVar329 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar32._16_4_ =
                       (fVar330 + auVar158._16_4_ * 0.6931472 +
                       fVar330 * fVar330 *
                       (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * 
                                                  (fVar330 * (fVar330 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar32._20_4_ =
                       (fVar331 + auVar158._20_4_ * 0.6931472 +
                       fVar331 * fVar331 *
                       (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * 
                                                  (fVar331 * (fVar331 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar32._24_4_ =
                       (fVar332 + auVar158._24_4_ * 0.6931472 +
                       fVar332 * fVar332 *
                       (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * 
                                                  (fVar332 * (fVar332 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar32._28_4_ = auVar204._28_4_ + -1.0 + auVar302._28_4_ + auVar158._28_4_ + 0.0;
                  auVar199._8_4_ = 0x7fffffff;
                  auVar199._0_8_ = 0x7fffffff7fffffff;
                  auVar199._12_4_ = 0x7fffffff;
                  auVar199._16_4_ = 0x7fffffff;
                  auVar199._20_4_ = 0x7fffffff;
                  auVar199._24_4_ = 0x7fffffff;
                  auVar199._28_4_ = 0x7fffffff;
                  auVar302 = vblendvps_avx(auVar32,auVar199,auVar80);
                  auVar200._8_4_ = 0x42b0c0a5;
                  auVar200._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar200._12_4_ = 0x42b0c0a5;
                  auVar200._16_4_ = 0x42b0c0a5;
                  auVar200._20_4_ = 0x42b0c0a5;
                  auVar200._24_4_ = 0x42b0c0a5;
                  auVar200._28_4_ = 0x42b0c0a5;
                  auVar302 = vminps_avx(auVar302,auVar200);
                  auVar201._8_4_ = 0xc2b0c0a5;
                  auVar201._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar201._12_4_ = 0xc2b0c0a5;
                  auVar201._16_4_ = 0xc2b0c0a5;
                  auVar201._20_4_ = 0xc2b0c0a5;
                  auVar201._24_4_ = 0xc2b0c0a5;
                  auVar201._28_4_ = 0xc2b0c0a5;
                  auVar80 = vmaxps_avx(auVar302,auVar201);
                  auVar294 = ZEXT864(0) << 0x20;
                  auVar202._0_4_ = auVar80._0_4_ * 1.442695 + fVar167;
                  auVar202._4_4_ = auVar80._4_4_ * 1.442695 + fVar215;
                  auVar202._8_4_ = auVar80._8_4_ * 1.442695 + fVar216;
                  auVar202._12_4_ = auVar80._12_4_ * 1.442695 + fVar217;
                  auVar202._16_4_ = auVar80._16_4_ * 1.442695 + fVar218;
                  auVar202._20_4_ = auVar80._20_4_ * 1.442695 + fVar219;
                  auVar202._24_4_ = auVar80._24_4_ * 1.442695 + fVar221;
                  auVar202._28_4_ = fVar296 + -88.37626;
                  auVar158 = vroundps_avx(auVar202,1);
                  auVar302 = vcmpps_avx(auVar202,auVar158,1);
                  auVar302 = vandps_avx(auVar302,auVar237);
                  auVar302 = vsubps_avx(auVar158,auVar302);
                  auVar33._4_4_ = auVar302._4_4_ * 0.6931472;
                  auVar33._0_4_ = auVar302._0_4_ * 0.6931472;
                  auVar33._8_4_ = auVar302._8_4_ * 0.6931472;
                  auVar33._12_4_ = auVar302._12_4_ * 0.6931472;
                  auVar33._16_4_ = auVar302._16_4_ * 0.6931472;
                  auVar33._20_4_ = auVar302._20_4_ * 0.6931472;
                  auVar33._24_4_ = auVar302._24_4_ * 0.6931472;
                  auVar33._28_4_ = auVar158._28_4_;
                  auVar80 = vsubps_avx(auVar80,auVar33);
                  fVar311 = auVar80._0_4_;
                  fVar327 = auVar80._4_4_;
                  fVar328 = auVar80._8_4_;
                  fVar329 = auVar80._12_4_;
                  fVar330 = auVar80._16_4_;
                  fVar331 = auVar80._20_4_;
                  fVar332 = auVar80._24_4_;
                  auVar238 = ZEXT3264(auVar237);
                  auVar295 = ZEXT3264(auVar295._0_32_);
                  fVar167 = fVar167 + ((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 +
                                        0.008333452) * fVar311 + 0.041665796) * fVar311 + 0.16666666
                                      ) * fVar311;
                  fVar215 = fVar215 + ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 +
                                        0.008333452) * fVar327 + 0.041665796) * fVar327 + 0.16666666
                                      ) * fVar327;
                  fVar216 = fVar216 + ((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 +
                                        0.008333452) * fVar328 + 0.041665796) * fVar328 + 0.16666666
                                      ) * fVar328;
                  fVar217 = fVar217 + ((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 +
                                        0.008333452) * fVar329 + 0.041665796) * fVar329 + 0.16666666
                                      ) * fVar329;
                  fVar218 = fVar218 + ((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 +
                                        0.008333452) * fVar330 + 0.041665796) * fVar330 + 0.16666666
                                      ) * fVar330;
                  fVar219 = fVar219 + ((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 +
                                        0.008333452) * fVar331 + 0.041665796) * fVar331 + 0.16666666
                                      ) * fVar331;
                  fVar221 = fVar221 + ((((fVar332 * 0.00019875691 + 0.0013981999) * fVar332 +
                                        0.008333452) * fVar332 + 0.041665796) * fVar332 + 0.16666666
                                      ) * fVar332;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar296 + auVar266._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar221,CONCAT420(fVar219,CONCAT416(fVar218
                                                  ,CONCAT412(fVar217,CONCAT48(fVar216,CONCAT44(
                                                  fVar215,fVar167))))))));
                  auVar240._0_4_ = (int)auVar302._0_4_;
                  auVar240._4_4_ = (int)auVar302._4_4_;
                  auVar240._8_4_ = (int)auVar302._8_4_;
                  auVar240._12_4_ = (int)auVar302._12_4_;
                  auVar203._16_4_ = (int)auVar302._16_4_;
                  auVar203._0_16_ = auVar240;
                  auVar203._20_4_ = (int)auVar302._20_4_;
                  auVar203._24_4_ = (int)auVar302._24_4_;
                  auVar203._28_4_ = (int)auVar302._28_4_;
                  auVar240 = vpslld_avx(auVar240,0x17);
                  auVar168 = vpslld_avx(auVar203._16_16_,0x17);
                  auVar168 = vpaddd_avx(auVar168,auVar298);
                  auVar240 = vpaddd_avx(auVar240,auVar298);
                  auVar154._0_4_ =
                       (fVar311 + fVar74 + fVar311 * fVar311 * fVar167) * auVar240._0_4_ + fVar74;
                  auVar154._4_4_ =
                       (fVar327 + fVar87 + fVar327 * fVar327 * fVar215) * auVar240._4_4_ + fVar87;
                  auVar154._8_4_ =
                       (fVar328 + fVar116 + fVar328 * fVar328 * fVar216) * auVar240._8_4_ + fVar116;
                  auVar154._12_4_ =
                       (fVar329 + fVar117 + fVar329 * fVar329 * fVar217) * auVar240._12_4_ + fVar117
                  ;
                  auVar154._16_4_ =
                       (fVar330 + fVar223 + fVar330 * fVar330 * fVar218) * auVar168._0_4_ + fVar223;
                  auVar154._20_4_ =
                       (fVar331 + fVar118 + fVar331 * fVar331 * fVar219) * auVar168._4_4_ + fVar118;
                  auVar154._24_4_ =
                       (fVar332 + fVar220 + fVar332 * fVar332 * fVar221) * auVar168._8_4_ + fVar220;
                  auVar154._28_4_ = auVar80._28_4_ + fVar222 + auVar158._28_4_ + fVar222;
                  auVar302 = vrcpps_avx(auVar154);
                  fVar74 = auVar302._0_4_;
                  fVar87 = auVar302._4_4_;
                  fVar116 = auVar302._8_4_;
                  fVar117 = auVar302._12_4_;
                  fVar223 = auVar302._16_4_;
                  fVar118 = auVar302._20_4_;
                  fVar220 = auVar302._24_4_;
                  auVar237._4_4_ = auVar154._4_4_ * (fVar87 + fVar87);
                  auVar237._0_4_ = auVar154._0_4_ * (fVar74 + fVar74);
                  auVar237._8_4_ = auVar154._8_4_ * (fVar116 + fVar116);
                  auVar237._12_4_ = auVar154._12_4_ * (fVar117 + fVar117);
                  auVar237._16_4_ = auVar154._16_4_ * (fVar223 + fVar223);
                  auVar237._20_4_ = auVar154._20_4_ * (fVar118 + fVar118);
                  auVar237._24_4_ = auVar154._24_4_ * (fVar220 + fVar220);
                  auVar237._28_4_ = auVar154._28_4_;
                  auVar80._8_4_ = 0x40000000;
                  auVar80._0_8_ = 0x4000000040000000;
                  auVar80._12_4_ = 0x40000000;
                  auVar80._16_4_ = 0x40000000;
                  auVar80._20_4_ = 0x40000000;
                  auVar80._24_4_ = 0x40000000;
                  auVar80._28_4_ = 0x40000000;
                  auVar237 = vsubps_avx(auVar80,auVar237);
                  auVar204._0_4_ = fVar74 + fVar74 + -1.0;
                  auVar204._4_4_ = fVar87 + fVar87 + -1.0;
                  auVar204._8_4_ = fVar116 + fVar116 + -1.0;
                  auVar204._12_4_ = fVar117 + fVar117 + -1.0;
                  auVar204._16_4_ = fVar223 + fVar223 + -1.0;
                  auVar204._20_4_ = fVar118 + fVar118 + -1.0;
                  auVar204._24_4_ = fVar220 + fVar220 + -1.0;
                  auVar204._28_4_ = auVar302._28_4_ + auVar302._28_4_ + -1.0;
                  auVar149._0_4_ = auVar204._0_4_ + fVar74 * auVar237._0_4_;
                  auVar149._4_4_ = auVar204._4_4_ + fVar87 * auVar237._4_4_;
                  auVar149._8_4_ = auVar204._8_4_ + fVar116 * auVar237._8_4_;
                  auVar149._12_4_ = auVar204._12_4_ + fVar117 * auVar237._12_4_;
                  auVar149._16_4_ = auVar204._16_4_ + fVar223 * auVar237._16_4_;
                  auVar149._20_4_ = auVar204._20_4_ + fVar118 * auVar237._20_4_;
                  auVar149._24_4_ = auVar204._24_4_ + fVar220 * auVar237._24_4_;
                  goto LAB_002a92e6;
                case 6:
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  fVar87 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar204._4_4_ = fVar87;
                  auVar204._0_4_ = fVar87;
                  auVar204._8_4_ = fVar87;
                  auVar204._12_4_ = fVar87;
                  auVar204._16_4_ = fVar87;
                  auVar204._20_4_ = fVar87;
                  auVar204._24_4_ = fVar87;
                  auVar204._28_4_ = fVar87;
                  auVar158._0_4_ = auVar307._0_4_ * fVar74 + fVar87;
                  auVar158._4_4_ = auVar307._4_4_ * fVar74 + fVar87;
                  auVar158._8_4_ = fVar239 * fVar74 + fVar87;
                  auVar158._12_4_ = fVar280 * fVar74 + fVar87;
                  auVar158._16_4_ = fVar281 * fVar74 + fVar87;
                  auVar158._20_4_ = fVar282 * fVar74 + fVar87;
                  auVar158._24_4_ = fVar283 * fVar74 + fVar87;
                  auVar158._28_4_ = fVar74 + fVar87;
                  auVar302 = vmaxps_avx(auVar80,auVar158);
                  auVar302 = vminps_avx(auVar302,auVar237);
                  auVar149 = auVar302._0_28_;
LAB_002a92e6:
                  in_ZMM3 = ZEXT3264(auVar204);
                  auVar308._0_4_ = auVar307._0_4_ * auVar149._0_4_;
                  auVar308._4_4_ = auVar307._4_4_ * auVar149._4_4_;
                  auVar308._8_4_ = fVar239 * auVar149._8_4_;
                  auVar308._12_4_ = fVar280 * auVar149._12_4_;
                  auVar308._16_4_ = fVar281 * auVar149._16_4_;
                  auVar308._20_4_ = fVar282 * auVar149._20_4_;
                  auVar308._24_4_ = fVar283 * auVar149._24_4_;
                  auVar302 = auVar308._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var60 = auVar302;
                ppp_Var60 = ppp_Var60 + 4;
                uVar62 = uVar62 + 1;
                iVar50 = iVar50 + 1;
              } while (uVar62 != local_a8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_a8.h);
        }
        local_150 = local_150 + 1;
      } while (local_150 != local_a8.c);
      goto LAB_002a9348;
    }
LAB_002ab177:
    pp_Var64 = this->_vptr_Deconvolution_x86_avx;
  }
  else {
LAB_002a9348:
    if ((uVar16 == 4) && (local_13c == 8)) {
      if ((long)local_a8.c < 1) goto LAB_002ab177;
      p_Var54 = pp_Var64[-3];
      iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
      iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
      iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
      uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
      uVar56 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
      uVar62 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
      local_198 = 0;
      auVar238 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar295 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar294 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar289._8_4_ = 0x42b0c0a5;
      auVar289._0_8_ = 0x42b0c0a542b0c0a5;
      auVar289._12_4_ = 0x42b0c0a5;
      auVar289._16_4_ = 0x42b0c0a5;
      auVar289._20_4_ = 0x42b0c0a5;
      auVar289._24_4_ = 0x42b0c0a5;
      auVar289._28_4_ = 0x42b0c0a5;
      auVar292._8_4_ = 0xc2b0c0a5;
      auVar292._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar292._12_4_ = 0xc2b0c0a5;
      auVar292._16_4_ = 0xc2b0c0a5;
      auVar292._20_4_ = 0xc2b0c0a5;
      auVar292._24_4_ = 0xc2b0c0a5;
      auVar292._28_4_ = 0xc2b0c0a5;
      do {
        if (0 < local_a8.h) {
          iVar58 = bottom_blob->w;
          iVar70 = bottom_blob->h;
          ppp_Var60 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar22 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_a8.w) {
              uVar68 = 0;
              iVar50 = (1 - uVar56) * iVar69;
              do {
                if (lVar65 == 0) {
                  auVar307 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar307 = ZEXT3264(*(undefined1 (*) [32])(lVar65 + local_198 * 0x20));
                }
                if (0 < (int)uVar22) {
                  pvVar73 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      uVar61 = 0;
                      uVar63 = 0;
                      do {
                        iVar46 = (((int)uVar63 - uVar62) + 1) * iVar17 + iVar55;
                        if ((((-1 < iVar46) && (iVar47 = iVar46 / iVar18, iVar46 % iVar18 == 0)) &&
                            (0 < (int)uVar56)) && (iVar47 < iVar70)) {
                          lVar53 = (long)iVar47 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar67 = (ulong)uVar56;
                          uVar71 = uVar61;
                          iVar46 = iVar50;
                          do {
                            if (((-1 < iVar46) && (iVar47 = iVar46 / iVar72, iVar46 % iVar72 == 0))
                               && (iVar47 < iVar58)) {
                              lVar51 = (long)(iVar47 << 2);
                              fVar74 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53);
                              fVar87 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 4);
                              fVar116 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 8);
                              fVar117 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0xc);
                              in_ZMM7 = ZEXT3264(CONCAT428(fVar117,CONCAT424(fVar117,CONCAT420(
                                                  fVar117,CONCAT416(fVar117,CONCAT412(fVar117,
                                                  CONCAT48(fVar117,CONCAT44(fVar117,fVar117))))))));
                              uVar52 = uVar71 & 0xffffffff;
                              pfVar4 = (float *)((long)pvVar73 + uVar52 * 4);
                              pfVar1 = (float *)((long)pvVar73 + uVar52 * 4 + 0x20);
                              pfVar2 = (float *)((long)pvVar73 + uVar52 * 4 + 0x40);
                              fVar223 = fVar87 + fVar116;
                              pfVar3 = (float *)((long)pvVar73 + uVar52 * 4 + 0x60);
                              in_ZMM3 = ZEXT3264(CONCAT428(fVar223,CONCAT424(fVar117 * pfVar3[6],
                                                                             CONCAT420(fVar117 * 
                                                  pfVar3[5],
                                                  CONCAT416(fVar117 * pfVar3[4],
                                                            CONCAT412(fVar117 * pfVar3[3],
                                                                      CONCAT48(fVar117 * pfVar3[2],
                                                                               CONCAT44(fVar117 * 
                                                  pfVar3[1],fVar117 * *pfVar3))))))));
                              auVar307 = ZEXT3264(CONCAT428(auVar307._28_4_ + fVar74 + fVar223 +
                                                            fVar223,CONCAT424(auVar307._24_4_ +
                                                                              fVar74 * pfVar4[6] +
                                                                              fVar87 * pfVar1[6] +
                                                                              fVar116 * pfVar2[6] +
                                                                              fVar117 * pfVar3[6],
                                                                              CONCAT420(auVar307.
                                                  _20_4_ + fVar74 * pfVar4[5] +
                                                  fVar87 * pfVar1[5] + fVar116 * pfVar2[5] +
                                                  fVar117 * pfVar3[5],
                                                  CONCAT416(auVar307._16_4_ + fVar74 * pfVar4[4] +
                                                            fVar87 * pfVar1[4] + fVar116 * pfVar2[4]
                                                            + fVar117 * pfVar3[4],
                                                            CONCAT412(auVar307._12_4_ +
                                                                      fVar74 * pfVar4[3] +
                                                                      fVar87 * pfVar1[3] +
                                                                      fVar116 * pfVar2[3] +
                                                                      fVar117 * pfVar3[3],
                                                                      CONCAT48(auVar307._8_4_ +
                                                                               fVar74 * pfVar4[2] +
                                                                               fVar87 * pfVar1[2] +
                                                                               fVar116 * pfVar2[2] +
                                                                               fVar117 * pfVar3[2],
                                                                               CONCAT44(auVar307.
                                                  _4_4_ + fVar74 * pfVar4[1] +
                                                  fVar87 * pfVar1[1] + fVar116 * pfVar2[1] +
                                                  fVar117 * pfVar3[1],
                                                  auVar307._0_4_ + fVar74 * *pfVar4 +
                                                  fVar87 * *pfVar1 + fVar116 * *pfVar2 +
                                                  fVar117 * *pfVar3))))))));
                            }
                            uVar71 = uVar71 + 0x20;
                            iVar46 = iVar46 + iVar69;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar63 = uVar63 + 1;
                        uVar61 = uVar61 + (ulong)uVar56 * 0x20;
                      } while (uVar63 != uVar62);
                    }
                    pvVar73 = (void *)((long)pvVar73 + (long)(int)(uVar56 * uVar62 * 0x20) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar22);
                }
                auVar304 = auVar307._0_32_;
                fVar239 = auVar307._8_4_;
                fVar280 = auVar307._12_4_;
                fVar281 = auVar307._16_4_;
                fVar282 = auVar307._20_4_;
                fVar283 = auVar307._24_4_;
                fVar167 = auVar295._0_4_;
                fVar215 = auVar295._4_4_;
                fVar216 = auVar295._8_4_;
                fVar217 = auVar295._12_4_;
                fVar218 = auVar295._16_4_;
                fVar219 = auVar295._20_4_;
                fVar221 = auVar295._24_4_;
                fVar296 = auVar295._28_4_;
                auVar302 = auVar294._0_32_;
                fVar74 = auVar294._0_4_;
                fVar87 = auVar294._4_4_;
                fVar116 = auVar294._8_4_;
                fVar117 = auVar294._12_4_;
                fVar223 = auVar294._16_4_;
                fVar118 = auVar294._20_4_;
                fVar220 = auVar294._24_4_;
                fVar222 = auVar294._28_4_;
                auVar309._28_36_ = auVar307._28_36_;
                switch(uVar21) {
                case 1:
                  auVar304 = vmaxps_avx(auVar304,auVar238._0_32_);
                  break;
                case 2:
                  auVar302 = vmaxps_avx(auVar304,ZEXT1632(ZEXT816(0) << 0x40));
                  in_ZMM7 = ZEXT3264(auVar302);
                  auVar238 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar237 = vminps_avx(auVar304,ZEXT1632(ZEXT816(0) << 0x40));
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  auVar304._0_4_ = fVar74 * auVar237._0_4_ + auVar302._0_4_;
                  auVar304._4_4_ = fVar74 * auVar237._4_4_ + auVar302._4_4_;
                  auVar304._8_4_ = fVar74 * auVar237._8_4_ + auVar302._8_4_;
                  auVar304._12_4_ = fVar74 * auVar237._12_4_ + auVar302._12_4_;
                  auVar304._16_4_ = fVar74 * auVar237._16_4_ + auVar302._16_4_;
                  auVar304._20_4_ = fVar74 * auVar237._20_4_ + auVar302._20_4_;
                  auVar304._24_4_ = fVar74 * auVar237._24_4_ + auVar302._24_4_;
                  auVar304._28_4_ = auVar237._28_4_ + auVar302._28_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                  auVar272._4_4_ = uVar9;
                  auVar272._0_4_ = uVar9;
                  auVar272._8_4_ = uVar9;
                  auVar272._12_4_ = uVar9;
                  auVar272._16_4_ = uVar9;
                  auVar272._20_4_ = uVar9;
                  auVar272._24_4_ = uVar9;
                  auVar272._28_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar325._4_4_ = uVar9;
                  auVar325._0_4_ = uVar9;
                  auVar325._8_4_ = uVar9;
                  auVar325._12_4_ = uVar9;
                  auVar325._16_4_ = uVar9;
                  auVar325._20_4_ = uVar9;
                  auVar325._24_4_ = uVar9;
                  auVar325._28_4_ = uVar9;
                  auVar302 = vmaxps_avx(auVar304,auVar272);
                  in_ZMM7 = ZEXT3264(auVar302);
                  auVar304 = vminps_avx(auVar325,auVar302);
                  break;
                case 4:
                  auVar273._0_8_ = auVar307._0_8_ ^ 0x8000000080000000;
                  auVar273._8_4_ = -fVar239;
                  auVar273._12_4_ = -fVar280;
                  auVar273._16_4_ = -fVar281;
                  auVar273._20_4_ = -fVar282;
                  auVar273._24_4_ = -fVar283;
                  auVar273._28_4_ = -auVar307._28_4_;
                  auVar111._8_4_ = 0x42b0c0a5;
                  auVar111._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar111._12_4_ = 0x42b0c0a5;
                  auVar111._16_4_ = 0x42b0c0a5;
                  auVar111._20_4_ = 0x42b0c0a5;
                  auVar111._24_4_ = 0x42b0c0a5;
                  auVar111._28_4_ = 0x42b0c0a5;
                  auVar237 = vminps_avx(auVar273,auVar111);
                  auVar112._8_4_ = 0xc2b0c0a5;
                  auVar112._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar112._12_4_ = 0xc2b0c0a5;
                  auVar112._16_4_ = 0xc2b0c0a5;
                  auVar112._20_4_ = 0xc2b0c0a5;
                  auVar112._24_4_ = 0xc2b0c0a5;
                  auVar112._28_4_ = 0xc2b0c0a5;
                  auVar80 = vmaxps_avx(auVar237,auVar112);
                  auVar303._0_4_ = auVar80._0_4_ * 1.442695 + fVar167;
                  auVar303._4_4_ = auVar80._4_4_ * 1.442695 + fVar215;
                  auVar303._8_4_ = auVar80._8_4_ * 1.442695 + fVar216;
                  auVar303._12_4_ = auVar80._12_4_ * 1.442695 + fVar217;
                  auVar303._16_4_ = auVar80._16_4_ * 1.442695 + fVar218;
                  auVar303._20_4_ = auVar80._20_4_ * 1.442695 + fVar219;
                  auVar303._24_4_ = auVar80._24_4_ * 1.442695 + fVar221;
                  auVar303._28_4_ = auVar307._28_4_ + fVar296;
                  auVar158 = vroundps_avx(auVar303,1);
                  auVar237 = vcmpps_avx(auVar303,auVar158,1);
                  auVar237 = vandps_avx(auVar237,auVar302);
                  auVar237 = vsubps_avx(auVar158,auVar237);
                  fVar239 = auVar237._0_4_ * -0.6931472 + auVar80._0_4_;
                  fVar280 = auVar237._4_4_ * -0.6931472 + auVar80._4_4_;
                  fVar281 = auVar237._8_4_ * -0.6931472 + auVar80._8_4_;
                  fVar282 = auVar237._12_4_ * -0.6931472 + auVar80._12_4_;
                  fVar283 = auVar237._16_4_ * -0.6931472 + auVar80._16_4_;
                  fVar311 = auVar237._20_4_ * -0.6931472 + auVar80._20_4_;
                  fVar327 = auVar237._24_4_ * -0.6931472 + auVar80._24_4_;
                  auVar242._0_4_ = (int)auVar237._0_4_;
                  auVar242._4_4_ = (int)auVar237._4_4_;
                  auVar242._8_4_ = (int)auVar237._8_4_;
                  auVar242._12_4_ = (int)auVar237._12_4_;
                  auVar274._16_4_ = (int)auVar237._16_4_;
                  auVar274._0_16_ = auVar242;
                  auVar274._20_4_ = (int)auVar237._20_4_;
                  auVar274._24_4_ = (int)auVar237._24_4_;
                  auVar274._28_4_ = (int)auVar237._28_4_;
                  auVar240 = vpslld_avx(auVar242,0x17);
                  auVar168 = vpslld_avx(auVar274._16_16_,0x17);
                  auVar89._8_4_ = 0x3f800000;
                  auVar89._0_8_ = 0x3f8000003f800000;
                  auVar89._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar89);
                  auVar240 = vpaddd_avx(auVar240,auVar89);
                  auVar161._0_4_ =
                       (fVar239 + fVar74 +
                       fVar239 * fVar239 *
                       (fVar167 +
                       ((((fVar239 * 0.00019875691 + 0.0013981999) * fVar239 + 0.008333452) *
                         fVar239 + 0.041665796) * fVar239 + 0.16666666) * fVar239)) * auVar240._0_4_
                       + fVar74;
                  auVar161._4_4_ =
                       (fVar280 + fVar87 +
                       fVar280 * fVar280 *
                       (fVar215 +
                       ((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) *
                         fVar280 + 0.041665796) * fVar280 + 0.16666666) * fVar280)) * auVar240._4_4_
                       + fVar87;
                  auVar161._8_4_ =
                       (fVar281 + fVar116 +
                       fVar281 * fVar281 *
                       (fVar216 +
                       ((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                         fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281)) * auVar240._8_4_
                       + fVar116;
                  auVar161._12_4_ =
                       (fVar282 + fVar117 +
                       fVar282 * fVar282 *
                       (fVar217 +
                       ((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) *
                         fVar282 + 0.041665796) * fVar282 + 0.16666666) * fVar282)) *
                       auVar240._12_4_ + fVar117;
                  auVar161._16_4_ =
                       (fVar283 + fVar223 +
                       fVar283 * fVar283 *
                       (fVar218 +
                       ((((fVar283 * 0.00019875691 + 0.0013981999) * fVar283 + 0.008333452) *
                         fVar283 + 0.041665796) * fVar283 + 0.16666666) * fVar283)) * auVar168._0_4_
                       + fVar223;
                  auVar161._20_4_ =
                       (fVar311 + fVar118 +
                       fVar311 * fVar311 *
                       (fVar219 +
                       ((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 + 0.008333452) *
                         fVar311 + 0.041665796) * fVar311 + 0.16666666) * fVar311)) * auVar168._4_4_
                       + fVar118;
                  auVar161._24_4_ =
                       (fVar327 + fVar220 +
                       fVar327 * fVar327 *
                       (fVar221 +
                       ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                         fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327)) * auVar168._8_4_
                       + fVar220;
                  auVar161._28_4_ =
                       auVar158._28_4_ + auVar80._28_4_ + fVar222 + fVar296 + -0.47508308 + fVar222;
                  auVar237 = vrcpps_avx(auVar161);
                  in_ZMM7 = ZEXT3264(auVar237);
                  fVar74 = auVar237._0_4_;
                  fVar87 = auVar237._4_4_;
                  auVar39._4_4_ = auVar161._4_4_ * fVar87;
                  auVar39._0_4_ = auVar161._0_4_ * fVar74;
                  fVar116 = auVar237._8_4_;
                  auVar39._8_4_ = auVar161._8_4_ * fVar116;
                  fVar117 = auVar237._12_4_;
                  auVar39._12_4_ = auVar161._12_4_ * fVar117;
                  fVar223 = auVar237._16_4_;
                  auVar39._16_4_ = auVar161._16_4_ * fVar223;
                  fVar118 = auVar237._20_4_;
                  auVar39._20_4_ = auVar161._20_4_ * fVar118;
                  fVar220 = auVar237._24_4_;
                  auVar39._24_4_ = auVar161._24_4_ * fVar220;
                  auVar39._28_4_ = auVar161._28_4_;
                  auVar302 = vsubps_avx(auVar302,auVar39);
                  auVar304._0_4_ = fVar74 + fVar74 * auVar302._0_4_;
                  auVar304._4_4_ = fVar87 + fVar87 * auVar302._4_4_;
                  auVar304._8_4_ = fVar116 + fVar116 * auVar302._8_4_;
                  auVar304._12_4_ = fVar117 + fVar117 * auVar302._12_4_;
                  auVar304._16_4_ = fVar223 + fVar223 * auVar302._16_4_;
                  auVar304._20_4_ = fVar118 + fVar118 * auVar302._20_4_;
                  auVar304._24_4_ = fVar220 + fVar220 * auVar302._24_4_;
                  auVar304._28_4_ = auVar237._28_4_ + auVar302._28_4_;
                  break;
                case 5:
                  auVar237 = vminps_avx(auVar304,auVar289);
                  auVar80 = vmaxps_avx(auVar292,auVar237);
                  auVar270._0_4_ = fVar167 + auVar80._0_4_ * 1.442695;
                  auVar270._4_4_ = fVar215 + auVar80._4_4_ * 1.442695;
                  auVar270._8_4_ = fVar216 + auVar80._8_4_ * 1.442695;
                  auVar270._12_4_ = fVar217 + auVar80._12_4_ * 1.442695;
                  auVar270._16_4_ = fVar218 + auVar80._16_4_ * 1.442695;
                  auVar270._20_4_ = fVar219 + auVar80._20_4_ * 1.442695;
                  auVar270._24_4_ = fVar221 + auVar80._24_4_ * 1.442695;
                  auVar270._28_4_ = fVar296 + in_ZMM7._28_4_;
                  auVar158 = vroundps_avx(auVar270,1);
                  auVar237 = vcmpps_avx(auVar270,auVar158,1);
                  auVar237 = vandps_avx(auVar237,auVar302);
                  auVar237 = vsubps_avx(auVar158,auVar237);
                  auVar35._4_4_ = auVar237._4_4_ * 0.6931472;
                  auVar35._0_4_ = auVar237._0_4_ * 0.6931472;
                  auVar35._8_4_ = auVar237._8_4_ * 0.6931472;
                  auVar35._12_4_ = auVar237._12_4_ * 0.6931472;
                  auVar35._16_4_ = auVar237._16_4_ * 0.6931472;
                  auVar35._20_4_ = auVar237._20_4_ * 0.6931472;
                  auVar35._24_4_ = auVar237._24_4_ * 0.6931472;
                  auVar35._28_4_ = auVar158._28_4_;
                  auVar80 = vsubps_avx(auVar80,auVar35);
                  fVar311 = auVar80._0_4_;
                  fVar327 = auVar80._4_4_;
                  fVar328 = auVar80._8_4_;
                  fVar329 = auVar80._12_4_;
                  fVar330 = auVar80._16_4_;
                  fVar331 = auVar80._20_4_;
                  fVar332 = auVar80._24_4_;
                  auVar169._0_4_ = (int)auVar237._0_4_;
                  auVar169._4_4_ = (int)auVar237._4_4_;
                  auVar169._8_4_ = (int)auVar237._8_4_;
                  auVar169._12_4_ = (int)auVar237._12_4_;
                  auVar205._16_4_ = (int)auVar237._16_4_;
                  auVar205._0_16_ = auVar169;
                  auVar205._20_4_ = (int)auVar237._20_4_;
                  auVar205._24_4_ = (int)auVar237._24_4_;
                  auVar205._28_4_ = (int)auVar237._28_4_;
                  auVar240 = vpslld_avx(auVar169,0x17);
                  auVar168 = vpslld_avx(auVar205._16_16_,0x17);
                  auVar232._8_4_ = 0x3f800000;
                  auVar232._0_8_ = 0x3f8000003f800000;
                  auVar232._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar232);
                  auVar240 = vpaddd_avx(auVar240,auVar232);
                  auVar271._0_4_ =
                       (fVar311 + fVar74 +
                       fVar311 * fVar311 *
                       (((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 + 0.008333452) *
                          fVar311 + 0.041665796) * fVar311 + 0.16666666) * fVar311 + fVar167)) *
                       auVar240._0_4_ + fVar74;
                  auVar271._4_4_ =
                       (fVar327 + fVar87 +
                       fVar327 * fVar327 *
                       (((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                          fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327 + fVar215)) *
                       auVar240._4_4_ + fVar87;
                  auVar271._8_4_ =
                       (fVar328 + fVar116 +
                       fVar328 * fVar328 *
                       (((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 + 0.008333452) *
                          fVar328 + 0.041665796) * fVar328 + 0.16666666) * fVar328 + fVar216)) *
                       auVar240._8_4_ + fVar116;
                  auVar271._12_4_ =
                       (fVar329 + fVar117 +
                       fVar329 * fVar329 *
                       (((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 + 0.008333452) *
                          fVar329 + 0.041665796) * fVar329 + 0.16666666) * fVar329 + fVar217)) *
                       auVar240._12_4_ + fVar117;
                  auVar271._16_4_ =
                       (fVar330 + fVar223 +
                       fVar330 * fVar330 *
                       (((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 + 0.008333452) *
                          fVar330 + 0.041665796) * fVar330 + 0.16666666) * fVar330 + fVar218)) *
                       auVar168._0_4_ + fVar223;
                  auVar271._20_4_ =
                       (fVar331 + fVar118 +
                       fVar331 * fVar331 *
                       (((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 + 0.008333452) *
                          fVar331 + 0.041665796) * fVar331 + 0.16666666) * fVar331 + fVar219)) *
                       auVar168._4_4_ + fVar118;
                  auVar271._24_4_ =
                       (fVar332 + fVar220 +
                       fVar332 * fVar332 *
                       (((((fVar332 * 0.00019875691 + 0.0013981999) * fVar332 + 0.008333452) *
                          fVar332 + 0.041665796) * fVar332 + 0.16666666) * fVar332 + fVar221)) *
                       auVar168._8_4_ + fVar220;
                  auVar271._28_4_ =
                       auVar80._28_4_ + fVar222 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar296 + fVar222;
                  auVar81._8_4_ = 0x800000;
                  auVar81._0_8_ = 0x80000000800000;
                  auVar81._12_4_ = 0x800000;
                  auVar81._16_4_ = 0x800000;
                  auVar81._20_4_ = 0x800000;
                  auVar81._24_4_ = 0x800000;
                  auVar81._28_4_ = 0x800000;
                  auVar158 = vmaxps_avx(auVar271,auVar81);
                  auVar168 = vpsrld_avx(auVar158._16_16_,0x17);
                  auVar82._8_4_ = 0x807fffff;
                  auVar82._0_8_ = 0x807fffff807fffff;
                  auVar82._12_4_ = 0x807fffff;
                  auVar82._16_4_ = 0x807fffff;
                  auVar82._20_4_ = 0x807fffff;
                  auVar82._24_4_ = 0x807fffff;
                  auVar82._28_4_ = 0x807fffff;
                  auVar237 = vandps_avx(auVar158,auVar82);
                  auVar204 = vorps_avx(auVar237,auVar295._0_32_);
                  auVar83._8_4_ = 0x3f3504f3;
                  auVar83._0_8_ = 0x3f3504f33f3504f3;
                  auVar83._12_4_ = 0x3f3504f3;
                  auVar83._16_4_ = 0x3f3504f3;
                  auVar83._20_4_ = 0x3f3504f3;
                  auVar83._24_4_ = 0x3f3504f3;
                  auVar83._28_4_ = 0x3f3504f3;
                  auVar80 = vcmpps_avx(auVar83,auVar204,2);
                  auVar237 = vandnps_avx(auVar80,auVar204);
                  fVar311 = auVar204._0_4_ + -1.0 + auVar237._0_4_;
                  fVar327 = auVar204._4_4_ + -1.0 + auVar237._4_4_;
                  fVar328 = auVar204._8_4_ + -1.0 + auVar237._8_4_;
                  fVar329 = auVar204._12_4_ + -1.0 + auVar237._12_4_;
                  fVar330 = auVar204._16_4_ + -1.0 + auVar237._16_4_;
                  fVar331 = auVar204._20_4_ + -1.0 + auVar237._20_4_;
                  fVar332 = auVar204._24_4_ + -1.0 + auVar237._24_4_;
                  auVar168 = vpsubd_avx(auVar168,auVar80._16_16_);
                  auVar240 = vpsrld_avx(auVar158._0_16_,0x17);
                  auVar76._8_4_ = 0xffffff81;
                  auVar76._0_8_ = 0xffffff81ffffff81;
                  auVar76._12_4_ = 0xffffff81;
                  auVar168 = vpaddd_avx(auVar168,auVar76);
                  auVar240 = vpsubd_avx(auVar240,auVar80._0_16_);
                  auVar240 = vpaddd_avx(auVar240,auVar76);
                  auVar159._16_16_ = auVar168;
                  auVar159._0_16_ = auVar240;
                  auVar238 = ZEXT864(0) << 0x20;
                  auVar80 = vcmpps_avx(auVar271,ZEXT832(0) << 0x20,2);
                  auVar158 = vcvtdq2ps_avx(auVar159);
                  auVar36._4_4_ =
                       (fVar327 + auVar158._4_4_ * 0.6931472 +
                       fVar327 * fVar327 *
                       (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * 
                                                  (fVar327 * (fVar327 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar36._0_4_ =
                       (fVar311 + auVar158._0_4_ * 0.6931472 +
                       fVar311 * fVar311 *
                       (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * 
                                                  (fVar311 * (fVar311 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar36._8_4_ =
                       (fVar328 + auVar158._8_4_ * 0.6931472 +
                       fVar328 * fVar328 *
                       (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * 
                                                  (fVar328 * (fVar328 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar36._12_4_ =
                       (fVar329 + auVar158._12_4_ * 0.6931472 +
                       fVar329 * fVar329 *
                       (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * 
                                                  (fVar329 * (fVar329 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar36._16_4_ =
                       (fVar330 + auVar158._16_4_ * 0.6931472 +
                       fVar330 * fVar330 *
                       (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * 
                                                  (fVar330 * (fVar330 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar36._20_4_ =
                       (fVar331 + auVar158._20_4_ * 0.6931472 +
                       fVar331 * fVar331 *
                       (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * 
                                                  (fVar331 * (fVar331 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar36._24_4_ =
                       (fVar332 + auVar158._24_4_ * 0.6931472 +
                       fVar332 * fVar332 *
                       (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * 
                                                  (fVar332 * (fVar332 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar36._28_4_ = auVar204._28_4_ + -1.0 + auVar237._28_4_ + auVar158._28_4_ + 0.0;
                  auVar206._8_4_ = 0x7fffffff;
                  auVar206._0_8_ = 0x7fffffff7fffffff;
                  auVar206._12_4_ = 0x7fffffff;
                  auVar206._16_4_ = 0x7fffffff;
                  auVar206._20_4_ = 0x7fffffff;
                  auVar206._24_4_ = 0x7fffffff;
                  auVar206._28_4_ = 0x7fffffff;
                  auVar237 = vblendvps_avx(auVar36,auVar206,auVar80);
                  auVar237 = vminps_avx(auVar289,auVar237);
                  auVar80 = vmaxps_avx(auVar292,auVar237);
                  auVar207._0_4_ = auVar80._0_4_ * 1.442695 + fVar167;
                  auVar207._4_4_ = auVar80._4_4_ * 1.442695 + fVar215;
                  auVar207._8_4_ = auVar80._8_4_ * 1.442695 + fVar216;
                  auVar207._12_4_ = auVar80._12_4_ * 1.442695 + fVar217;
                  auVar207._16_4_ = auVar80._16_4_ * 1.442695 + fVar218;
                  auVar207._20_4_ = auVar80._20_4_ * 1.442695 + fVar219;
                  auVar207._24_4_ = auVar80._24_4_ * 1.442695 + fVar221;
                  auVar207._28_4_ = fVar296 + NAN;
                  auVar158 = vroundps_avx(auVar207,1);
                  auVar237 = vcmpps_avx(auVar207,auVar158,1);
                  auVar237 = vandps_avx(auVar237,auVar302);
                  auVar237 = vsubps_avx(auVar158,auVar237);
                  auVar37._4_4_ = auVar237._4_4_ * 0.6931472;
                  auVar37._0_4_ = auVar237._0_4_ * 0.6931472;
                  auVar37._8_4_ = auVar237._8_4_ * 0.6931472;
                  auVar37._12_4_ = auVar237._12_4_ * 0.6931472;
                  auVar37._16_4_ = auVar237._16_4_ * 0.6931472;
                  auVar37._20_4_ = auVar237._20_4_ * 0.6931472;
                  auVar37._24_4_ = auVar237._24_4_ * 0.6931472;
                  auVar37._28_4_ = auVar158._28_4_;
                  auVar80 = vsubps_avx(auVar80,auVar37);
                  fVar311 = auVar80._0_4_;
                  fVar327 = auVar80._4_4_;
                  fVar328 = auVar80._8_4_;
                  fVar329 = auVar80._12_4_;
                  fVar330 = auVar80._16_4_;
                  fVar331 = auVar80._20_4_;
                  fVar332 = auVar80._24_4_;
                  auVar294 = ZEXT3264(auVar302);
                  auVar295 = ZEXT3264(auVar295._0_32_);
                  fVar167 = fVar167 + ((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 +
                                        0.008333452) * fVar311 + 0.041665796) * fVar311 + 0.16666666
                                      ) * fVar311;
                  fVar215 = fVar215 + ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 +
                                        0.008333452) * fVar327 + 0.041665796) * fVar327 + 0.16666666
                                      ) * fVar327;
                  fVar216 = fVar216 + ((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 +
                                        0.008333452) * fVar328 + 0.041665796) * fVar328 + 0.16666666
                                      ) * fVar328;
                  fVar217 = fVar217 + ((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 +
                                        0.008333452) * fVar329 + 0.041665796) * fVar329 + 0.16666666
                                      ) * fVar329;
                  fVar218 = fVar218 + ((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 +
                                        0.008333452) * fVar330 + 0.041665796) * fVar330 + 0.16666666
                                      ) * fVar330;
                  fVar219 = fVar219 + ((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 +
                                        0.008333452) * fVar331 + 0.041665796) * fVar331 + 0.16666666
                                      ) * fVar331;
                  fVar221 = fVar221 + ((((fVar332 * 0.00019875691 + 0.0013981999) * fVar332 +
                                        0.008333452) * fVar332 + 0.041665796) * fVar332 + 0.16666666
                                      ) * fVar332;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar296 + auVar271._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar221,CONCAT420(fVar219,CONCAT416(fVar218
                                                  ,CONCAT412(fVar217,CONCAT48(fVar216,CONCAT44(
                                                  fVar215,fVar167))))))));
                  auVar170._0_4_ = (int)auVar237._0_4_;
                  auVar170._4_4_ = (int)auVar237._4_4_;
                  auVar170._8_4_ = (int)auVar237._8_4_;
                  auVar170._12_4_ = (int)auVar237._12_4_;
                  auVar208._16_4_ = (int)auVar237._16_4_;
                  auVar208._0_16_ = auVar170;
                  auVar208._20_4_ = (int)auVar237._20_4_;
                  auVar208._24_4_ = (int)auVar237._24_4_;
                  auVar208._28_4_ = (int)auVar237._28_4_;
                  auVar240 = vpslld_avx(auVar170,0x17);
                  auVar168 = vpslld_avx(auVar208._16_16_,0x17);
                  auVar88._8_4_ = 0x3f800000;
                  auVar88._0_8_ = 0x3f8000003f800000;
                  auVar88._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar88);
                  auVar240 = vpaddd_avx(auVar240,auVar88);
                  auVar160._0_4_ =
                       (fVar311 + fVar74 + fVar311 * fVar311 * fVar167) * auVar240._0_4_ + fVar74;
                  auVar160._4_4_ =
                       (fVar327 + fVar87 + fVar327 * fVar327 * fVar215) * auVar240._4_4_ + fVar87;
                  auVar160._8_4_ =
                       (fVar328 + fVar116 + fVar328 * fVar328 * fVar216) * auVar240._8_4_ + fVar116;
                  auVar160._12_4_ =
                       (fVar329 + fVar117 + fVar329 * fVar329 * fVar217) * auVar240._12_4_ + fVar117
                  ;
                  auVar160._16_4_ =
                       (fVar330 + fVar223 + fVar330 * fVar330 * fVar218) * auVar168._0_4_ + fVar223;
                  auVar160._20_4_ =
                       (fVar331 + fVar118 + fVar331 * fVar331 * fVar219) * auVar168._4_4_ + fVar118;
                  auVar160._24_4_ =
                       (fVar332 + fVar220 + fVar332 * fVar332 * fVar221) * auVar168._8_4_ + fVar220;
                  auVar160._28_4_ = auVar80._28_4_ + fVar222 + auVar158._28_4_ + fVar222;
                  auVar302 = vrcpps_avx(auVar160);
                  fVar74 = auVar302._0_4_;
                  fVar87 = auVar302._4_4_;
                  fVar116 = auVar302._8_4_;
                  fVar117 = auVar302._12_4_;
                  fVar223 = auVar302._16_4_;
                  fVar118 = auVar302._20_4_;
                  fVar220 = auVar302._24_4_;
                  auVar38._4_4_ = auVar160._4_4_ * (fVar87 + fVar87);
                  auVar38._0_4_ = auVar160._0_4_ * (fVar74 + fVar74);
                  auVar38._8_4_ = auVar160._8_4_ * (fVar116 + fVar116);
                  auVar38._12_4_ = auVar160._12_4_ * (fVar117 + fVar117);
                  auVar38._16_4_ = auVar160._16_4_ * (fVar223 + fVar223);
                  auVar38._20_4_ = auVar160._20_4_ * (fVar118 + fVar118);
                  auVar38._24_4_ = auVar160._24_4_ * (fVar220 + fVar220);
                  auVar38._28_4_ = auVar160._28_4_;
                  auVar110._8_4_ = 0x40000000;
                  auVar110._0_8_ = 0x4000000040000000;
                  auVar110._12_4_ = 0x40000000;
                  auVar110._16_4_ = 0x40000000;
                  auVar110._20_4_ = 0x40000000;
                  auVar110._24_4_ = 0x40000000;
                  auVar110._28_4_ = 0x40000000;
                  auVar237 = vsubps_avx(auVar110,auVar38);
                  auVar209._0_4_ = fVar74 + fVar74 + -1.0;
                  auVar209._4_4_ = fVar87 + fVar87 + -1.0;
                  auVar209._8_4_ = fVar116 + fVar116 + -1.0;
                  auVar209._12_4_ = fVar117 + fVar117 + -1.0;
                  auVar209._16_4_ = fVar223 + fVar223 + -1.0;
                  auVar209._20_4_ = fVar118 + fVar118 + -1.0;
                  auVar209._24_4_ = fVar220 + fVar220 + -1.0;
                  auVar209._28_4_ = auVar302._28_4_ + auVar302._28_4_ + -1.0;
                  auVar150._0_4_ = auVar209._0_4_ + fVar74 * auVar237._0_4_;
                  auVar150._4_4_ = auVar209._4_4_ + fVar87 * auVar237._4_4_;
                  auVar150._8_4_ = auVar209._8_4_ + fVar116 * auVar237._8_4_;
                  auVar150._12_4_ = auVar209._12_4_ + fVar117 * auVar237._12_4_;
                  auVar150._16_4_ = auVar209._16_4_ + fVar223 * auVar237._16_4_;
                  auVar150._20_4_ = auVar209._20_4_ + fVar118 * auVar237._20_4_;
                  auVar150._24_4_ = auVar209._24_4_ + fVar220 * auVar237._24_4_;
                  goto LAB_002a9b89;
                case 6:
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  fVar87 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar209._4_4_ = fVar87;
                  auVar209._0_4_ = fVar87;
                  auVar209._8_4_ = fVar87;
                  auVar209._12_4_ = fVar87;
                  auVar209._16_4_ = fVar87;
                  auVar209._20_4_ = fVar87;
                  auVar209._24_4_ = fVar87;
                  auVar209._28_4_ = fVar87;
                  auVar162._0_4_ = auVar307._0_4_ * fVar74 + fVar87;
                  auVar162._4_4_ = auVar307._4_4_ * fVar74 + fVar87;
                  auVar162._8_4_ = fVar239 * fVar74 + fVar87;
                  auVar162._12_4_ = fVar280 * fVar74 + fVar87;
                  auVar162._16_4_ = fVar281 * fVar74 + fVar87;
                  auVar162._20_4_ = fVar282 * fVar74 + fVar87;
                  auVar162._24_4_ = fVar283 * fVar74 + fVar87;
                  auVar162._28_4_ = fVar74 + fVar87;
                  auVar237 = vmaxps_avx(auVar162,auVar238._0_32_);
                  auVar302 = vminps_avx(auVar237,auVar302);
                  auVar150 = auVar302._0_28_;
LAB_002a9b89:
                  in_ZMM3 = ZEXT3264(auVar209);
                  auVar309._0_4_ = auVar307._0_4_ * auVar150._0_4_;
                  auVar309._4_4_ = auVar307._4_4_ * auVar150._4_4_;
                  auVar309._8_4_ = fVar239 * auVar150._8_4_;
                  auVar309._12_4_ = fVar280 * auVar150._12_4_;
                  auVar309._16_4_ = fVar281 * auVar150._16_4_;
                  auVar309._20_4_ = fVar282 * auVar150._20_4_;
                  auVar309._24_4_ = fVar283 * auVar150._24_4_;
                  auVar304 = auVar309._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var60 = auVar304;
                ppp_Var60 = ppp_Var60 + 4;
                uVar68 = uVar68 + 1;
                iVar50 = iVar50 + 1;
              } while (uVar68 != local_a8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar16 == 8) && (local_13c == 4)) {
      if ((long)local_a8.c < 1) goto LAB_002ab177;
      p_Var54 = pp_Var64[-3];
      iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
      iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
      iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
      uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
      uVar56 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
      uVar62 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
      local_198 = 0;
      auVar294 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar233._8_4_ = 0x3f000000;
      auVar233._0_8_ = 0x3f0000003f000000;
      auVar233._12_4_ = 0x3f000000;
      auVar238 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_a8.h) {
          iVar58 = bottom_blob->w;
          iVar70 = bottom_blob->h;
          ppp_Var60 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar22 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_a8.w) {
              uVar68 = 0;
              iVar50 = (1 - uVar56) * iVar69;
              do {
                if (lVar65 == 0) {
                  auVar90 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar90 = *(undefined1 (*) [16])(lVar65 + local_198 * 0x10);
                }
                auVar295 = ZEXT1664(auVar90);
                if (0 < (int)uVar22) {
                  pvVar73 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      uVar61 = 0;
                      uVar63 = 0;
                      do {
                        iVar46 = (((int)uVar63 - uVar62) + 1) * iVar17 + iVar55;
                        if ((((-1 < iVar46) && (iVar47 = iVar46 / iVar18, iVar46 % iVar18 == 0)) &&
                            (0 < (int)uVar56)) && (iVar47 < iVar70)) {
                          lVar53 = (long)iVar47 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar67 = (ulong)uVar56;
                          uVar71 = uVar61;
                          iVar46 = iVar50;
                          do {
                            if (((-1 < iVar46) && (iVar47 = iVar46 / iVar72, iVar46 % iVar72 == 0))
                               && (iVar47 < iVar58)) {
                              lVar51 = (long)(iVar47 << 3);
                              fVar74 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53);
                              fVar87 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 4);
                              fVar116 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 8);
                              fVar117 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0xc);
                              fVar223 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x10);
                              fVar118 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x14);
                              fVar220 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x18);
                              fVar222 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0x1c);
                              uVar52 = uVar71 & 0xffffffff;
                              pfVar8 = (float *)((long)pvVar73 + uVar52 * 4);
                              pfVar1 = (float *)((long)pvVar73 + uVar52 * 4 + 0x10);
                              pfVar2 = (float *)((long)pvVar73 + uVar52 * 4 + 0x20);
                              pfVar3 = (float *)((long)pvVar73 + uVar52 * 4 + 0x30);
                              pfVar4 = (float *)((long)pvVar73 + uVar52 * 4 + 0x40);
                              in_ZMM7 = ZEXT1664(CONCAT412(fVar223 * pfVar4[3],
                                                           CONCAT48(fVar223 * pfVar4[2],
                                                                    CONCAT44(fVar223 * pfVar4[1],
                                                                             fVar223 * *pfVar4))));
                              pfVar5 = (float *)((long)pvVar73 + uVar52 * 4 + 0x50);
                              pfVar6 = (float *)((long)pvVar73 + uVar52 * 4 + 0x60);
                              pfVar7 = (float *)((long)pvVar73 + uVar52 * 4 + 0x70);
                              in_ZMM3 = ZEXT1664(CONCAT412(fVar222 * pfVar7[3],
                                                           CONCAT48(fVar222 * pfVar7[2],
                                                                    CONCAT44(fVar222 * pfVar7[1],
                                                                             fVar222 * *pfVar7))));
                              auVar295 = ZEXT1664(CONCAT412(fVar74 * pfVar8[3] + auVar295._12_4_ +
                                                            fVar87 * pfVar1[3] + fVar116 * pfVar2[3]
                                                            + fVar117 * pfVar3[3] +
                                                              fVar223 * pfVar4[3] +
                                                              fVar118 * pfVar5[3] +
                                                            fVar220 * pfVar6[3] +
                                                            fVar222 * pfVar7[3],
                                                            CONCAT48(fVar74 * pfVar8[2] +
                                                                     auVar295._8_4_ +
                                                                     fVar87 * pfVar1[2] +
                                                                     fVar116 * pfVar2[2] +
                                                                     fVar117 * pfVar3[2] +
                                                                     fVar223 * pfVar4[2] +
                                                                     fVar118 * pfVar5[2] +
                                                                     fVar220 * pfVar6[2] +
                                                                     fVar222 * pfVar7[2],
                                                                     CONCAT44(fVar74 * pfVar8[1] +
                                                                              auVar295._4_4_ +
                                                                              fVar87 * pfVar1[1] +
                                                                              fVar116 * pfVar2[1] +
                                                                              fVar117 * pfVar3[1] +
                                                                              fVar223 * pfVar4[1] +
                                                                              fVar118 * pfVar5[1] +
                                                                              fVar220 * pfVar6[1] +
                                                                              fVar222 * pfVar7[1],
                                                                              fVar74 * *pfVar8 +
                                                                              auVar295._0_4_ +
                                                                              fVar87 * *pfVar1 +
                                                                              fVar116 * *pfVar2 +
                                                                              fVar117 * *pfVar3 +
                                                                              fVar223 * *pfVar4 +
                                                                              fVar118 * *pfVar5 +
                                                                              fVar220 * *pfVar6 +
                                                                              fVar222 * *pfVar7))));
                            }
                            uVar71 = uVar71 + 0x20;
                            iVar46 = iVar46 + iVar69;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar63 = uVar63 + 1;
                        uVar61 = uVar61 + (ulong)uVar56 * 0x20;
                      } while (uVar63 != uVar62);
                    }
                    auVar90 = auVar295._0_16_;
                    pvVar73 = (void *)((long)pvVar73 + (long)(int)(uVar56 * uVar62 * 0x20) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar22);
                }
                auVar240 = auVar294._0_16_;
                auVar168 = auVar238._0_16_;
                fVar74 = auVar238._0_4_;
                fVar87 = auVar238._4_4_;
                fVar116 = auVar238._8_4_;
                fVar117 = auVar238._12_4_;
                fVar223 = auVar90._4_4_;
                fVar118 = auVar90._8_4_;
                fVar220 = auVar90._12_4_;
                switch(uVar21) {
                case 1:
                  auVar90 = vmaxps_avx(auVar240,auVar90);
                  break;
                case 2:
                  auVar168 = vmaxps_avx(auVar240,auVar90);
                  in_ZMM7 = ZEXT1664(auVar168);
                  auVar240 = vminps_avx(auVar240,auVar90);
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  auVar90._0_4_ = fVar74 * auVar240._0_4_ + auVar168._0_4_;
                  auVar90._4_4_ = fVar74 * auVar240._4_4_ + auVar168._4_4_;
                  auVar90._8_4_ = fVar74 * auVar240._8_4_ + auVar168._8_4_;
                  auVar90._12_4_ = fVar74 * auVar240._12_4_ + auVar168._12_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                  auVar247._4_4_ = uVar9;
                  auVar247._0_4_ = uVar9;
                  auVar247._8_4_ = uVar9;
                  auVar247._12_4_ = uVar9;
                  in_ZMM7 = ZEXT1664(auVar247);
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar314._4_4_ = uVar9;
                  auVar314._0_4_ = uVar9;
                  auVar314._8_4_ = uVar9;
                  auVar314._12_4_ = uVar9;
                  auVar168 = vmaxps_avx(auVar90,auVar247);
                  auVar90 = vminps_avx(auVar314,auVar168);
                  break;
                case 4:
                  auVar91._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
                  auVar91._8_4_ = -fVar118;
                  auVar91._12_4_ = -fVar220;
                  auVar124._8_4_ = 0x42b0c0a5;
                  auVar124._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar124._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar91,auVar124);
                  auVar125._8_4_ = 0xc2b0c0a5;
                  auVar125._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar125._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar240,auVar125);
                  auVar248._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar248._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar248._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar248._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar315._0_4_ = (int)auVar248._0_4_;
                  auVar315._4_4_ = (int)auVar248._4_4_;
                  auVar315._8_4_ = (int)auVar248._8_4_;
                  auVar315._12_4_ = (int)auVar248._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar315);
                  auVar240 = vcmpps_avx(auVar248,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  fVar223 = auVar240._0_4_ * -0.6931472 + auVar284._0_4_;
                  fVar118 = auVar240._4_4_ * -0.6931472 + auVar284._4_4_;
                  fVar220 = auVar240._8_4_ * -0.6931472 + auVar284._8_4_;
                  fVar222 = auVar240._12_4_ * -0.6931472 + auVar284._12_4_;
                  auVar249._0_4_ = (int)auVar240._0_4_;
                  auVar249._4_4_ = (int)auVar240._4_4_;
                  auVar249._8_4_ = (int)auVar240._8_4_;
                  auVar249._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar249,0x17);
                  auVar240 = vpaddd_avx(auVar240,auVar168);
                  auVar92._0_4_ =
                       (fVar223 * fVar223 *
                        (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) *
                           fVar223 + 0.041665796) * fVar223 + 0.16666666) * fVar223 + 0.5) +
                       fVar223 + fVar74) * auVar240._0_4_ + fVar74;
                  auVar92._4_4_ =
                       (fVar118 * fVar118 *
                        (((((fVar118 * 0.00019875691 + 0.0013981999) * fVar118 + 0.008333452) *
                           fVar118 + 0.041665796) * fVar118 + 0.16666666) * fVar118 + 0.5) +
                       fVar118 + fVar87) * auVar240._4_4_ + fVar87;
                  auVar92._8_4_ =
                       (fVar220 * fVar220 *
                        (((((fVar220 * 0.00019875691 + 0.0013981999) * fVar220 + 0.008333452) *
                           fVar220 + 0.041665796) * fVar220 + 0.16666666) * fVar220 + 0.5) +
                       fVar220 + fVar116) * auVar240._8_4_ + fVar116;
                  auVar92._12_4_ =
                       (fVar222 * fVar222 *
                        (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                           fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) +
                       fVar222 + fVar117) * auVar240._12_4_ + fVar117;
                  auVar240 = vrcpps_avx(auVar92);
                  in_ZMM7 = ZEXT1664(auVar240);
                  fVar74 = auVar240._0_4_;
                  auVar93._0_4_ = auVar92._0_4_ * fVar74;
                  fVar87 = auVar240._4_4_;
                  auVar93._4_4_ = auVar92._4_4_ * fVar87;
                  fVar116 = auVar240._8_4_;
                  auVar93._8_4_ = auVar92._8_4_ * fVar116;
                  fVar117 = auVar240._12_4_;
                  auVar93._12_4_ = auVar92._12_4_ * fVar117;
                  auVar168 = vsubps_avx(auVar168,auVar93);
                  auVar90._0_4_ = fVar74 + fVar74 * auVar168._0_4_;
                  auVar90._4_4_ = fVar87 + fVar87 * auVar168._4_4_;
                  auVar90._8_4_ = fVar116 + fVar116 * auVar168._8_4_;
                  auVar90._12_4_ = fVar117 + fVar117 * auVar168._12_4_;
                  break;
                case 5:
                  auVar224._8_4_ = 0x42b0c0a5;
                  auVar224._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar224._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar90,auVar224);
                  auVar285._8_4_ = 0xc2b0c0a5;
                  auVar285._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar285._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar285,auVar240);
                  auVar297._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar297._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar297._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar297._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar312._0_4_ = (int)auVar297._0_4_;
                  auVar312._4_4_ = (int)auVar297._4_4_;
                  auVar312._8_4_ = (int)auVar297._8_4_;
                  auVar312._12_4_ = (int)auVar297._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar312);
                  auVar240 = vcmpps_avx(auVar297,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  auVar313._0_4_ = auVar240._0_4_ * 0.6931472;
                  auVar313._4_4_ = auVar240._4_4_ * 0.6931472;
                  auVar313._8_4_ = auVar240._8_4_ * 0.6931472;
                  auVar313._12_4_ = auVar240._12_4_ * 0.6931472;
                  auVar298 = vsubps_avx(auVar284,auVar313);
                  fVar222 = auVar298._0_4_;
                  fVar167 = auVar298._4_4_;
                  fVar215 = auVar298._8_4_;
                  fVar216 = auVar298._12_4_;
                  auVar243._0_4_ = (int)auVar240._0_4_;
                  auVar243._4_4_ = (int)auVar240._4_4_;
                  auVar243._8_4_ = (int)auVar240._8_4_;
                  auVar243._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar243,0x17);
                  auVar240 = vpaddd_avx(auVar240,auVar168);
                  auVar244._0_4_ =
                       (fVar222 + fVar74 +
                       fVar222 * fVar222 *
                       (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                          fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5)) *
                       auVar240._0_4_ + fVar74;
                  auVar244._4_4_ =
                       (fVar167 + fVar87 +
                       fVar167 * fVar167 *
                       (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                          fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) *
                       auVar240._4_4_ + fVar87;
                  auVar244._8_4_ =
                       (fVar215 + fVar116 +
                       fVar215 * fVar215 *
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) *
                       auVar240._8_4_ + fVar116;
                  auVar244._12_4_ =
                       (fVar216 + fVar117 +
                       fVar216 * fVar216 *
                       (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) *
                          fVar216 + 0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) *
                       auVar240._12_4_ + fVar117;
                  auVar119._8_4_ = 0x800000;
                  auVar119._0_8_ = 0x80000000800000;
                  auVar119._12_4_ = 0x800000;
                  auVar240 = vmaxps_avx(auVar244,auVar119);
                  auVar298 = vpsrld_avx(auVar240,0x17);
                  auVar171._8_4_ = 0xffffff82;
                  auVar171._0_8_ = 0xffffff82ffffff82;
                  auVar171._12_4_ = 0xffffff82;
                  auVar298 = vpaddd_avx(auVar298,auVar171);
                  auVar172._8_4_ = 0x807fffff;
                  auVar172._0_8_ = 0x807fffff807fffff;
                  auVar172._12_4_ = 0x807fffff;
                  auVar240 = vandps_avx(auVar240,auVar172);
                  auVar75 = vorps_avx(auVar240,auVar233);
                  auVar284 = vcvtdq2ps_avx(auVar298);
                  auVar173._8_4_ = 0x3f3504f3;
                  auVar173._0_8_ = 0x3f3504f33f3504f3;
                  auVar173._12_4_ = 0x3f3504f3;
                  auVar298 = vcmpps_avx(auVar75,auVar173,1);
                  auVar240 = vandps_avx(auVar298,auVar75);
                  fVar222 = auVar75._0_4_ + -1.0 + auVar240._0_4_;
                  fVar167 = auVar75._4_4_ + -1.0 + auVar240._4_4_;
                  fVar215 = auVar75._8_4_ + -1.0 + auVar240._8_4_;
                  fVar216 = auVar75._12_4_ + -1.0 + auVar240._12_4_;
                  auVar240 = vandps_avx(auVar298,auVar168);
                  auVar298 = vsubps_avx(auVar284,auVar240);
                  auVar240 = vcmpps_avx(auVar244,_DAT_00515090,2);
                  auVar120._0_4_ =
                       (fVar222 * fVar222 *
                        (((((((((fVar222 * 0.070376836 + -0.1151461) * fVar222 + 0.116769984) *
                               fVar222 + -0.12420141) * fVar222 + 0.14249323) * fVar222 +
                            -0.16668057) * fVar222 + 0.20000714) * fVar222 + -0.24999994) * fVar222
                         + 0.3333333) * fVar222 + -0.5) + auVar298._0_4_ * 0.6931472 + fVar222) *
                       -2.0;
                  auVar120._4_4_ =
                       (fVar167 * fVar167 *
                        (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                               fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                            -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) * fVar167
                         + 0.3333333) * fVar167 + -0.5) + auVar298._4_4_ * 0.6931472 + fVar167) *
                       -2.0;
                  auVar120._8_4_ =
                       (fVar215 * fVar215 *
                        (((((((((fVar215 * 0.070376836 + -0.1151461) * fVar215 + 0.116769984) *
                               fVar215 + -0.12420141) * fVar215 + 0.14249323) * fVar215 +
                            -0.16668057) * fVar215 + 0.20000714) * fVar215 + -0.24999994) * fVar215
                         + 0.3333333) * fVar215 + -0.5) + auVar298._8_4_ * 0.6931472 + fVar215) *
                       -2.0;
                  auVar120._12_4_ =
                       (fVar216 * fVar216 *
                        (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) *
                               fVar216 + -0.12420141) * fVar216 + 0.14249323) * fVar216 +
                            -0.16668057) * fVar216 + 0.20000714) * fVar216 + -0.24999994) * fVar216
                         + 0.3333333) * fVar216 + -0.5) + auVar298._12_4_ * 0.6931472 + fVar216) *
                       -2.0;
                  auVar174._8_4_ = 0x7fffffff;
                  auVar174._0_8_ = 0x7fffffff7fffffff;
                  auVar174._12_4_ = 0x7fffffff;
                  auVar240 = vblendvps_avx(auVar120,auVar174,auVar240);
                  auVar175._8_4_ = 0x42b0c0a5;
                  auVar175._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar175._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar240,auVar175);
                  auVar176._8_4_ = 0xc2b0c0a5;
                  auVar176._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar176._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar240,auVar176);
                  auVar177._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar177._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar177._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar177._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar245._0_4_ = (int)auVar177._0_4_;
                  auVar245._4_4_ = (int)auVar177._4_4_;
                  auVar245._8_4_ = (int)auVar177._8_4_;
                  auVar245._12_4_ = (int)auVar177._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar245);
                  auVar240 = vcmpps_avx(auVar177,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  auVar246._0_4_ = auVar240._0_4_ * 0.6931472;
                  auVar246._4_4_ = auVar240._4_4_ * 0.6931472;
                  auVar246._8_4_ = auVar240._8_4_ * 0.6931472;
                  auVar246._12_4_ = auVar240._12_4_ * 0.6931472;
                  auVar238 = ZEXT1664(auVar168);
                  auVar298 = vsubps_avx(auVar284,auVar246);
                  fVar222 = auVar298._0_4_;
                  fVar167 = auVar298._4_4_;
                  fVar215 = auVar298._8_4_;
                  fVar216 = auVar298._12_4_;
                  auVar294 = ZEXT864(0) << 0x20;
                  auVar178._0_4_ = (int)auVar240._0_4_;
                  auVar178._4_4_ = (int)auVar240._4_4_;
                  auVar178._8_4_ = (int)auVar240._8_4_;
                  auVar178._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar178,0x17);
                  auVar168 = vpaddd_avx(auVar240,auVar168);
                  auVar121._0_4_ =
                       (fVar222 + fVar74 +
                       (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                          fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) *
                       fVar222 * fVar222) * auVar168._0_4_ + fVar74;
                  auVar121._4_4_ =
                       (fVar167 + fVar87 +
                       (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                          fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) *
                       fVar167 * fVar167) * auVar168._4_4_ + fVar87;
                  auVar121._8_4_ =
                       (fVar215 + fVar116 +
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5) *
                       fVar215 * fVar215) * auVar168._8_4_ + fVar116;
                  auVar121._12_4_ =
                       (fVar216 + fVar117 +
                       (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) *
                          fVar216 + 0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5) *
                       fVar216 * fVar216) * auVar168._12_4_ + fVar117;
                  auVar168 = vrcpps_avx(auVar121);
                  fVar74 = auVar168._0_4_;
                  fVar222 = fVar74 + fVar74;
                  fVar87 = auVar168._4_4_;
                  fVar167 = fVar87 + fVar87;
                  fVar116 = auVar168._8_4_;
                  fVar215 = fVar116 + fVar116;
                  fVar117 = auVar168._12_4_;
                  fVar216 = fVar117 + fVar117;
                  in_ZMM7 = ZEXT1664(CONCAT412(fVar216,CONCAT48(fVar215,CONCAT44(fVar167,fVar222))))
                  ;
                  auVar122._0_4_ = auVar121._0_4_ * fVar222;
                  auVar122._4_4_ = auVar121._4_4_ * fVar167;
                  auVar122._8_4_ = auVar121._8_4_ * fVar215;
                  auVar122._12_4_ = auVar121._12_4_ * fVar216;
                  auVar225._8_4_ = 0x40000000;
                  auVar225._0_8_ = 0x4000000040000000;
                  auVar225._12_4_ = 0x40000000;
                  auVar168 = vsubps_avx(auVar225,auVar122);
                  auVar179._0_4_ = fVar222 + -1.0;
                  auVar179._4_4_ = fVar167 + -1.0;
                  auVar179._8_4_ = fVar215 + -1.0;
                  auVar179._12_4_ = fVar216 + -1.0;
                  auVar123._0_4_ = auVar179._0_4_ + fVar74 * auVar168._0_4_;
                  auVar123._4_4_ = auVar179._4_4_ + fVar87 * auVar168._4_4_;
                  auVar123._8_4_ = auVar179._8_4_ + fVar116 * auVar168._8_4_;
                  auVar123._12_4_ = auVar179._12_4_ + fVar117 * auVar168._12_4_;
                  goto LAB_002aa3e6;
                case 6:
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  fVar87 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar179._4_4_ = fVar87;
                  auVar179._0_4_ = fVar87;
                  auVar179._8_4_ = fVar87;
                  auVar179._12_4_ = fVar87;
                  auVar126._0_4_ = fVar74 * auVar90._0_4_ + fVar87;
                  auVar126._4_4_ = fVar74 * fVar223 + fVar87;
                  auVar126._8_4_ = fVar74 * fVar118 + fVar87;
                  auVar126._12_4_ = fVar74 * fVar220 + fVar87;
                  auVar240 = vmaxps_avx(auVar240,auVar126);
                  auVar123 = vminps_avx(auVar240,auVar168);
LAB_002aa3e6:
                  in_ZMM3 = ZEXT1664(auVar179);
                  auVar90._0_4_ = auVar123._0_4_ * auVar90._0_4_;
                  auVar90._4_4_ = auVar123._4_4_ * fVar223;
                  auVar90._8_4_ = auVar123._8_4_ * fVar118;
                  auVar90._12_4_ = auVar123._12_4_ * fVar220;
                }
                *(undefined1 (*) [16])ppp_Var60 = auVar90;
                ppp_Var60 = ppp_Var60 + 2;
                uVar68 = uVar68 + 1;
                iVar50 = iVar50 + 1;
              } while (uVar68 != local_a8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar16 == 1) && (local_13c == 8)) {
      if ((long)local_a8.c < 1) goto LAB_002ab177;
      p_Var54 = pp_Var64[-3];
      iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
      iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
      iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
      uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
      uVar56 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
      uVar62 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
      local_198 = 0;
      auVar238 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar295 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar294 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar290._8_4_ = 0x42b0c0a5;
      auVar290._0_8_ = 0x42b0c0a542b0c0a5;
      auVar290._12_4_ = 0x42b0c0a5;
      auVar290._16_4_ = 0x42b0c0a5;
      auVar290._20_4_ = 0x42b0c0a5;
      auVar290._24_4_ = 0x42b0c0a5;
      auVar290._28_4_ = 0x42b0c0a5;
      auVar293._8_4_ = 0xc2b0c0a5;
      auVar293._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar293._12_4_ = 0xc2b0c0a5;
      auVar293._16_4_ = 0xc2b0c0a5;
      auVar293._20_4_ = 0xc2b0c0a5;
      auVar293._24_4_ = 0xc2b0c0a5;
      auVar293._28_4_ = 0xc2b0c0a5;
      do {
        if (0 < local_a8.h) {
          iVar58 = bottom_blob->w;
          iVar70 = bottom_blob->h;
          ppp_Var60 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar22 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_a8.w) {
              uVar68 = 0;
              iVar50 = (1 - uVar56) * iVar69;
              do {
                if (lVar65 == 0) {
                  auVar307 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar307 = ZEXT3264(*(undefined1 (*) [32])(lVar65 + local_198 * 0x20));
                }
                if (0 < (int)uVar22) {
                  pvVar73 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      uVar63 = 0;
                      uVar61 = 0;
                      do {
                        iVar46 = (((int)uVar61 - uVar62) + 1) * iVar17 + iVar55;
                        if ((((-1 < iVar46) && (iVar47 = iVar46 / iVar18, iVar46 % iVar18 == 0)) &&
                            (iVar47 < iVar70)) && (0 < (int)uVar56)) {
                          uVar67 = (ulong)uVar56;
                          uVar71 = uVar63;
                          iVar46 = iVar50;
                          do {
                            if (((-1 < iVar46) && (iVar48 = iVar46 / iVar72, iVar46 % iVar72 == 0))
                               && (iVar48 < iVar58)) {
                              fVar74 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar48 * 4 +
                                                 (long)iVar47 *
                                                 (long)bottom_blob->w * bottom_blob->elemsize +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar59
                                                 );
                              pfVar1 = (float *)((long)pvVar73 + (uVar71 & 0xffffffff) * 4);
                              auVar307 = ZEXT3264(CONCAT428(auVar307._28_4_ + fVar74,
                                                            CONCAT424(auVar307._24_4_ +
                                                                      fVar74 * pfVar1[6],
                                                                      CONCAT420(auVar307._20_4_ +
                                                                                fVar74 * pfVar1[5],
                                                                                CONCAT416(auVar307.
                                                  _16_4_ + fVar74 * pfVar1[4],
                                                  CONCAT412(auVar307._12_4_ + fVar74 * pfVar1[3],
                                                            CONCAT48(auVar307._8_4_ +
                                                                     fVar74 * pfVar1[2],
                                                                     CONCAT44(auVar307._4_4_ +
                                                                              fVar74 * pfVar1[1],
                                                                              auVar307._0_4_ +
                                                                              fVar74 * *pfVar1))))))
                                                  ));
                            }
                            uVar71 = uVar71 + 8;
                            iVar46 = iVar46 + iVar69;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar61 = uVar61 + 1;
                        uVar63 = uVar63 + (ulong)uVar56 * 8;
                      } while (uVar61 != uVar62);
                    }
                    pvVar73 = (void *)((long)pvVar73 + (long)(int)(uVar56 * uVar62 * 8) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar22);
                }
                auVar306 = auVar307._0_32_;
                fVar239 = auVar307._8_4_;
                fVar280 = auVar307._12_4_;
                fVar281 = auVar307._16_4_;
                fVar282 = auVar307._20_4_;
                fVar283 = auVar307._24_4_;
                fVar167 = auVar295._0_4_;
                fVar215 = auVar295._4_4_;
                fVar216 = auVar295._8_4_;
                fVar217 = auVar295._12_4_;
                fVar218 = auVar295._16_4_;
                fVar219 = auVar295._20_4_;
                fVar221 = auVar295._24_4_;
                fVar296 = auVar295._28_4_;
                auVar302 = auVar294._0_32_;
                fVar74 = auVar294._0_4_;
                fVar87 = auVar294._4_4_;
                fVar116 = auVar294._8_4_;
                fVar117 = auVar294._12_4_;
                fVar223 = auVar294._16_4_;
                fVar118 = auVar294._20_4_;
                fVar220 = auVar294._24_4_;
                fVar222 = auVar294._28_4_;
                auVar310._28_36_ = auVar307._28_36_;
                switch(uVar21) {
                case 1:
                  auVar306 = vmaxps_avx(auVar306,auVar238._0_32_);
                  break;
                case 2:
                  auVar302 = vmaxps_avx(auVar306,ZEXT1632(ZEXT816(0) << 0x40));
                  in_ZMM7 = ZEXT3264(auVar302);
                  auVar238 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar237 = vminps_avx(auVar306,ZEXT1632(ZEXT816(0) << 0x40));
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  auVar306._0_4_ = fVar74 * auVar237._0_4_ + auVar302._0_4_;
                  auVar306._4_4_ = fVar74 * auVar237._4_4_ + auVar302._4_4_;
                  auVar306._8_4_ = fVar74 * auVar237._8_4_ + auVar302._8_4_;
                  auVar306._12_4_ = fVar74 * auVar237._12_4_ + auVar302._12_4_;
                  auVar306._16_4_ = fVar74 * auVar237._16_4_ + auVar302._16_4_;
                  auVar306._20_4_ = fVar74 * auVar237._20_4_ + auVar302._20_4_;
                  auVar306._24_4_ = fVar74 * auVar237._24_4_ + auVar302._24_4_;
                  auVar306._28_4_ = auVar237._28_4_ + auVar302._28_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                  auVar277._4_4_ = uVar9;
                  auVar277._0_4_ = uVar9;
                  auVar277._8_4_ = uVar9;
                  auVar277._12_4_ = uVar9;
                  auVar277._16_4_ = uVar9;
                  auVar277._20_4_ = uVar9;
                  auVar277._24_4_ = uVar9;
                  auVar277._28_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar326._4_4_ = uVar9;
                  auVar326._0_4_ = uVar9;
                  auVar326._8_4_ = uVar9;
                  auVar326._12_4_ = uVar9;
                  auVar326._16_4_ = uVar9;
                  auVar326._20_4_ = uVar9;
                  auVar326._24_4_ = uVar9;
                  auVar326._28_4_ = uVar9;
                  auVar302 = vmaxps_avx(auVar306,auVar277);
                  in_ZMM7 = ZEXT3264(auVar302);
                  auVar306 = vminps_avx(auVar326,auVar302);
                  break;
                case 4:
                  auVar278._0_8_ = auVar307._0_8_ ^ 0x8000000080000000;
                  auVar278._8_4_ = -fVar239;
                  auVar278._12_4_ = -fVar280;
                  auVar278._16_4_ = -fVar281;
                  auVar278._20_4_ = -fVar282;
                  auVar278._24_4_ = -fVar283;
                  auVar278._28_4_ = -auVar307._28_4_;
                  auVar114._8_4_ = 0x42b0c0a5;
                  auVar114._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar114._12_4_ = 0x42b0c0a5;
                  auVar114._16_4_ = 0x42b0c0a5;
                  auVar114._20_4_ = 0x42b0c0a5;
                  auVar114._24_4_ = 0x42b0c0a5;
                  auVar114._28_4_ = 0x42b0c0a5;
                  auVar237 = vminps_avx(auVar278,auVar114);
                  auVar115._8_4_ = 0xc2b0c0a5;
                  auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar115._12_4_ = 0xc2b0c0a5;
                  auVar115._16_4_ = 0xc2b0c0a5;
                  auVar115._20_4_ = 0xc2b0c0a5;
                  auVar115._24_4_ = 0xc2b0c0a5;
                  auVar115._28_4_ = 0xc2b0c0a5;
                  auVar80 = vmaxps_avx(auVar237,auVar115);
                  auVar305._0_4_ = auVar80._0_4_ * 1.442695 + fVar167;
                  auVar305._4_4_ = auVar80._4_4_ * 1.442695 + fVar215;
                  auVar305._8_4_ = auVar80._8_4_ * 1.442695 + fVar216;
                  auVar305._12_4_ = auVar80._12_4_ * 1.442695 + fVar217;
                  auVar305._16_4_ = auVar80._16_4_ * 1.442695 + fVar218;
                  auVar305._20_4_ = auVar80._20_4_ * 1.442695 + fVar219;
                  auVar305._24_4_ = auVar80._24_4_ * 1.442695 + fVar221;
                  auVar305._28_4_ = auVar307._28_4_ + fVar296;
                  auVar158 = vroundps_avx(auVar305,1);
                  auVar237 = vcmpps_avx(auVar305,auVar158,1);
                  auVar237 = vandps_avx(auVar237,auVar302);
                  auVar237 = vsubps_avx(auVar158,auVar237);
                  fVar239 = auVar237._0_4_ * -0.6931472 + auVar80._0_4_;
                  fVar280 = auVar237._4_4_ * -0.6931472 + auVar80._4_4_;
                  fVar281 = auVar237._8_4_ * -0.6931472 + auVar80._8_4_;
                  fVar282 = auVar237._12_4_ * -0.6931472 + auVar80._12_4_;
                  fVar283 = auVar237._16_4_ * -0.6931472 + auVar80._16_4_;
                  fVar311 = auVar237._20_4_ * -0.6931472 + auVar80._20_4_;
                  fVar327 = auVar237._24_4_ * -0.6931472 + auVar80._24_4_;
                  auVar250._0_4_ = (int)auVar237._0_4_;
                  auVar250._4_4_ = (int)auVar237._4_4_;
                  auVar250._8_4_ = (int)auVar237._8_4_;
                  auVar250._12_4_ = (int)auVar237._12_4_;
                  auVar279._16_4_ = (int)auVar237._16_4_;
                  auVar279._0_16_ = auVar250;
                  auVar279._20_4_ = (int)auVar237._20_4_;
                  auVar279._24_4_ = (int)auVar237._24_4_;
                  auVar279._28_4_ = (int)auVar237._28_4_;
                  auVar240 = vpslld_avx(auVar250,0x17);
                  auVar168 = vpslld_avx(auVar279._16_16_,0x17);
                  auVar95._8_4_ = 0x3f800000;
                  auVar95._0_8_ = 0x3f8000003f800000;
                  auVar95._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar95);
                  auVar240 = vpaddd_avx(auVar240,auVar95);
                  auVar165._0_4_ =
                       (fVar239 + fVar74 +
                       fVar239 * fVar239 *
                       (fVar167 +
                       ((((fVar239 * 0.00019875691 + 0.0013981999) * fVar239 + 0.008333452) *
                         fVar239 + 0.041665796) * fVar239 + 0.16666666) * fVar239)) * auVar240._0_4_
                       + fVar74;
                  auVar165._4_4_ =
                       (fVar280 + fVar87 +
                       fVar280 * fVar280 *
                       (fVar215 +
                       ((((fVar280 * 0.00019875691 + 0.0013981999) * fVar280 + 0.008333452) *
                         fVar280 + 0.041665796) * fVar280 + 0.16666666) * fVar280)) * auVar240._4_4_
                       + fVar87;
                  auVar165._8_4_ =
                       (fVar281 + fVar116 +
                       fVar281 * fVar281 *
                       (fVar216 +
                       ((((fVar281 * 0.00019875691 + 0.0013981999) * fVar281 + 0.008333452) *
                         fVar281 + 0.041665796) * fVar281 + 0.16666666) * fVar281)) * auVar240._8_4_
                       + fVar116;
                  auVar165._12_4_ =
                       (fVar282 + fVar117 +
                       fVar282 * fVar282 *
                       (fVar217 +
                       ((((fVar282 * 0.00019875691 + 0.0013981999) * fVar282 + 0.008333452) *
                         fVar282 + 0.041665796) * fVar282 + 0.16666666) * fVar282)) *
                       auVar240._12_4_ + fVar117;
                  auVar165._16_4_ =
                       (fVar283 + fVar223 +
                       fVar283 * fVar283 *
                       (fVar218 +
                       ((((fVar283 * 0.00019875691 + 0.0013981999) * fVar283 + 0.008333452) *
                         fVar283 + 0.041665796) * fVar283 + 0.16666666) * fVar283)) * auVar168._0_4_
                       + fVar223;
                  auVar165._20_4_ =
                       (fVar311 + fVar118 +
                       fVar311 * fVar311 *
                       (fVar219 +
                       ((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 + 0.008333452) *
                         fVar311 + 0.041665796) * fVar311 + 0.16666666) * fVar311)) * auVar168._4_4_
                       + fVar118;
                  auVar165._24_4_ =
                       (fVar327 + fVar220 +
                       fVar327 * fVar327 *
                       (fVar221 +
                       ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                         fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327)) * auVar168._8_4_
                       + fVar220;
                  auVar165._28_4_ =
                       auVar158._28_4_ + auVar80._28_4_ + fVar222 + fVar296 + -0.47508308 + fVar222;
                  auVar237 = vrcpps_avx(auVar165);
                  in_ZMM7 = ZEXT3264(auVar237);
                  fVar74 = auVar237._0_4_;
                  fVar87 = auVar237._4_4_;
                  auVar44._4_4_ = auVar165._4_4_ * fVar87;
                  auVar44._0_4_ = auVar165._0_4_ * fVar74;
                  fVar116 = auVar237._8_4_;
                  auVar44._8_4_ = auVar165._8_4_ * fVar116;
                  fVar117 = auVar237._12_4_;
                  auVar44._12_4_ = auVar165._12_4_ * fVar117;
                  fVar223 = auVar237._16_4_;
                  auVar44._16_4_ = auVar165._16_4_ * fVar223;
                  fVar118 = auVar237._20_4_;
                  auVar44._20_4_ = auVar165._20_4_ * fVar118;
                  fVar220 = auVar237._24_4_;
                  auVar44._24_4_ = auVar165._24_4_ * fVar220;
                  auVar44._28_4_ = auVar165._28_4_;
                  auVar302 = vsubps_avx(auVar302,auVar44);
                  auVar306._0_4_ = fVar74 + fVar74 * auVar302._0_4_;
                  auVar306._4_4_ = fVar87 + fVar87 * auVar302._4_4_;
                  auVar306._8_4_ = fVar116 + fVar116 * auVar302._8_4_;
                  auVar306._12_4_ = fVar117 + fVar117 * auVar302._12_4_;
                  auVar306._16_4_ = fVar223 + fVar223 * auVar302._16_4_;
                  auVar306._20_4_ = fVar118 + fVar118 * auVar302._20_4_;
                  auVar306._24_4_ = fVar220 + fVar220 * auVar302._24_4_;
                  auVar306._28_4_ = auVar237._28_4_ + auVar302._28_4_;
                  break;
                case 5:
                  auVar237 = vminps_avx(auVar306,auVar290);
                  auVar80 = vmaxps_avx(auVar293,auVar237);
                  auVar275._0_4_ = fVar167 + auVar80._0_4_ * 1.442695;
                  auVar275._4_4_ = fVar215 + auVar80._4_4_ * 1.442695;
                  auVar275._8_4_ = fVar216 + auVar80._8_4_ * 1.442695;
                  auVar275._12_4_ = fVar217 + auVar80._12_4_ * 1.442695;
                  auVar275._16_4_ = fVar218 + auVar80._16_4_ * 1.442695;
                  auVar275._20_4_ = fVar219 + auVar80._20_4_ * 1.442695;
                  auVar275._24_4_ = fVar221 + auVar80._24_4_ * 1.442695;
                  auVar275._28_4_ = fVar296 + in_ZMM7._28_4_;
                  auVar158 = vroundps_avx(auVar275,1);
                  auVar237 = vcmpps_avx(auVar275,auVar158,1);
                  auVar237 = vandps_avx(auVar237,auVar302);
                  auVar237 = vsubps_avx(auVar158,auVar237);
                  auVar40._4_4_ = auVar237._4_4_ * 0.6931472;
                  auVar40._0_4_ = auVar237._0_4_ * 0.6931472;
                  auVar40._8_4_ = auVar237._8_4_ * 0.6931472;
                  auVar40._12_4_ = auVar237._12_4_ * 0.6931472;
                  auVar40._16_4_ = auVar237._16_4_ * 0.6931472;
                  auVar40._20_4_ = auVar237._20_4_ * 0.6931472;
                  auVar40._24_4_ = auVar237._24_4_ * 0.6931472;
                  auVar40._28_4_ = auVar158._28_4_;
                  auVar80 = vsubps_avx(auVar80,auVar40);
                  fVar311 = auVar80._0_4_;
                  fVar327 = auVar80._4_4_;
                  fVar328 = auVar80._8_4_;
                  fVar329 = auVar80._12_4_;
                  fVar330 = auVar80._16_4_;
                  fVar331 = auVar80._20_4_;
                  fVar332 = auVar80._24_4_;
                  auVar180._0_4_ = (int)auVar237._0_4_;
                  auVar180._4_4_ = (int)auVar237._4_4_;
                  auVar180._8_4_ = (int)auVar237._8_4_;
                  auVar180._12_4_ = (int)auVar237._12_4_;
                  auVar210._16_4_ = (int)auVar237._16_4_;
                  auVar210._0_16_ = auVar180;
                  auVar210._20_4_ = (int)auVar237._20_4_;
                  auVar210._24_4_ = (int)auVar237._24_4_;
                  auVar210._28_4_ = (int)auVar237._28_4_;
                  auVar240 = vpslld_avx(auVar180,0x17);
                  auVar168 = vpslld_avx(auVar210._16_16_,0x17);
                  auVar234._8_4_ = 0x3f800000;
                  auVar234._0_8_ = 0x3f8000003f800000;
                  auVar234._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar234);
                  auVar240 = vpaddd_avx(auVar240,auVar234);
                  auVar276._0_4_ =
                       (fVar311 + fVar74 +
                       fVar311 * fVar311 *
                       (((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 + 0.008333452) *
                          fVar311 + 0.041665796) * fVar311 + 0.16666666) * fVar311 + fVar167)) *
                       auVar240._0_4_ + fVar74;
                  auVar276._4_4_ =
                       (fVar327 + fVar87 +
                       fVar327 * fVar327 *
                       (((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 + 0.008333452) *
                          fVar327 + 0.041665796) * fVar327 + 0.16666666) * fVar327 + fVar215)) *
                       auVar240._4_4_ + fVar87;
                  auVar276._8_4_ =
                       (fVar328 + fVar116 +
                       fVar328 * fVar328 *
                       (((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 + 0.008333452) *
                          fVar328 + 0.041665796) * fVar328 + 0.16666666) * fVar328 + fVar216)) *
                       auVar240._8_4_ + fVar116;
                  auVar276._12_4_ =
                       (fVar329 + fVar117 +
                       fVar329 * fVar329 *
                       (((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 + 0.008333452) *
                          fVar329 + 0.041665796) * fVar329 + 0.16666666) * fVar329 + fVar217)) *
                       auVar240._12_4_ + fVar117;
                  auVar276._16_4_ =
                       (fVar330 + fVar223 +
                       fVar330 * fVar330 *
                       (((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 + 0.008333452) *
                          fVar330 + 0.041665796) * fVar330 + 0.16666666) * fVar330 + fVar218)) *
                       auVar168._0_4_ + fVar223;
                  auVar276._20_4_ =
                       (fVar331 + fVar118 +
                       fVar331 * fVar331 *
                       (((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 + 0.008333452) *
                          fVar331 + 0.041665796) * fVar331 + 0.16666666) * fVar331 + fVar219)) *
                       auVar168._4_4_ + fVar118;
                  auVar276._24_4_ =
                       (fVar332 + fVar220 +
                       fVar332 * fVar332 *
                       (((((fVar332 * 0.00019875691 + 0.0013981999) * fVar332 + 0.008333452) *
                          fVar332 + 0.041665796) * fVar332 + 0.16666666) * fVar332 + fVar221)) *
                       auVar168._8_4_ + fVar220;
                  auVar276._28_4_ =
                       auVar80._28_4_ + fVar222 +
                       in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 +
                       fVar296 + fVar222;
                  auVar84._8_4_ = 0x800000;
                  auVar84._0_8_ = 0x80000000800000;
                  auVar84._12_4_ = 0x800000;
                  auVar84._16_4_ = 0x800000;
                  auVar84._20_4_ = 0x800000;
                  auVar84._24_4_ = 0x800000;
                  auVar84._28_4_ = 0x800000;
                  auVar158 = vmaxps_avx(auVar276,auVar84);
                  auVar168 = vpsrld_avx(auVar158._16_16_,0x17);
                  auVar85._8_4_ = 0x807fffff;
                  auVar85._0_8_ = 0x807fffff807fffff;
                  auVar85._12_4_ = 0x807fffff;
                  auVar85._16_4_ = 0x807fffff;
                  auVar85._20_4_ = 0x807fffff;
                  auVar85._24_4_ = 0x807fffff;
                  auVar85._28_4_ = 0x807fffff;
                  auVar237 = vandps_avx(auVar158,auVar85);
                  auVar204 = vorps_avx(auVar237,auVar295._0_32_);
                  auVar86._8_4_ = 0x3f3504f3;
                  auVar86._0_8_ = 0x3f3504f33f3504f3;
                  auVar86._12_4_ = 0x3f3504f3;
                  auVar86._16_4_ = 0x3f3504f3;
                  auVar86._20_4_ = 0x3f3504f3;
                  auVar86._24_4_ = 0x3f3504f3;
                  auVar86._28_4_ = 0x3f3504f3;
                  auVar80 = vcmpps_avx(auVar86,auVar204,2);
                  auVar237 = vandnps_avx(auVar80,auVar204);
                  fVar311 = auVar204._0_4_ + -1.0 + auVar237._0_4_;
                  fVar327 = auVar204._4_4_ + -1.0 + auVar237._4_4_;
                  fVar328 = auVar204._8_4_ + -1.0 + auVar237._8_4_;
                  fVar329 = auVar204._12_4_ + -1.0 + auVar237._12_4_;
                  fVar330 = auVar204._16_4_ + -1.0 + auVar237._16_4_;
                  fVar331 = auVar204._20_4_ + -1.0 + auVar237._20_4_;
                  fVar332 = auVar204._24_4_ + -1.0 + auVar237._24_4_;
                  auVar168 = vpsubd_avx(auVar168,auVar80._16_16_);
                  auVar240 = vpsrld_avx(auVar158._0_16_,0x17);
                  auVar77._8_4_ = 0xffffff81;
                  auVar77._0_8_ = 0xffffff81ffffff81;
                  auVar77._12_4_ = 0xffffff81;
                  auVar168 = vpaddd_avx(auVar168,auVar77);
                  auVar240 = vpsubd_avx(auVar240,auVar80._0_16_);
                  auVar240 = vpaddd_avx(auVar240,auVar77);
                  auVar163._16_16_ = auVar168;
                  auVar163._0_16_ = auVar240;
                  auVar238 = ZEXT864(0) << 0x20;
                  auVar80 = vcmpps_avx(auVar276,ZEXT832(0) << 0x20,2);
                  auVar158 = vcvtdq2ps_avx(auVar163);
                  auVar41._4_4_ =
                       (fVar327 + auVar158._4_4_ * 0.6931472 +
                       fVar327 * fVar327 *
                       (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * (fVar327 * 
                                                  (fVar327 * (fVar327 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar41._0_4_ =
                       (fVar311 + auVar158._0_4_ * 0.6931472 +
                       fVar311 * fVar311 *
                       (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * (fVar311 * 
                                                  (fVar311 * (fVar311 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar41._8_4_ =
                       (fVar328 + auVar158._8_4_ * 0.6931472 +
                       fVar328 * fVar328 *
                       (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * (fVar328 * 
                                                  (fVar328 * (fVar328 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar41._12_4_ =
                       (fVar329 + auVar158._12_4_ * 0.6931472 +
                       fVar329 * fVar329 *
                       (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * (fVar329 * 
                                                  (fVar329 * (fVar329 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar41._16_4_ =
                       (fVar330 + auVar158._16_4_ * 0.6931472 +
                       fVar330 * fVar330 *
                       (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * (fVar330 * 
                                                  (fVar330 * (fVar330 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar41._20_4_ =
                       (fVar331 + auVar158._20_4_ * 0.6931472 +
                       fVar331 * fVar331 *
                       (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * (fVar331 * 
                                                  (fVar331 * (fVar331 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar41._24_4_ =
                       (fVar332 + auVar158._24_4_ * 0.6931472 +
                       fVar332 * fVar332 *
                       (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * (fVar332 * 
                                                  (fVar332 * (fVar332 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                  0.3333333) + -0.5)) * -2.0;
                  auVar41._28_4_ = auVar204._28_4_ + -1.0 + auVar237._28_4_ + auVar158._28_4_ + 0.0;
                  auVar211._8_4_ = 0x7fffffff;
                  auVar211._0_8_ = 0x7fffffff7fffffff;
                  auVar211._12_4_ = 0x7fffffff;
                  auVar211._16_4_ = 0x7fffffff;
                  auVar211._20_4_ = 0x7fffffff;
                  auVar211._24_4_ = 0x7fffffff;
                  auVar211._28_4_ = 0x7fffffff;
                  auVar237 = vblendvps_avx(auVar41,auVar211,auVar80);
                  auVar237 = vminps_avx(auVar290,auVar237);
                  auVar80 = vmaxps_avx(auVar293,auVar237);
                  auVar212._0_4_ = auVar80._0_4_ * 1.442695 + fVar167;
                  auVar212._4_4_ = auVar80._4_4_ * 1.442695 + fVar215;
                  auVar212._8_4_ = auVar80._8_4_ * 1.442695 + fVar216;
                  auVar212._12_4_ = auVar80._12_4_ * 1.442695 + fVar217;
                  auVar212._16_4_ = auVar80._16_4_ * 1.442695 + fVar218;
                  auVar212._20_4_ = auVar80._20_4_ * 1.442695 + fVar219;
                  auVar212._24_4_ = auVar80._24_4_ * 1.442695 + fVar221;
                  auVar212._28_4_ = fVar296 + NAN;
                  auVar158 = vroundps_avx(auVar212,1);
                  auVar237 = vcmpps_avx(auVar212,auVar158,1);
                  auVar237 = vandps_avx(auVar237,auVar302);
                  auVar237 = vsubps_avx(auVar158,auVar237);
                  auVar42._4_4_ = auVar237._4_4_ * 0.6931472;
                  auVar42._0_4_ = auVar237._0_4_ * 0.6931472;
                  auVar42._8_4_ = auVar237._8_4_ * 0.6931472;
                  auVar42._12_4_ = auVar237._12_4_ * 0.6931472;
                  auVar42._16_4_ = auVar237._16_4_ * 0.6931472;
                  auVar42._20_4_ = auVar237._20_4_ * 0.6931472;
                  auVar42._24_4_ = auVar237._24_4_ * 0.6931472;
                  auVar42._28_4_ = auVar158._28_4_;
                  auVar80 = vsubps_avx(auVar80,auVar42);
                  fVar311 = auVar80._0_4_;
                  fVar327 = auVar80._4_4_;
                  fVar328 = auVar80._8_4_;
                  fVar329 = auVar80._12_4_;
                  fVar330 = auVar80._16_4_;
                  fVar331 = auVar80._20_4_;
                  fVar332 = auVar80._24_4_;
                  auVar294 = ZEXT3264(auVar302);
                  auVar295 = ZEXT3264(auVar295._0_32_);
                  fVar167 = fVar167 + ((((fVar311 * 0.00019875691 + 0.0013981999) * fVar311 +
                                        0.008333452) * fVar311 + 0.041665796) * fVar311 + 0.16666666
                                      ) * fVar311;
                  fVar215 = fVar215 + ((((fVar327 * 0.00019875691 + 0.0013981999) * fVar327 +
                                        0.008333452) * fVar327 + 0.041665796) * fVar327 + 0.16666666
                                      ) * fVar327;
                  fVar216 = fVar216 + ((((fVar328 * 0.00019875691 + 0.0013981999) * fVar328 +
                                        0.008333452) * fVar328 + 0.041665796) * fVar328 + 0.16666666
                                      ) * fVar328;
                  fVar217 = fVar217 + ((((fVar329 * 0.00019875691 + 0.0013981999) * fVar329 +
                                        0.008333452) * fVar329 + 0.041665796) * fVar329 + 0.16666666
                                      ) * fVar329;
                  fVar218 = fVar218 + ((((fVar330 * 0.00019875691 + 0.0013981999) * fVar330 +
                                        0.008333452) * fVar330 + 0.041665796) * fVar330 + 0.16666666
                                      ) * fVar330;
                  fVar219 = fVar219 + ((((fVar331 * 0.00019875691 + 0.0013981999) * fVar331 +
                                        0.008333452) * fVar331 + 0.041665796) * fVar331 + 0.16666666
                                      ) * fVar331;
                  fVar221 = fVar221 + ((((fVar332 * 0.00019875691 + 0.0013981999) * fVar332 +
                                        0.008333452) * fVar332 + 0.041665796) * fVar332 + 0.16666666
                                      ) * fVar332;
                  in_ZMM7 = ZEXT3264(CONCAT428(fVar296 + auVar276._28_4_ + 0.0013981999 +
                                                         0.008333452 + 0.041665796 + 0.16666666,
                                               CONCAT424(fVar221,CONCAT420(fVar219,CONCAT416(fVar218
                                                  ,CONCAT412(fVar217,CONCAT48(fVar216,CONCAT44(
                                                  fVar215,fVar167))))))));
                  auVar181._0_4_ = (int)auVar237._0_4_;
                  auVar181._4_4_ = (int)auVar237._4_4_;
                  auVar181._8_4_ = (int)auVar237._8_4_;
                  auVar181._12_4_ = (int)auVar237._12_4_;
                  auVar213._16_4_ = (int)auVar237._16_4_;
                  auVar213._0_16_ = auVar181;
                  auVar213._20_4_ = (int)auVar237._20_4_;
                  auVar213._24_4_ = (int)auVar237._24_4_;
                  auVar213._28_4_ = (int)auVar237._28_4_;
                  auVar240 = vpslld_avx(auVar181,0x17);
                  auVar168 = vpslld_avx(auVar213._16_16_,0x17);
                  auVar94._8_4_ = 0x3f800000;
                  auVar94._0_8_ = 0x3f8000003f800000;
                  auVar94._12_4_ = 0x3f800000;
                  auVar168 = vpaddd_avx(auVar168,auVar94);
                  auVar240 = vpaddd_avx(auVar240,auVar94);
                  auVar164._0_4_ =
                       (fVar311 + fVar74 + fVar311 * fVar311 * fVar167) * auVar240._0_4_ + fVar74;
                  auVar164._4_4_ =
                       (fVar327 + fVar87 + fVar327 * fVar327 * fVar215) * auVar240._4_4_ + fVar87;
                  auVar164._8_4_ =
                       (fVar328 + fVar116 + fVar328 * fVar328 * fVar216) * auVar240._8_4_ + fVar116;
                  auVar164._12_4_ =
                       (fVar329 + fVar117 + fVar329 * fVar329 * fVar217) * auVar240._12_4_ + fVar117
                  ;
                  auVar164._16_4_ =
                       (fVar330 + fVar223 + fVar330 * fVar330 * fVar218) * auVar168._0_4_ + fVar223;
                  auVar164._20_4_ =
                       (fVar331 + fVar118 + fVar331 * fVar331 * fVar219) * auVar168._4_4_ + fVar118;
                  auVar164._24_4_ =
                       (fVar332 + fVar220 + fVar332 * fVar332 * fVar221) * auVar168._8_4_ + fVar220;
                  auVar164._28_4_ = auVar80._28_4_ + fVar222 + auVar158._28_4_ + fVar222;
                  auVar302 = vrcpps_avx(auVar164);
                  fVar74 = auVar302._0_4_;
                  fVar87 = auVar302._4_4_;
                  fVar116 = auVar302._8_4_;
                  fVar117 = auVar302._12_4_;
                  fVar223 = auVar302._16_4_;
                  fVar118 = auVar302._20_4_;
                  fVar220 = auVar302._24_4_;
                  auVar43._4_4_ = auVar164._4_4_ * (fVar87 + fVar87);
                  auVar43._0_4_ = auVar164._0_4_ * (fVar74 + fVar74);
                  auVar43._8_4_ = auVar164._8_4_ * (fVar116 + fVar116);
                  auVar43._12_4_ = auVar164._12_4_ * (fVar117 + fVar117);
                  auVar43._16_4_ = auVar164._16_4_ * (fVar223 + fVar223);
                  auVar43._20_4_ = auVar164._20_4_ * (fVar118 + fVar118);
                  auVar43._24_4_ = auVar164._24_4_ * (fVar220 + fVar220);
                  auVar43._28_4_ = auVar164._28_4_;
                  auVar113._8_4_ = 0x40000000;
                  auVar113._0_8_ = 0x4000000040000000;
                  auVar113._12_4_ = 0x40000000;
                  auVar113._16_4_ = 0x40000000;
                  auVar113._20_4_ = 0x40000000;
                  auVar113._24_4_ = 0x40000000;
                  auVar113._28_4_ = 0x40000000;
                  auVar237 = vsubps_avx(auVar113,auVar43);
                  auVar214._0_4_ = fVar74 + fVar74 + -1.0;
                  auVar214._4_4_ = fVar87 + fVar87 + -1.0;
                  auVar214._8_4_ = fVar116 + fVar116 + -1.0;
                  auVar214._12_4_ = fVar117 + fVar117 + -1.0;
                  auVar214._16_4_ = fVar223 + fVar223 + -1.0;
                  auVar214._20_4_ = fVar118 + fVar118 + -1.0;
                  auVar214._24_4_ = fVar220 + fVar220 + -1.0;
                  auVar214._28_4_ = auVar302._28_4_ + auVar302._28_4_ + -1.0;
                  auVar151._0_4_ = auVar214._0_4_ + fVar74 * auVar237._0_4_;
                  auVar151._4_4_ = auVar214._4_4_ + fVar87 * auVar237._4_4_;
                  auVar151._8_4_ = auVar214._8_4_ + fVar116 * auVar237._8_4_;
                  auVar151._12_4_ = auVar214._12_4_ + fVar117 * auVar237._12_4_;
                  auVar151._16_4_ = auVar214._16_4_ + fVar223 * auVar237._16_4_;
                  auVar151._20_4_ = auVar214._20_4_ + fVar118 * auVar237._20_4_;
                  auVar151._24_4_ = auVar214._24_4_ + fVar220 * auVar237._24_4_;
                  goto LAB_002aac2d;
                case 6:
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  fVar87 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar214._4_4_ = fVar87;
                  auVar214._0_4_ = fVar87;
                  auVar214._8_4_ = fVar87;
                  auVar214._12_4_ = fVar87;
                  auVar214._16_4_ = fVar87;
                  auVar214._20_4_ = fVar87;
                  auVar214._24_4_ = fVar87;
                  auVar214._28_4_ = fVar87;
                  auVar166._0_4_ = auVar307._0_4_ * fVar74 + fVar87;
                  auVar166._4_4_ = auVar307._4_4_ * fVar74 + fVar87;
                  auVar166._8_4_ = fVar239 * fVar74 + fVar87;
                  auVar166._12_4_ = fVar280 * fVar74 + fVar87;
                  auVar166._16_4_ = fVar281 * fVar74 + fVar87;
                  auVar166._20_4_ = fVar282 * fVar74 + fVar87;
                  auVar166._24_4_ = fVar283 * fVar74 + fVar87;
                  auVar166._28_4_ = fVar74 + fVar87;
                  auVar237 = vmaxps_avx(auVar166,auVar238._0_32_);
                  auVar302 = vminps_avx(auVar237,auVar302);
                  auVar151 = auVar302._0_28_;
LAB_002aac2d:
                  in_ZMM3 = ZEXT3264(auVar214);
                  auVar310._0_4_ = auVar307._0_4_ * auVar151._0_4_;
                  auVar310._4_4_ = auVar307._4_4_ * auVar151._4_4_;
                  auVar310._8_4_ = fVar239 * auVar151._8_4_;
                  auVar310._12_4_ = fVar280 * auVar151._12_4_;
                  auVar310._16_4_ = fVar281 * auVar151._16_4_;
                  auVar310._20_4_ = fVar282 * auVar151._20_4_;
                  auVar310._24_4_ = fVar283 * auVar151._24_4_;
                  auVar306 = auVar310._0_32_;
                }
                *(undefined1 (*) [32])ppp_Var60 = auVar306;
                ppp_Var60 = ppp_Var60 + 4;
                uVar68 = uVar68 + 1;
                iVar50 = iVar50 + 1;
              } while (uVar68 != local_a8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar16 == 8) && (local_13c == 1)) {
      lVar65 = (long)local_a8.c;
      if (0 < lVar65) {
        p_Var54 = pp_Var64[-3];
        iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
        iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
        iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
        iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
        uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
        lVar53 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
        uVar16 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
        uVar19 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
        local_60 = local_a8.elemsize * local_a8.cstep;
        local_58 = (Allocator *)local_a8.data;
        iVar58 = bottom_blob->w;
        iVar70 = bottom_blob->h;
        uVar20 = bottom_blob->c;
        local_150 = 0;
        do {
          if (0 < iVar15) {
            sVar25 = (this->weight_data_tm).cstep;
            sVar26 = (this->weight_data_tm).elemsize;
            local_128 = (_func_int ***)((long)&local_58->_vptr_Allocator + local_60 * local_150);
            pvVar73 = (this->weight_data_tm).data;
            iVar55 = 0;
            do {
              if (0 < iVar14) {
                iVar46 = bottom_blob->w;
                pvVar24 = bottom_blob->data;
                sVar27 = bottom_blob->elemsize;
                sVar28 = bottom_blob->cstep;
                pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var54);
                uVar56 = 0;
                iVar50 = (1 - uVar16) * iVar69;
                do {
                  if (lVar53 == 0) {
                    fVar74 = 0.0;
                  }
                  else {
                    fVar74 = *(float *)(lVar53 + local_150 * 4);
                  }
                  if ((int)uVar20 < 1) {
                    fVar87 = 0.0;
                    fVar116 = 0.0;
                    fVar117 = 0.0;
                    fVar223 = 0.0;
                    fVar118 = 0.0;
                    fVar220 = 0.0;
                    fVar222 = 0.0;
                    fVar167 = 0.0;
                  }
                  else {
                    fVar87 = 0.0;
                    fVar116 = 0.0;
                    fVar117 = 0.0;
                    fVar223 = 0.0;
                    fVar118 = 0.0;
                    fVar220 = 0.0;
                    fVar222 = 0.0;
                    fVar167 = 0.0;
                    uVar59 = 0;
                    pvVar66 = (void *)(sVar25 * local_150 * sVar26 + (long)pvVar73);
                    do {
                      if (0 < (int)uVar19) {
                        uVar63 = 0;
                        uVar61 = 0;
                        do {
                          iVar47 = (((int)uVar61 - uVar19) + 1) * iVar17 + iVar55;
                          if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar18, iVar47 % iVar18 == 0))
                              && (0 < (int)uVar16)) && (iVar48 < iVar70)) {
                            uVar67 = (ulong)uVar16;
                            uVar71 = uVar63;
                            iVar47 = iVar50;
                            do {
                              if (((-1 < iVar47) && (iVar49 = iVar47 / iVar72, iVar47 % iVar72 == 0)
                                  ) && (iVar49 < iVar58)) {
                                pfVar2 = (float *)((long)pvVar66 + (uVar71 & 0xffffffff) * 4);
                                pfVar3 = (float *)((long)pvVar24 +
                                                  (long)(iVar49 << 3) * 4 +
                                                  (long)iVar48 * (long)iVar46 * sVar27 +
                                                  sVar28 * sVar27 * uVar59);
                                fVar87 = *pfVar2 * *pfVar3 + fVar87;
                                fVar116 = pfVar2[1] * pfVar3[1] + fVar116;
                                fVar117 = pfVar2[2] * pfVar3[2] + fVar117;
                                fVar223 = pfVar2[3] * pfVar3[3] + fVar223;
                                fVar118 = pfVar2[4] * pfVar3[4] + fVar118;
                                fVar220 = pfVar2[5] * pfVar3[5] + fVar220;
                                fVar222 = pfVar2[6] * pfVar3[6] + fVar222;
                                fVar167 = pfVar2[7] + fVar167;
                              }
                              uVar71 = uVar71 + 8;
                              iVar47 = iVar47 + iVar69;
                              uVar67 = uVar67 - 1;
                            } while (uVar67 != 0);
                          }
                          uVar61 = uVar61 + 1;
                          uVar63 = uVar63 + (ulong)uVar16 * 8;
                        } while (uVar61 != uVar19);
                      }
                      pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar16 * uVar19 * 8) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar20);
                  }
                  auVar96._0_4_ = fVar118 + fVar87;
                  auVar96._4_4_ = fVar220 + fVar116;
                  auVar96._8_4_ = fVar222 + fVar117;
                  auVar96._12_4_ = fVar167 + fVar223;
                  auVar168 = vshufpd_avx(auVar96,auVar96,1);
                  auVar97._0_4_ = auVar168._0_4_ + auVar96._0_4_;
                  auVar97._4_4_ = auVar168._4_4_ + auVar96._4_4_;
                  auVar97._8_4_ = auVar168._8_4_ + auVar96._8_4_;
                  auVar97._12_4_ = auVar168._12_4_ + auVar96._12_4_;
                  auVar168 = vmovshdup_avx(auVar97);
                  fVar74 = auVar168._0_4_ + fVar74 + auVar97._0_4_;
                  auVar168 = ZEXT416((uint)fVar74);
                  fVar87 = fVar74;
                  switch(uVar21) {
                  case 1:
                    auVar168 = vmaxss_avx(ZEXT416((uint)fVar74),ZEXT416(0));
                    fVar87 = auVar168._0_4_;
                    break;
                  case 2:
                    auVar78._0_12_ = ZEXT812(0);
                    auVar78._12_4_ = 0;
                    auVar168 = vcmpss_avx(auVar78,auVar168,1);
                    auVar128._8_4_ = 0x3f800000;
                    auVar128._0_8_ = 0x3f8000003f800000;
                    auVar128._12_4_ = 0x3f800000;
                    auVar168 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar128,auVar168);
                    fVar87 = auVar168._0_4_;
LAB_002ab0b0:
                    fVar87 = fVar87 * fVar74;
                    break;
                  case 3:
                    auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar1));
                    fVar87 = auVar168._0_4_;
                    if (pfVar1[1] < auVar168._0_4_) {
                      fVar87 = pfVar1[1];
                    }
                    break;
                  case 4:
                    auVar168 = vminss_avx(auVar168,ZEXT416(0x42b0c0a5));
                    auVar98._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                    auVar98._8_4_ = auVar168._8_4_ ^ 0x80000000;
                    auVar98._12_4_ = auVar168._12_4_ ^ 0x80000000;
                    auVar168 = vcmpss_avx(auVar168,ZEXT416(0xc2b0c0a5),1);
                    auVar127._8_4_ = 0x42b0c0a5;
                    auVar127._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar127._12_4_ = 0x42b0c0a5;
                    auVar168 = vblendvps_avx(auVar98,auVar127,auVar168);
                    fVar74 = expf(auVar168._0_4_);
                    fVar87 = 1.0 / (fVar74 + 1.0);
                    break;
                  case 5:
                    fVar87 = expf(fVar74);
                    fVar87 = logf(fVar87 + 1.0);
                    fVar87 = tanhf(fVar87);
                    fVar87 = fVar87 * fVar74;
                    break;
                  case 6:
                    fVar116 = *pfVar1;
                    fVar117 = -pfVar1[1] / fVar116;
                    fVar87 = 0.0;
                    if ((fVar117 <= fVar74) && (fVar87 = fVar74, fVar74 <= fVar117 + 1.0 / fVar116))
                    {
                      fVar87 = fVar116 * fVar74 + pfVar1[1];
                      goto LAB_002ab0b0;
                    }
                  }
                  *(float *)local_128 = fVar87;
                  local_128 = (_func_int ***)((long)local_128 + 4);
                  uVar56 = uVar56 + 1;
                  iVar50 = iVar50 + 1;
                } while (uVar56 != iVar14);
              }
              iVar55 = iVar55 + 1;
            } while (iVar55 != iVar15);
          }
          local_150 = local_150 + 1;
        } while (local_150 != lVar65);
      }
      goto LAB_002ab177;
    }
    local_50._0_4_ = local_13c ^ 4;
    if ((uVar16 == 4 && local_13c == 4) && (0 < (long)local_a8.c)) {
      p_Var54 = pp_Var64[-3];
      iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
      iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
      iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
      uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
      uVar56 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
      uVar62 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
      local_198 = 0;
      auVar235._8_4_ = 0x3f000000;
      auVar235._0_8_ = 0x3f0000003f000000;
      auVar235._12_4_ = 0x3f000000;
      auVar238 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_a8.h) {
          iVar58 = bottom_blob->w;
          iVar70 = bottom_blob->h;
          ppp_Var60 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar22 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_a8.w) {
              uVar68 = 0;
              iVar50 = (1 - uVar56) * iVar69;
              do {
                if (lVar65 == 0) {
                  auVar99 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar99 = *(undefined1 (*) [16])(lVar65 + local_198 * 0x10);
                }
                auVar294 = ZEXT1664(auVar99);
                if (0 < (int)uVar22) {
                  pvVar73 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar24 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      uVar63 = 0;
                      uVar61 = 0;
                      do {
                        iVar46 = (((int)uVar61 - uVar62) + 1) * iVar17 + iVar55;
                        if ((((-1 < iVar46) && (iVar47 = iVar46 / iVar18, iVar46 % iVar18 == 0)) &&
                            (0 < (int)uVar56)) && (iVar47 < iVar70)) {
                          lVar53 = (long)iVar47 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar67 = uVar63;
                          uVar71 = (ulong)uVar56;
                          iVar46 = iVar50;
                          do {
                            if (((-1 < iVar46) && (iVar47 = iVar46 / iVar72, iVar46 % iVar72 == 0))
                               && (iVar47 < iVar58)) {
                              lVar51 = (long)(iVar47 << 2);
                              fVar74 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53);
                              fVar87 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 4);
                              fVar116 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 8);
                              fVar117 = *(float *)((long)pvVar24 + lVar51 * 4 + lVar53 + 0xc);
                              uVar52 = uVar67 & 0xffffffff;
                              pfVar4 = (float *)((long)pvVar73 + uVar52 * 4);
                              pfVar1 = (float *)((long)pvVar73 + uVar52 * 4 + 0x10);
                              pfVar2 = (float *)((long)pvVar73 + uVar52 * 4 + 0x20);
                              pfVar3 = (float *)((long)pvVar73 + uVar52 * 4 + 0x30);
                              auVar294 = ZEXT1664(CONCAT412(fVar74 * pfVar4[3] + auVar294._12_4_ +
                                                            fVar87 * pfVar1[3] + fVar116 * pfVar2[3]
                                                            + fVar117 * pfVar3[3],
                                                            CONCAT48(fVar74 * pfVar4[2] +
                                                                     auVar294._8_4_ +
                                                                     fVar87 * pfVar1[2] +
                                                                     fVar116 * pfVar2[2] +
                                                                     fVar117 * pfVar3[2],
                                                                     CONCAT44(fVar74 * pfVar4[1] +
                                                                              auVar294._4_4_ +
                                                                              fVar87 * pfVar1[1] +
                                                                              fVar116 * pfVar2[1] +
                                                                              fVar117 * pfVar3[1],
                                                                              fVar74 * *pfVar4 +
                                                                              auVar294._0_4_ +
                                                                              fVar87 * *pfVar1 +
                                                                              fVar116 * *pfVar2 +
                                                                              fVar117 * *pfVar3))));
                            }
                            uVar67 = uVar67 + 0x10;
                            iVar46 = iVar46 + iVar69;
                            uVar71 = uVar71 - 1;
                          } while (uVar71 != 0);
                        }
                        uVar61 = uVar61 + 1;
                        uVar63 = uVar63 + (ulong)uVar56 * 0x10;
                      } while (uVar61 != uVar62);
                    }
                    auVar99 = auVar294._0_16_;
                    pvVar73 = (void *)((long)pvVar73 + (long)(int)(uVar56 * uVar62 * 0x10) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar22);
                }
                auVar168 = auVar238._0_16_;
                fVar74 = auVar238._0_4_;
                fVar87 = auVar238._4_4_;
                fVar116 = auVar238._8_4_;
                fVar117 = auVar238._12_4_;
                fVar223 = auVar99._4_4_;
                fVar118 = auVar99._8_4_;
                fVar220 = auVar99._12_4_;
                switch(uVar21) {
                case 1:
                  auVar99 = vmaxps_avx(auVar99,_DAT_00515090);
                  break;
                case 2:
                  auVar168 = vmaxps_avx(auVar99,ZEXT816(0) << 0x40);
                  auVar240 = vminps_avx(auVar99,ZEXT816(0) << 0x40);
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  auVar99._0_4_ = fVar74 * auVar240._0_4_ + auVar168._0_4_;
                  auVar99._4_4_ = fVar74 * auVar240._4_4_ + auVar168._4_4_;
                  auVar99._8_4_ = fVar74 * auVar240._8_4_ + auVar168._8_4_;
                  auVar99._12_4_ = fVar74 * auVar240._12_4_ + auVar168._12_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                  auVar255._4_4_ = uVar9;
                  auVar255._0_4_ = uVar9;
                  auVar255._8_4_ = uVar9;
                  auVar255._12_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar318._4_4_ = uVar9;
                  auVar318._0_4_ = uVar9;
                  auVar318._8_4_ = uVar9;
                  auVar318._12_4_ = uVar9;
                  auVar168 = vmaxps_avx(auVar99,auVar255);
                  auVar99 = vminps_avx(auVar318,auVar168);
                  break;
                case 4:
                  auVar100._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                  auVar100._8_4_ = -fVar118;
                  auVar100._12_4_ = -fVar220;
                  auVar134._8_4_ = 0x42b0c0a5;
                  auVar134._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar134._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar100,auVar134);
                  auVar135._8_4_ = 0xc2b0c0a5;
                  auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar135._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar240,auVar135);
                  auVar256._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar256._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar256._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar256._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar319._0_4_ = (int)auVar256._0_4_;
                  auVar319._4_4_ = (int)auVar256._4_4_;
                  auVar319._8_4_ = (int)auVar256._8_4_;
                  auVar319._12_4_ = (int)auVar256._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar319);
                  auVar240 = vcmpps_avx(auVar256,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  fVar223 = auVar240._0_4_ * -0.6931472 + auVar284._0_4_;
                  fVar118 = auVar240._4_4_ * -0.6931472 + auVar284._4_4_;
                  fVar220 = auVar240._8_4_ * -0.6931472 + auVar284._8_4_;
                  fVar222 = auVar240._12_4_ * -0.6931472 + auVar284._12_4_;
                  auVar257._0_4_ = (int)auVar240._0_4_;
                  auVar257._4_4_ = (int)auVar240._4_4_;
                  auVar257._8_4_ = (int)auVar240._8_4_;
                  auVar257._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar257,0x17);
                  auVar240 = vpaddd_avx(auVar240,auVar168);
                  auVar101._0_4_ =
                       (fVar223 * fVar223 *
                        (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) *
                           fVar223 + 0.041665796) * fVar223 + 0.16666666) * fVar223 + 0.5) +
                       fVar223 + fVar74) * auVar240._0_4_ + fVar74;
                  auVar101._4_4_ =
                       (fVar118 * fVar118 *
                        (((((fVar118 * 0.00019875691 + 0.0013981999) * fVar118 + 0.008333452) *
                           fVar118 + 0.041665796) * fVar118 + 0.16666666) * fVar118 + 0.5) +
                       fVar118 + fVar87) * auVar240._4_4_ + fVar87;
                  auVar101._8_4_ =
                       (fVar220 * fVar220 *
                        (((((fVar220 * 0.00019875691 + 0.0013981999) * fVar220 + 0.008333452) *
                           fVar220 + 0.041665796) * fVar220 + 0.16666666) * fVar220 + 0.5) +
                       fVar220 + fVar116) * auVar240._8_4_ + fVar116;
                  auVar101._12_4_ =
                       (fVar222 * fVar222 *
                        (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                           fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) +
                       fVar222 + fVar117) * auVar240._12_4_ + fVar117;
                  auVar240 = vrcpps_avx(auVar101);
                  fVar74 = auVar240._0_4_;
                  auVar102._0_4_ = auVar101._0_4_ * fVar74;
                  fVar87 = auVar240._4_4_;
                  auVar102._4_4_ = auVar101._4_4_ * fVar87;
                  fVar116 = auVar240._8_4_;
                  auVar102._8_4_ = auVar101._8_4_ * fVar116;
                  fVar117 = auVar240._12_4_;
                  auVar102._12_4_ = auVar101._12_4_ * fVar117;
                  auVar168 = vsubps_avx(auVar168,auVar102);
                  auVar99._0_4_ = fVar74 + fVar74 * auVar168._0_4_;
                  auVar99._4_4_ = fVar87 + fVar87 * auVar168._4_4_;
                  auVar99._8_4_ = fVar116 + fVar116 * auVar168._8_4_;
                  auVar99._12_4_ = fVar117 + fVar117 * auVar168._12_4_;
                  break;
                case 5:
                  auVar226._8_4_ = 0x42b0c0a5;
                  auVar226._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar226._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar99,auVar226);
                  auVar286._8_4_ = 0xc2b0c0a5;
                  auVar286._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar286._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar286,auVar240);
                  auVar299._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar299._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar299._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar299._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar316._0_4_ = (int)auVar299._0_4_;
                  auVar316._4_4_ = (int)auVar299._4_4_;
                  auVar316._8_4_ = (int)auVar299._8_4_;
                  auVar316._12_4_ = (int)auVar299._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar316);
                  auVar240 = vcmpps_avx(auVar299,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  auVar317._0_4_ = auVar240._0_4_ * 0.6931472;
                  auVar317._4_4_ = auVar240._4_4_ * 0.6931472;
                  auVar317._8_4_ = auVar240._8_4_ * 0.6931472;
                  auVar317._12_4_ = auVar240._12_4_ * 0.6931472;
                  auVar298 = vsubps_avx(auVar284,auVar317);
                  fVar222 = auVar298._0_4_;
                  fVar167 = auVar298._4_4_;
                  fVar215 = auVar298._8_4_;
                  fVar216 = auVar298._12_4_;
                  auVar251._0_4_ = (int)auVar240._0_4_;
                  auVar251._4_4_ = (int)auVar240._4_4_;
                  auVar251._8_4_ = (int)auVar240._8_4_;
                  auVar251._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar251,0x17);
                  auVar240 = vpaddd_avx(auVar240,auVar168);
                  auVar252._0_4_ =
                       (fVar222 + fVar74 +
                       fVar222 * fVar222 *
                       (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                          fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5)) *
                       auVar240._0_4_ + fVar74;
                  auVar252._4_4_ =
                       (fVar167 + fVar87 +
                       fVar167 * fVar167 *
                       (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                          fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) *
                       auVar240._4_4_ + fVar87;
                  auVar252._8_4_ =
                       (fVar215 + fVar116 +
                       fVar215 * fVar215 *
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) *
                       auVar240._8_4_ + fVar116;
                  auVar252._12_4_ =
                       (fVar216 + fVar117 +
                       fVar216 * fVar216 *
                       (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) *
                          fVar216 + 0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) *
                       auVar240._12_4_ + fVar117;
                  auVar129._8_4_ = 0x800000;
                  auVar129._0_8_ = 0x80000000800000;
                  auVar129._12_4_ = 0x800000;
                  auVar240 = vmaxps_avx(auVar252,auVar129);
                  auVar298 = vpsrld_avx(auVar240,0x17);
                  auVar182._8_4_ = 0xffffff82;
                  auVar182._0_8_ = 0xffffff82ffffff82;
                  auVar182._12_4_ = 0xffffff82;
                  auVar298 = vpaddd_avx(auVar298,auVar182);
                  auVar183._8_4_ = 0x807fffff;
                  auVar183._0_8_ = 0x807fffff807fffff;
                  auVar183._12_4_ = 0x807fffff;
                  auVar240 = vandps_avx(auVar240,auVar183);
                  auVar75 = vorps_avx(auVar240,auVar235);
                  auVar284 = vcvtdq2ps_avx(auVar298);
                  auVar184._8_4_ = 0x3f3504f3;
                  auVar184._0_8_ = 0x3f3504f33f3504f3;
                  auVar184._12_4_ = 0x3f3504f3;
                  auVar298 = vcmpps_avx(auVar75,auVar184,1);
                  auVar240 = vandps_avx(auVar298,auVar75);
                  fVar222 = auVar75._0_4_ + -1.0 + auVar240._0_4_;
                  fVar167 = auVar75._4_4_ + -1.0 + auVar240._4_4_;
                  fVar215 = auVar75._8_4_ + -1.0 + auVar240._8_4_;
                  fVar216 = auVar75._12_4_ + -1.0 + auVar240._12_4_;
                  auVar240 = vandps_avx(auVar298,auVar168);
                  auVar298 = vsubps_avx(auVar284,auVar240);
                  auVar240 = vcmpps_avx(auVar252,_DAT_00515090,2);
                  auVar130._0_4_ =
                       (fVar222 * fVar222 *
                        (((((((((fVar222 * 0.070376836 + -0.1151461) * fVar222 + 0.116769984) *
                               fVar222 + -0.12420141) * fVar222 + 0.14249323) * fVar222 +
                            -0.16668057) * fVar222 + 0.20000714) * fVar222 + -0.24999994) * fVar222
                         + 0.3333333) * fVar222 + -0.5) + auVar298._0_4_ * 0.6931472 + fVar222) *
                       -2.0;
                  auVar130._4_4_ =
                       (fVar167 * fVar167 *
                        (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                               fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                            -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) * fVar167
                         + 0.3333333) * fVar167 + -0.5) + auVar298._4_4_ * 0.6931472 + fVar167) *
                       -2.0;
                  auVar130._8_4_ =
                       (fVar215 * fVar215 *
                        (((((((((fVar215 * 0.070376836 + -0.1151461) * fVar215 + 0.116769984) *
                               fVar215 + -0.12420141) * fVar215 + 0.14249323) * fVar215 +
                            -0.16668057) * fVar215 + 0.20000714) * fVar215 + -0.24999994) * fVar215
                         + 0.3333333) * fVar215 + -0.5) + auVar298._8_4_ * 0.6931472 + fVar215) *
                       -2.0;
                  auVar130._12_4_ =
                       (fVar216 * fVar216 *
                        (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) *
                               fVar216 + -0.12420141) * fVar216 + 0.14249323) * fVar216 +
                            -0.16668057) * fVar216 + 0.20000714) * fVar216 + -0.24999994) * fVar216
                         + 0.3333333) * fVar216 + -0.5) + auVar298._12_4_ * 0.6931472 + fVar216) *
                       -2.0;
                  auVar185._8_4_ = 0x7fffffff;
                  auVar185._0_8_ = 0x7fffffff7fffffff;
                  auVar185._12_4_ = 0x7fffffff;
                  auVar240 = vblendvps_avx(auVar130,auVar185,auVar240);
                  auVar186._8_4_ = 0x42b0c0a5;
                  auVar186._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar186._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar240,auVar186);
                  auVar187._8_4_ = 0xc2b0c0a5;
                  auVar187._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar187._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar240,auVar187);
                  auVar188._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar188._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar188._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar188._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar253._0_4_ = (int)auVar188._0_4_;
                  auVar253._4_4_ = (int)auVar188._4_4_;
                  auVar253._8_4_ = (int)auVar188._8_4_;
                  auVar253._12_4_ = (int)auVar188._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar253);
                  auVar240 = vcmpps_avx(auVar188,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  auVar254._0_4_ = auVar240._0_4_ * 0.6931472;
                  auVar254._4_4_ = auVar240._4_4_ * 0.6931472;
                  auVar254._8_4_ = auVar240._8_4_ * 0.6931472;
                  auVar254._12_4_ = auVar240._12_4_ * 0.6931472;
                  auVar238 = ZEXT1664(auVar168);
                  auVar298 = vsubps_avx(auVar284,auVar254);
                  fVar222 = auVar298._0_4_;
                  fVar167 = auVar298._4_4_;
                  fVar215 = auVar298._8_4_;
                  fVar216 = auVar298._12_4_;
                  auVar189._0_4_ = (int)auVar240._0_4_;
                  auVar189._4_4_ = (int)auVar240._4_4_;
                  auVar189._8_4_ = (int)auVar240._8_4_;
                  auVar189._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar189,0x17);
                  auVar168 = vpaddd_avx(auVar240,auVar168);
                  auVar131._0_4_ =
                       (fVar222 + fVar74 +
                       (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                          fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) *
                       fVar222 * fVar222) * auVar168._0_4_ + fVar74;
                  auVar131._4_4_ =
                       (fVar167 + fVar87 +
                       (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                          fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) *
                       fVar167 * fVar167) * auVar168._4_4_ + fVar87;
                  auVar131._8_4_ =
                       (fVar215 + fVar116 +
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5) *
                       fVar215 * fVar215) * auVar168._8_4_ + fVar116;
                  auVar131._12_4_ =
                       (fVar216 + fVar117 +
                       (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) *
                          fVar216 + 0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5) *
                       fVar216 * fVar216) * auVar168._12_4_ + fVar117;
                  auVar168 = vrcpps_avx(auVar131);
                  fVar74 = auVar168._0_4_;
                  fVar87 = auVar168._4_4_;
                  fVar116 = auVar168._8_4_;
                  fVar117 = auVar168._12_4_;
                  auVar132._0_4_ = auVar131._0_4_ * (fVar74 + fVar74);
                  auVar132._4_4_ = auVar131._4_4_ * (fVar87 + fVar87);
                  auVar132._8_4_ = auVar131._8_4_ * (fVar116 + fVar116);
                  auVar132._12_4_ = auVar131._12_4_ * (fVar117 + fVar117);
                  auVar227._8_4_ = 0x40000000;
                  auVar227._0_8_ = 0x4000000040000000;
                  auVar227._12_4_ = 0x40000000;
                  auVar168 = vsubps_avx(auVar227,auVar132);
                  auVar133._0_4_ = fVar74 + fVar74 + -1.0 + fVar74 * auVar168._0_4_;
                  auVar133._4_4_ = fVar87 + fVar87 + -1.0 + fVar87 * auVar168._4_4_;
                  auVar133._8_4_ = fVar116 + fVar116 + -1.0 + fVar116 * auVar168._8_4_;
                  auVar133._12_4_ = fVar117 + fVar117 + -1.0 + fVar117 * auVar168._12_4_;
                  goto LAB_002ab9c8;
                case 6:
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  fVar87 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar136._0_4_ = fVar74 * auVar99._0_4_ + fVar87;
                  auVar136._4_4_ = fVar74 * fVar223 + fVar87;
                  auVar136._8_4_ = fVar74 * fVar118 + fVar87;
                  auVar136._12_4_ = fVar74 * fVar220 + fVar87;
                  auVar240 = vmaxps_avx(auVar136,_DAT_00515090);
                  auVar133 = vminps_avx(auVar240,auVar168);
LAB_002ab9c8:
                  auVar99._0_4_ = auVar133._0_4_ * auVar99._0_4_;
                  auVar99._4_4_ = auVar133._4_4_ * fVar223;
                  auVar99._8_4_ = auVar133._8_4_ * fVar118;
                  auVar99._12_4_ = auVar133._12_4_ * fVar220;
                }
                *(undefined1 (*) [16])ppp_Var60 = auVar99;
                ppp_Var60 = ppp_Var60 + 2;
                uVar68 = uVar68 + 1;
                iVar50 = iVar50 + 1;
              } while (uVar68 != local_a8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    local_50._0_4_ = (uint)local_50 | uVar16 ^ 1;
    if (((uint)local_50 == 0) && (0 < (long)local_a8.c)) {
      p_Var54 = pp_Var64[-3];
      iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
      iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
      iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
      uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
      uVar56 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
      uVar62 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
      local_198 = 0;
      auVar236._8_4_ = 0x3f000000;
      auVar236._0_8_ = 0x3f0000003f000000;
      auVar236._12_4_ = 0x3f000000;
      auVar238 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        if (0 < local_a8.h) {
          iVar58 = bottom_blob->w;
          iVar70 = bottom_blob->h;
          ppp_Var60 = (_func_int ***)
                      ((long)(_func_int ***)local_a8.data +
                      local_a8.cstep * local_198 * local_a8.elemsize);
          uVar22 = bottom_blob->c;
          iVar55 = 0;
          do {
            if (0 < local_a8.w) {
              uVar68 = 0;
              iVar50 = (1 - uVar56) * iVar69;
              do {
                if (lVar65 == 0) {
                  auVar103 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar103 = *(undefined1 (*) [16])(lVar65 + local_198 * 0x10);
                }
                auVar294 = ZEXT1664(auVar103);
                if (0 < (int)uVar22) {
                  pvVar73 = (void *)((this->weight_data_tm).cstep * local_198 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar62) {
                      uVar61 = 0;
                      uVar63 = 0;
                      do {
                        iVar46 = (((int)uVar63 - uVar62) + 1) * iVar17 + iVar55;
                        if ((((-1 < iVar46) && (iVar47 = iVar46 / iVar18, iVar46 % iVar18 == 0)) &&
                            (iVar47 < iVar70)) && (0 < (int)uVar56)) {
                          uVar67 = uVar61;
                          uVar71 = (ulong)uVar56;
                          iVar46 = iVar50;
                          do {
                            if (((-1 < iVar46) && (iVar48 = iVar46 / iVar72, iVar46 % iVar72 == 0))
                               && (iVar48 < iVar58)) {
                              fVar74 = *(float *)((long)bottom_blob->data +
                                                 (long)iVar48 * 4 +
                                                 (long)iVar47 *
                                                 (long)bottom_blob->w * bottom_blob->elemsize +
                                                 bottom_blob->cstep * bottom_blob->elemsize * uVar59
                                                 );
                              pfVar1 = (float *)((long)pvVar73 + (uVar67 & 0xffffffff) * 4);
                              auVar294 = ZEXT1664(CONCAT412(fVar74 * pfVar1[3] + auVar294._12_4_,
                                                            CONCAT48(fVar74 * pfVar1[2] +
                                                                     auVar294._8_4_,
                                                                     CONCAT44(fVar74 * pfVar1[1] +
                                                                              auVar294._4_4_,
                                                                              fVar74 * *pfVar1 +
                                                                              auVar294._0_4_))));
                            }
                            uVar67 = uVar67 + 4;
                            iVar46 = iVar46 + iVar69;
                            uVar71 = uVar71 - 1;
                          } while (uVar71 != 0);
                        }
                        uVar63 = uVar63 + 1;
                        uVar61 = uVar61 + (ulong)uVar56 * 4;
                      } while (uVar63 != uVar62);
                    }
                    auVar103 = auVar294._0_16_;
                    pvVar73 = (void *)((long)pvVar73 + (long)(int)(uVar56 * uVar62 * 4) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar22);
                }
                auVar168 = auVar238._0_16_;
                fVar74 = auVar238._0_4_;
                fVar87 = auVar238._4_4_;
                fVar116 = auVar238._8_4_;
                fVar117 = auVar238._12_4_;
                fVar223 = auVar103._4_4_;
                fVar118 = auVar103._8_4_;
                fVar220 = auVar103._12_4_;
                switch(uVar21) {
                case 1:
                  auVar103 = vmaxps_avx(auVar103,_DAT_00515090);
                  break;
                case 2:
                  auVar168 = vmaxps_avx(auVar103,ZEXT816(0) << 0x40);
                  auVar240 = vminps_avx(auVar103,ZEXT816(0) << 0x40);
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  auVar103._0_4_ = fVar74 * auVar240._0_4_ + auVar168._0_4_;
                  auVar103._4_4_ = fVar74 * auVar240._4_4_ + auVar168._4_4_;
                  auVar103._8_4_ = fVar74 * auVar240._8_4_ + auVar168._8_4_;
                  auVar103._12_4_ = fVar74 * auVar240._12_4_ + auVar168._12_4_;
                  break;
                case 3:
                  uVar9 = **(undefined4 **)(&this->field_0x118 + (long)p_Var54);
                  auVar262._4_4_ = uVar9;
                  auVar262._0_4_ = uVar9;
                  auVar262._8_4_ = uVar9;
                  auVar262._12_4_ = uVar9;
                  uVar9 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar322._4_4_ = uVar9;
                  auVar322._0_4_ = uVar9;
                  auVar322._8_4_ = uVar9;
                  auVar322._12_4_ = uVar9;
                  auVar168 = vmaxps_avx(auVar103,auVar262);
                  auVar103 = vminps_avx(auVar322,auVar168);
                  break;
                case 4:
                  auVar104._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
                  auVar104._8_4_ = -fVar118;
                  auVar104._12_4_ = -fVar220;
                  auVar142._8_4_ = 0x42b0c0a5;
                  auVar142._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar142._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar104,auVar142);
                  auVar143._8_4_ = 0xc2b0c0a5;
                  auVar143._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar143._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar240,auVar143);
                  auVar263._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar263._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar263._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar263._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar323._0_4_ = (int)auVar263._0_4_;
                  auVar323._4_4_ = (int)auVar263._4_4_;
                  auVar323._8_4_ = (int)auVar263._8_4_;
                  auVar323._12_4_ = (int)auVar263._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar323);
                  auVar240 = vcmpps_avx(auVar263,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  fVar223 = auVar240._0_4_ * -0.6931472 + auVar284._0_4_;
                  fVar118 = auVar240._4_4_ * -0.6931472 + auVar284._4_4_;
                  fVar220 = auVar240._8_4_ * -0.6931472 + auVar284._8_4_;
                  fVar222 = auVar240._12_4_ * -0.6931472 + auVar284._12_4_;
                  auVar264._0_4_ = (int)auVar240._0_4_;
                  auVar264._4_4_ = (int)auVar240._4_4_;
                  auVar264._8_4_ = (int)auVar240._8_4_;
                  auVar264._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar264,0x17);
                  auVar240 = vpaddd_avx(auVar240,auVar168);
                  auVar105._0_4_ =
                       (fVar223 * fVar223 *
                        (((((fVar223 * 0.00019875691 + 0.0013981999) * fVar223 + 0.008333452) *
                           fVar223 + 0.041665796) * fVar223 + 0.16666666) * fVar223 + 0.5) +
                       fVar223 + fVar74) * auVar240._0_4_ + fVar74;
                  auVar105._4_4_ =
                       (fVar118 * fVar118 *
                        (((((fVar118 * 0.00019875691 + 0.0013981999) * fVar118 + 0.008333452) *
                           fVar118 + 0.041665796) * fVar118 + 0.16666666) * fVar118 + 0.5) +
                       fVar118 + fVar87) * auVar240._4_4_ + fVar87;
                  auVar105._8_4_ =
                       (fVar220 * fVar220 *
                        (((((fVar220 * 0.00019875691 + 0.0013981999) * fVar220 + 0.008333452) *
                           fVar220 + 0.041665796) * fVar220 + 0.16666666) * fVar220 + 0.5) +
                       fVar220 + fVar116) * auVar240._8_4_ + fVar116;
                  auVar105._12_4_ =
                       (fVar222 * fVar222 *
                        (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                           fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) +
                       fVar222 + fVar117) * auVar240._12_4_ + fVar117;
                  auVar240 = vrcpps_avx(auVar105);
                  fVar74 = auVar240._0_4_;
                  auVar106._0_4_ = auVar105._0_4_ * fVar74;
                  fVar87 = auVar240._4_4_;
                  auVar106._4_4_ = auVar105._4_4_ * fVar87;
                  fVar116 = auVar240._8_4_;
                  auVar106._8_4_ = auVar105._8_4_ * fVar116;
                  fVar117 = auVar240._12_4_;
                  auVar106._12_4_ = auVar105._12_4_ * fVar117;
                  auVar168 = vsubps_avx(auVar168,auVar106);
                  auVar103._0_4_ = fVar74 + fVar74 * auVar168._0_4_;
                  auVar103._4_4_ = fVar87 + fVar87 * auVar168._4_4_;
                  auVar103._8_4_ = fVar116 + fVar116 * auVar168._8_4_;
                  auVar103._12_4_ = fVar117 + fVar117 * auVar168._12_4_;
                  break;
                case 5:
                  auVar228._8_4_ = 0x42b0c0a5;
                  auVar228._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar228._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar103,auVar228);
                  auVar287._8_4_ = 0xc2b0c0a5;
                  auVar287._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar287._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar287,auVar240);
                  auVar300._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar300._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar300._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar300._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar320._0_4_ = (int)auVar300._0_4_;
                  auVar320._4_4_ = (int)auVar300._4_4_;
                  auVar320._8_4_ = (int)auVar300._8_4_;
                  auVar320._12_4_ = (int)auVar300._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar320);
                  auVar240 = vcmpps_avx(auVar300,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  auVar321._0_4_ = auVar240._0_4_ * 0.6931472;
                  auVar321._4_4_ = auVar240._4_4_ * 0.6931472;
                  auVar321._8_4_ = auVar240._8_4_ * 0.6931472;
                  auVar321._12_4_ = auVar240._12_4_ * 0.6931472;
                  auVar298 = vsubps_avx(auVar284,auVar321);
                  fVar222 = auVar298._0_4_;
                  fVar167 = auVar298._4_4_;
                  fVar215 = auVar298._8_4_;
                  fVar216 = auVar298._12_4_;
                  auVar258._0_4_ = (int)auVar240._0_4_;
                  auVar258._4_4_ = (int)auVar240._4_4_;
                  auVar258._8_4_ = (int)auVar240._8_4_;
                  auVar258._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar258,0x17);
                  auVar240 = vpaddd_avx(auVar240,auVar168);
                  auVar259._0_4_ =
                       (fVar222 + fVar74 +
                       fVar222 * fVar222 *
                       (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                          fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5)) *
                       auVar240._0_4_ + fVar74;
                  auVar259._4_4_ =
                       (fVar167 + fVar87 +
                       fVar167 * fVar167 *
                       (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                          fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5)) *
                       auVar240._4_4_ + fVar87;
                  auVar259._8_4_ =
                       (fVar215 + fVar116 +
                       fVar215 * fVar215 *
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5)) *
                       auVar240._8_4_ + fVar116;
                  auVar259._12_4_ =
                       (fVar216 + fVar117 +
                       fVar216 * fVar216 *
                       (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) *
                          fVar216 + 0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5)) *
                       auVar240._12_4_ + fVar117;
                  auVar137._8_4_ = 0x800000;
                  auVar137._0_8_ = 0x80000000800000;
                  auVar137._12_4_ = 0x800000;
                  auVar240 = vmaxps_avx(auVar259,auVar137);
                  auVar298 = vpsrld_avx(auVar240,0x17);
                  auVar190._8_4_ = 0xffffff82;
                  auVar190._0_8_ = 0xffffff82ffffff82;
                  auVar190._12_4_ = 0xffffff82;
                  auVar298 = vpaddd_avx(auVar298,auVar190);
                  auVar191._8_4_ = 0x807fffff;
                  auVar191._0_8_ = 0x807fffff807fffff;
                  auVar191._12_4_ = 0x807fffff;
                  auVar240 = vandps_avx(auVar240,auVar191);
                  auVar75 = vorps_avx(auVar240,auVar236);
                  auVar284 = vcvtdq2ps_avx(auVar298);
                  auVar192._8_4_ = 0x3f3504f3;
                  auVar192._0_8_ = 0x3f3504f33f3504f3;
                  auVar192._12_4_ = 0x3f3504f3;
                  auVar298 = vcmpps_avx(auVar75,auVar192,1);
                  auVar240 = vandps_avx(auVar298,auVar75);
                  fVar222 = auVar75._0_4_ + -1.0 + auVar240._0_4_;
                  fVar167 = auVar75._4_4_ + -1.0 + auVar240._4_4_;
                  fVar215 = auVar75._8_4_ + -1.0 + auVar240._8_4_;
                  fVar216 = auVar75._12_4_ + -1.0 + auVar240._12_4_;
                  auVar240 = vandps_avx(auVar298,auVar168);
                  auVar298 = vsubps_avx(auVar284,auVar240);
                  auVar240 = vcmpps_avx(auVar259,_DAT_00515090,2);
                  auVar138._0_4_ =
                       (fVar222 * fVar222 *
                        (((((((((fVar222 * 0.070376836 + -0.1151461) * fVar222 + 0.116769984) *
                               fVar222 + -0.12420141) * fVar222 + 0.14249323) * fVar222 +
                            -0.16668057) * fVar222 + 0.20000714) * fVar222 + -0.24999994) * fVar222
                         + 0.3333333) * fVar222 + -0.5) + auVar298._0_4_ * 0.6931472 + fVar222) *
                       -2.0;
                  auVar138._4_4_ =
                       (fVar167 * fVar167 *
                        (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                               fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 +
                            -0.16668057) * fVar167 + 0.20000714) * fVar167 + -0.24999994) * fVar167
                         + 0.3333333) * fVar167 + -0.5) + auVar298._4_4_ * 0.6931472 + fVar167) *
                       -2.0;
                  auVar138._8_4_ =
                       (fVar215 * fVar215 *
                        (((((((((fVar215 * 0.070376836 + -0.1151461) * fVar215 + 0.116769984) *
                               fVar215 + -0.12420141) * fVar215 + 0.14249323) * fVar215 +
                            -0.16668057) * fVar215 + 0.20000714) * fVar215 + -0.24999994) * fVar215
                         + 0.3333333) * fVar215 + -0.5) + auVar298._8_4_ * 0.6931472 + fVar215) *
                       -2.0;
                  auVar138._12_4_ =
                       (fVar216 * fVar216 *
                        (((((((((fVar216 * 0.070376836 + -0.1151461) * fVar216 + 0.116769984) *
                               fVar216 + -0.12420141) * fVar216 + 0.14249323) * fVar216 +
                            -0.16668057) * fVar216 + 0.20000714) * fVar216 + -0.24999994) * fVar216
                         + 0.3333333) * fVar216 + -0.5) + auVar298._12_4_ * 0.6931472 + fVar216) *
                       -2.0;
                  auVar193._8_4_ = 0x7fffffff;
                  auVar193._0_8_ = 0x7fffffff7fffffff;
                  auVar193._12_4_ = 0x7fffffff;
                  auVar240 = vblendvps_avx(auVar138,auVar193,auVar240);
                  auVar194._8_4_ = 0x42b0c0a5;
                  auVar194._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar194._12_4_ = 0x42b0c0a5;
                  auVar240 = vminps_avx(auVar240,auVar194);
                  auVar195._8_4_ = 0xc2b0c0a5;
                  auVar195._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar195._12_4_ = 0xc2b0c0a5;
                  auVar284 = vmaxps_avx(auVar240,auVar195);
                  auVar196._0_4_ = auVar284._0_4_ * 1.442695 + 0.5;
                  auVar196._4_4_ = auVar284._4_4_ * 1.442695 + 0.5;
                  auVar196._8_4_ = auVar284._8_4_ * 1.442695 + 0.5;
                  auVar196._12_4_ = auVar284._12_4_ * 1.442695 + 0.5;
                  auVar260._0_4_ = (int)auVar196._0_4_;
                  auVar260._4_4_ = (int)auVar196._4_4_;
                  auVar260._8_4_ = (int)auVar196._8_4_;
                  auVar260._12_4_ = (int)auVar196._12_4_;
                  auVar298 = vcvtdq2ps_avx(auVar260);
                  auVar240 = vcmpps_avx(auVar196,auVar298,1);
                  auVar240 = vandps_avx(auVar240,auVar168);
                  auVar240 = vsubps_avx(auVar298,auVar240);
                  auVar261._0_4_ = auVar240._0_4_ * 0.6931472;
                  auVar261._4_4_ = auVar240._4_4_ * 0.6931472;
                  auVar261._8_4_ = auVar240._8_4_ * 0.6931472;
                  auVar261._12_4_ = auVar240._12_4_ * 0.6931472;
                  auVar238 = ZEXT1664(auVar168);
                  auVar298 = vsubps_avx(auVar284,auVar261);
                  fVar222 = auVar298._0_4_;
                  fVar167 = auVar298._4_4_;
                  fVar215 = auVar298._8_4_;
                  fVar216 = auVar298._12_4_;
                  auVar197._0_4_ = (int)auVar240._0_4_;
                  auVar197._4_4_ = (int)auVar240._4_4_;
                  auVar197._8_4_ = (int)auVar240._8_4_;
                  auVar197._12_4_ = (int)auVar240._12_4_;
                  auVar240 = vpslld_avx(auVar197,0x17);
                  auVar168 = vpaddd_avx(auVar240,auVar168);
                  auVar139._0_4_ =
                       (fVar222 + fVar74 +
                       (((((fVar222 * 0.00019875691 + 0.0013981999) * fVar222 + 0.008333452) *
                          fVar222 + 0.041665796) * fVar222 + 0.16666666) * fVar222 + 0.5) *
                       fVar222 * fVar222) * auVar168._0_4_ + fVar74;
                  auVar139._4_4_ =
                       (fVar167 + fVar87 +
                       (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                          fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + 0.5) *
                       fVar167 * fVar167) * auVar168._4_4_ + fVar87;
                  auVar139._8_4_ =
                       (fVar215 + fVar116 +
                       (((((fVar215 * 0.00019875691 + 0.0013981999) * fVar215 + 0.008333452) *
                          fVar215 + 0.041665796) * fVar215 + 0.16666666) * fVar215 + 0.5) *
                       fVar215 * fVar215) * auVar168._8_4_ + fVar116;
                  auVar139._12_4_ =
                       (fVar216 + fVar117 +
                       (((((fVar216 * 0.00019875691 + 0.0013981999) * fVar216 + 0.008333452) *
                          fVar216 + 0.041665796) * fVar216 + 0.16666666) * fVar216 + 0.5) *
                       fVar216 * fVar216) * auVar168._12_4_ + fVar117;
                  auVar168 = vrcpps_avx(auVar139);
                  fVar74 = auVar168._0_4_;
                  fVar87 = auVar168._4_4_;
                  fVar116 = auVar168._8_4_;
                  fVar117 = auVar168._12_4_;
                  auVar140._0_4_ = auVar139._0_4_ * (fVar74 + fVar74);
                  auVar140._4_4_ = auVar139._4_4_ * (fVar87 + fVar87);
                  auVar140._8_4_ = auVar139._8_4_ * (fVar116 + fVar116);
                  auVar140._12_4_ = auVar139._12_4_ * (fVar117 + fVar117);
                  auVar229._8_4_ = 0x40000000;
                  auVar229._0_8_ = 0x4000000040000000;
                  auVar229._12_4_ = 0x40000000;
                  auVar168 = vsubps_avx(auVar229,auVar140);
                  auVar141._0_4_ = fVar74 + fVar74 + -1.0 + fVar74 * auVar168._0_4_;
                  auVar141._4_4_ = fVar87 + fVar87 + -1.0 + fVar87 * auVar168._4_4_;
                  auVar141._8_4_ = fVar116 + fVar116 + -1.0 + fVar116 * auVar168._8_4_;
                  auVar141._12_4_ = fVar117 + fVar117 + -1.0 + fVar117 * auVar168._12_4_;
                  goto LAB_002ac181;
                case 6:
                  fVar74 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  fVar87 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar144._0_4_ = fVar74 * auVar103._0_4_ + fVar87;
                  auVar144._4_4_ = fVar74 * fVar223 + fVar87;
                  auVar144._8_4_ = fVar74 * fVar118 + fVar87;
                  auVar144._12_4_ = fVar74 * fVar220 + fVar87;
                  auVar240 = vmaxps_avx(auVar144,_DAT_00515090);
                  auVar141 = vminps_avx(auVar240,auVar168);
LAB_002ac181:
                  auVar103._0_4_ = auVar141._0_4_ * auVar103._0_4_;
                  auVar103._4_4_ = auVar141._4_4_ * fVar223;
                  auVar103._8_4_ = auVar141._8_4_ * fVar118;
                  auVar103._12_4_ = auVar141._12_4_ * fVar220;
                }
                *(undefined1 (*) [16])ppp_Var60 = auVar103;
                ppp_Var60 = ppp_Var60 + 2;
                uVar68 = uVar68 + 1;
                iVar50 = iVar50 + 1;
              } while (uVar68 != local_a8.w);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != local_a8.h);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_a8.c);
    }
    if ((uVar16 == 4 && (local_13c ^ 1) == 0) && (local_50 = (long)local_a8.c, 0 < local_50)) {
      p_Var54 = pp_Var64[-3];
      iVar69 = *(int *)(&this->field_0xdc + (long)p_Var54);
      iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var54);
      iVar72 = *(int *)(&this->field_0xe4 + (long)p_Var54);
      iVar18 = *(int *)(&this->field_0xe8 + (long)p_Var54);
      uVar21 = *(undefined4 *)(&this->field_0x114 + (long)p_Var54);
      lVar65 = *(long *)(&this->field_0x1a8 + (long)p_Var54);
      uVar56 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
      uVar62 = *(uint *)(&this->field_0xd8 + (long)p_Var54);
      lVar53 = local_a8.elemsize * local_a8.cstep;
      local_38 = (Allocator *)local_a8.data;
      iVar58 = bottom_blob->w;
      iVar70 = bottom_blob->h;
      uVar22 = bottom_blob->c;
      local_198 = 0;
      do {
        if (0 < iVar15) {
          sVar25 = (this->weight_data_tm).cstep;
          sVar26 = (this->weight_data_tm).elemsize;
          local_148 = (_func_int ***)((long)&local_38->_vptr_Allocator + lVar53 * local_198);
          pvVar73 = (this->weight_data_tm).data;
          iVar55 = 0;
          do {
            if (0 < iVar14) {
              iVar46 = bottom_blob->w;
              pvVar24 = bottom_blob->data;
              sVar27 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pfVar1 = *(float **)(&this->field_0x118 + (long)p_Var54);
              uVar68 = 0;
              iVar50 = (1 - uVar56) * iVar69;
              do {
                if (lVar65 == 0) {
                  fVar74 = 0.0;
                }
                else {
                  fVar74 = *(float *)(lVar65 + local_198 * 4);
                }
                if ((int)uVar22 < 1) {
                  auVar168 = SUB6416(ZEXT864(0),0);
                }
                else {
                  auVar238 = ZEXT864(0);
                  uVar59 = 0;
                  pvVar66 = (void *)(sVar25 * local_198 * sVar26 + (long)pvVar73);
                  do {
                    if (0 < (int)uVar62) {
                      uVar63 = 0;
                      uVar61 = 0;
                      do {
                        iVar47 = (((int)uVar61 - uVar62) + 1) * iVar17 + iVar55;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar18, iVar47 % iVar18 == 0)) &&
                            (0 < (int)uVar56)) && (iVar48 < iVar70)) {
                          uVar67 = (ulong)uVar56;
                          uVar71 = uVar63;
                          iVar47 = iVar50;
                          do {
                            if (((-1 < iVar47) && (iVar49 = iVar47 / iVar72, iVar47 % iVar72 == 0))
                               && (iVar49 < iVar58)) {
                              pfVar2 = (float *)((long)pvVar66 + (uVar71 & 0xffffffff) * 4);
                              pfVar3 = (float *)((long)pvVar24 +
                                                (long)(iVar49 << 2) * 4 +
                                                (long)iVar48 * (long)iVar46 * sVar27 +
                                                sVar28 * sVar27 * uVar59);
                              auVar238 = ZEXT1664(CONCAT412(pfVar2[3] * pfVar3[3] + auVar238._12_4_,
                                                            CONCAT48(pfVar2[2] * pfVar3[2] +
                                                                     auVar238._8_4_,
                                                                     CONCAT44(pfVar2[1] * pfVar3[1]
                                                                              + auVar238._4_4_,
                                                                              *pfVar2 * *pfVar3 +
                                                                              auVar238._0_4_))));
                            }
                            uVar71 = uVar71 + 4;
                            iVar47 = iVar47 + iVar69;
                            uVar67 = uVar67 - 1;
                          } while (uVar67 != 0);
                        }
                        uVar61 = uVar61 + 1;
                        uVar63 = uVar63 + (ulong)uVar56 * 4;
                      } while (uVar61 != uVar62);
                    }
                    auVar168 = auVar238._0_16_;
                    pvVar66 = (void *)((long)pvVar66 + (long)(int)(uVar56 * uVar62 * 4) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar22);
                }
                auVar240 = vshufpd_avx(auVar168,auVar168,1);
                auVar107._0_4_ = auVar240._0_4_ + auVar168._0_4_;
                auVar107._4_4_ = auVar240._4_4_ + auVar168._4_4_;
                auVar107._8_4_ = auVar240._8_4_ + auVar168._8_4_;
                auVar107._12_4_ = auVar240._12_4_ + auVar168._12_4_;
                auVar168 = vmovshdup_avx(auVar107);
                fVar74 = auVar168._0_4_ + fVar74 + auVar107._0_4_;
                auVar168 = ZEXT416((uint)fVar74);
                fVar87 = fVar74;
                switch(uVar21) {
                case 1:
                  auVar168 = vmaxss_avx(ZEXT416((uint)fVar74),ZEXT416(0));
                  fVar87 = auVar168._0_4_;
                  break;
                case 2:
                  auVar79._0_12_ = ZEXT812(0);
                  auVar79._12_4_ = 0;
                  auVar168 = vcmpss_avx(auVar79,auVar168,1);
                  auVar146._8_4_ = 0x3f800000;
                  auVar146._0_8_ = 0x3f8000003f800000;
                  auVar146._12_4_ = 0x3f800000;
                  auVar168 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar146,auVar168);
                  fVar87 = auVar168._0_4_;
LAB_002ac618:
                  fVar87 = fVar87 * fVar74;
                  break;
                case 3:
                  auVar168 = vmaxss_avx(auVar168,ZEXT416((uint)*pfVar1));
                  fVar87 = auVar168._0_4_;
                  if (pfVar1[1] < auVar168._0_4_) {
                    fVar87 = pfVar1[1];
                  }
                  break;
                case 4:
                  auVar168 = vminss_avx(auVar168,ZEXT416(0x42b0c0a5));
                  auVar108._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                  auVar108._8_4_ = auVar168._8_4_ ^ 0x80000000;
                  auVar108._12_4_ = auVar168._12_4_ ^ 0x80000000;
                  auVar168 = vcmpss_avx(auVar168,ZEXT416(0xc2b0c0a5),1);
                  auVar145._8_4_ = 0x42b0c0a5;
                  auVar145._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar145._12_4_ = 0x42b0c0a5;
                  auVar168 = vblendvps_avx(auVar108,auVar145,auVar168);
                  fVar74 = expf(auVar168._0_4_);
                  fVar87 = 1.0 / (fVar74 + 1.0);
                  break;
                case 5:
                  fVar87 = expf(fVar74);
                  fVar87 = logf(fVar87 + 1.0);
                  fVar87 = tanhf(fVar87);
                  fVar87 = fVar87 * fVar74;
                  break;
                case 6:
                  fVar116 = *pfVar1;
                  fVar117 = -pfVar1[1] / fVar116;
                  fVar87 = 0.0;
                  if ((fVar117 <= fVar74) && (fVar87 = fVar74, fVar74 <= fVar117 + 1.0 / fVar116)) {
                    fVar87 = fVar116 * fVar74 + pfVar1[1];
                    goto LAB_002ac618;
                  }
                }
                *(float *)local_148 = fVar87;
                local_148 = (_func_int ***)((long)local_148 + 4);
                uVar68 = uVar68 + 1;
                iVar50 = iVar50 + 1;
              } while (uVar68 != iVar14);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != iVar15);
        }
        local_198 = local_198 + 1;
      } while (local_198 != local_50);
    }
    iVar15 = local_a8.h;
    iVar14 = local_a8.w;
    pvVar73 = local_a8.data;
    pp_Var64 = this->_vptr_Deconvolution_x86_avx;
    if (((local_13c ^ 1) == 0 && uVar16 == 1) &&
       (p_Var54 = pp_Var64[-3], 0 < *(int *)(&this->field_0xd0 + (long)p_Var54))) {
      lVar65 = local_a8.cstep * local_a8.elemsize;
      iVar69 = bottom_blob->w;
      iVar17 = bottom_blob->h;
      uVar16 = bottom_blob->c;
      uVar59 = (ulong)(uint)local_a8.w;
      lVar53 = (long)local_a8.w;
      local_58 = (Allocator *)CONCAT44(local_58._4_4_,-(int)local_58);
      local_170 = 0;
      do {
        if (0 < iVar15) {
          local_168 = (_func_int ***)((long)(_func_int ***)pvVar73 + lVar65 * local_170);
          pp_Var29 = this->_vptr_Deconvolution_x86_avx;
          sVar25 = (this->weight_data_tm).cstep;
          sVar26 = (this->weight_data_tm).elemsize;
          pvVar24 = (this->weight_data_tm).data;
          iVar72 = 0;
          do {
            if (0 < iVar14) {
              iVar18 = bottom_blob->w;
              pvVar66 = bottom_blob->data;
              sVar27 = bottom_blob->elemsize;
              sVar28 = bottom_blob->cstep;
              pp_Var30 = this->_vptr_Deconvolution_x86_avx;
              iVar58 = iVar72 - (int)local_60;
              local_b0 = (ulong)local_58 & 0xffffffff;
              uVar61 = 0;
              do {
                p_Var54 = pp_Var29[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var54) == 0) {
                  auVar238 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar238 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var54) +
                                              local_170 * 4));
                }
                auVar168 = auVar238._0_16_;
                if (0 < (int)uVar16) {
                  p_Var57 = pp_Var30[-3];
                  uVar63 = 0;
                  local_130 = (void *)(sVar25 * sVar26 * local_170 + (long)pvVar24);
                  do {
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var57)) {
                      iVar70 = 0;
                      do {
                        iVar55 = *(int *)(&this->field_0xe0 + (long)p_Var57) * iVar70 + iVar58;
                        if (((-1 < iVar55) &&
                            (iVar50 = iVar55 / *(int *)(&this->field_0xe8 + (long)p_Var57),
                            iVar55 % *(int *)(&this->field_0xe8 + (long)p_Var57) == 0)) &&
                           (iVar50 < iVar17)) {
                          iVar55 = *(int *)(&this->field_0xd4 + (long)p_Var57);
                          if (0 < (long)iVar55) {
                            lVar51 = 0;
                            iVar46 = (int)local_b0;
                            do {
                              if (((-1 < iVar46) &&
                                  (iVar47 = iVar46 / *(int *)(&this->field_0xe4 + (long)p_Var57),
                                  iVar46 % *(int *)(&this->field_0xe4 + (long)p_Var57) == 0)) &&
                                 (iVar47 < iVar69)) {
                                auVar238 = ZEXT464((uint)(*(float *)((long)local_130 +
                                                                    lVar51 * 4 +
                                                                    (ulong)(uint)(iVar55 * iVar70) *
                                                                    4) *
                                                          *(float *)((long)pvVar66 +
                                                                    (long)iVar47 * 4 +
                                                                    (long)iVar50 *
                                                                    (long)iVar18 * sVar27 +
                                                                    sVar28 * sVar27 * uVar63) +
                                                         auVar238._0_4_));
                              }
                              lVar51 = lVar51 + 1;
                              iVar46 = iVar46 + *(int *)(&this->field_0xdc + (long)p_Var57);
                            } while (iVar55 != lVar51);
                          }
                        }
                        iVar70 = iVar70 + 1;
                      } while (iVar70 != *(int *)(&this->field_0xd8 + (long)p_Var57));
                    }
                    auVar168 = auVar238._0_16_;
                    uVar63 = uVar63 + 1;
                    local_130 = (void *)((long)local_130 + (long)(int)(uVar20 * uVar19) * 4);
                  } while (uVar63 != uVar16);
                }
                fVar87 = auVar168._0_4_;
                fVar74 = fVar87;
                switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var54)) {
                case 1:
                  auVar168 = vmaxss_avx(auVar168,ZEXT416(0));
                  fVar74 = auVar168._0_4_;
                  break;
                case 2:
                  auVar168 = vcmpss_avx(ZEXT816(0) << 0x40,auVar168,1);
                  auVar148._8_4_ = 0x3f800000;
                  auVar148._0_8_ = 0x3f8000003f800000;
                  auVar148._12_4_ = 0x3f800000;
                  auVar168 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var54)),
                                           auVar148,auVar168);
                  fVar117 = auVar168._0_4_;
LAB_002acacc:
                  fVar74 = fVar117 * fVar87;
                  break;
                case 3:
                  fVar87 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var54))[1];
                  auVar168 = vmaxss_avx(auVar168,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var54)));
                  fVar74 = auVar168._0_4_;
                  if (fVar87 < auVar168._0_4_) {
                    fVar74 = fVar87;
                  }
                  break;
                case 4:
                  auVar168 = vminss_avx(auVar168,ZEXT416(0x42b0c0a5));
                  auVar109._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                  auVar109._8_4_ = auVar168._8_4_ ^ 0x80000000;
                  auVar109._12_4_ = auVar168._12_4_ ^ 0x80000000;
                  auVar168 = vcmpss_avx(auVar168,ZEXT416(0xc2b0c0a5),1);
                  auVar147._8_4_ = 0x42b0c0a5;
                  auVar147._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar147._12_4_ = 0x42b0c0a5;
                  auVar168 = vblendvps_avx(auVar109,auVar147,auVar168);
                  fVar74 = expf(auVar168._0_4_);
                  fVar74 = 1.0 / (fVar74 + 1.0);
                  break;
                case 5:
                  fVar74 = expf(fVar87);
                  fVar74 = logf(fVar74 + 1.0);
                  fVar74 = tanhf(fVar74);
                  fVar74 = fVar74 * fVar87;
                  break;
                case 6:
                  fVar116 = **(float **)(&this->field_0x118 + (long)p_Var54);
                  fVar117 = (*(float **)(&this->field_0x118 + (long)p_Var54))[1];
                  fVar223 = -fVar117 / fVar116;
                  fVar74 = 0.0;
                  if ((fVar223 <= fVar87) && (fVar74 = fVar87, fVar87 <= fVar223 + 1.0 / fVar116)) {
                    fVar117 = fVar116 * fVar87 + fVar117;
                    goto LAB_002acacc;
                  }
                }
                *(float *)((long)local_168 + uVar61 * 4) = fVar74;
                uVar61 = uVar61 + 1;
                local_b0 = (ulong)((int)local_b0 + 1);
              } while (uVar61 != uVar59);
            }
            local_168 = (_func_int ***)((long)local_168 + lVar53 * 4);
            iVar72 = iVar72 + 1;
          } while (iVar72 != iVar15);
          p_Var54 = pp_Var64[-3];
        }
        local_170 = local_170 + 1;
      } while (local_170 < *(int *)(&this->field_0xd0 + (long)p_Var54));
      goto LAB_002ab177;
    }
  }
  pMVar45 = local_48;
  Deconvolution::cut_padding
            ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86_avx + (long)pp_Var64[-3]),
             &local_a8,local_48,local_40);
  if ((pMVar45->data == (void *)0x0) || (iVar69 = 0, (long)pMVar45->c * pMVar45->cstep == 0)) {
    iVar69 = -100;
  }
LAB_002ab1c2:
  piVar23 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar69;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}